

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx::CurveNiMBIntersectorK<4,4>::
     intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,8>,embree::avx::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [28];
  undefined1 (*pauVar10) [32];
  undefined1 (*pauVar11) [32];
  undefined4 uVar12;
  Primitive PVar13;
  uint uVar14;
  uint uVar15;
  undefined4 uVar16;
  __int_type_conflict _Var17;
  long lVar18;
  RTCFilterFunctionN p_Var19;
  uint uVar20;
  long lVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [28];
  undefined1 auVar119 [28];
  undefined1 auVar120 [28];
  undefined1 auVar121 [24];
  undefined1 auVar122 [28];
  uint uVar123;
  uint uVar124;
  ulong uVar125;
  uint uVar126;
  ulong uVar127;
  long lVar128;
  long lVar129;
  Geometry *pGVar130;
  float fVar131;
  float fVar152;
  float fVar153;
  vint4 bi_1;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar155;
  float fVar156;
  undefined1 auVar138 [32];
  float fVar154;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar132;
  float fVar157;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [64];
  float fVar158;
  float fVar176;
  float fVar177;
  vint4 bi;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  float fVar181;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  float fVar182;
  float fVar193;
  float fVar195;
  vint4 bi_2;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar194;
  float fVar196;
  float fVar197;
  float fVar198;
  undefined1 auVar192 [32];
  float fVar199;
  float fVar200;
  float fVar211;
  float fVar213;
  vint4 ai_1;
  undefined1 auVar204 [16];
  undefined1 auVar201 [16];
  float fVar215;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar218;
  float fVar219;
  undefined1 auVar205 [32];
  float fVar214;
  float fVar216;
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar212;
  float fVar217;
  float fVar220;
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [64];
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar232;
  float fVar235;
  vint4 ai_2;
  undefined1 auVar224 [16];
  float fVar237;
  undefined1 auVar225 [16];
  float fVar233;
  undefined1 auVar227 [16];
  float fVar234;
  float fVar236;
  float fVar238;
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  float fVar239;
  float fVar240;
  float fVar246;
  float fVar248;
  undefined1 auVar241 [16];
  float fVar252;
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar253;
  undefined1 auVar244 [32];
  float fVar247;
  float fVar249;
  float fVar250;
  float fVar251;
  undefined1 auVar245 [64];
  float fVar254;
  float fVar261;
  float fVar262;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar263;
  float fVar264;
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  float fVar265;
  undefined1 auVar260 [32];
  vint4 ai;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  float fVar282;
  float fVar284;
  undefined1 auVar279 [32];
  float fVar283;
  float fVar285;
  undefined1 auVar280 [32];
  undefined1 auVar281 [64];
  float fVar292;
  float fVar293;
  undefined1 auVar286 [16];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [64];
  float fVar294;
  float fVar302;
  float fVar304;
  undefined1 auVar296 [16];
  float fVar305;
  float fVar306;
  float fVar307;
  float fVar308;
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  float fVar295;
  float fVar303;
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  float fVar309;
  float fVar310;
  float fVar313;
  float fVar314;
  float fVar315;
  undefined1 auVar311 [16];
  float fVar316;
  undefined1 auVar312 [32];
  float fVar317;
  float fVar325;
  undefined1 auVar318 [16];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  float fVar329;
  float fVar330;
  undefined1 auVar326 [16];
  float fVar331;
  float fVar332;
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  float fVar333;
  float fVar334;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  undefined1 auVar336 [32];
  float fVar341;
  float fVar342;
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar351;
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined1 local_8a0 [16];
  undefined1 auStack_890 [16];
  undefined8 uStack_868;
  undefined1 local_860 [16];
  Precalculations *local_848;
  uint local_840;
  undefined4 uStack_83c;
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [16];
  undefined1 auStack_810 [16];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined1 local_7e0 [8];
  undefined8 uStack_7d8;
  undefined1 local_7d0 [8];
  undefined8 uStack_7c8;
  undefined1 local_7c0 [8];
  undefined8 uStack_7b8;
  RTCFilterFunctionNArguments local_7b0;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [32];
  undefined1 (*local_728) [16];
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined1 auStack_6d0 [8];
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5e0 [32];
  LinearSpace3fa *local_5b0;
  Primitive *local_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  RTCHitN local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  undefined4 local_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  uint local_400;
  uint uStack_3fc;
  uint uStack_3f8;
  uint uStack_3f4;
  uint uStack_3f0;
  uint uStack_3ec;
  uint uStack_3e8;
  uint uStack_3e4;
  undefined1 local_3e0 [8];
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [8];
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  uint local_220;
  uint local_21c;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined1 auVar226 [16];
  undefined1 auVar319 [16];
  undefined1 auVar335 [16];
  undefined1 auVar343 [16];
  
  PVar13 = prim[1];
  uVar125 = (ulong)(byte)PVar13;
  lVar21 = uVar125 * 0x25;
  fVar310 = *(float *)(prim + lVar21 + 0x12);
  auVar164 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar164 = vinsertps_avx(auVar164,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar188 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar188 = vinsertps_avx(auVar188,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar164 = vsubps_avx(auVar164,*(undefined1 (*) [16])(prim + lVar21 + 6));
  auVar159._0_4_ = fVar310 * auVar164._0_4_;
  auVar159._4_4_ = fVar310 * auVar164._4_4_;
  auVar159._8_4_ = fVar310 * auVar164._8_4_;
  auVar159._12_4_ = fVar310 * auVar164._12_4_;
  auVar266._0_4_ = fVar310 * auVar188._0_4_;
  auVar266._4_4_ = fVar310 * auVar188._4_4_;
  auVar266._8_4_ = fVar310 * auVar188._8_4_;
  auVar266._12_4_ = fVar310 * auVar188._12_4_;
  auVar164 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 4 + 6)));
  auVar164 = vcvtdq2ps_avx(auVar164);
  auVar188 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 5 + 6)));
  auVar188 = vcvtdq2ps_avx(auVar188);
  auVar189 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 6 + 6)));
  auVar189 = vcvtdq2ps_avx(auVar189);
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0xf + 6)));
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar13 * 0x10 + 6)));
  auVar204 = vcvtdq2ps_avx(auVar204);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar13 * 0x10 + uVar125 + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0x1a + 6)));
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0x1b + 6)));
  auVar27 = vcvtdq2ps_avx(auVar27);
  auVar28 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0x1c + 6)));
  auVar28 = vcvtdq2ps_avx(auVar28);
  auVar29 = vshufps_avx(auVar266,auVar266,0);
  auVar30 = vshufps_avx(auVar266,auVar266,0x55);
  auVar31 = vshufps_avx(auVar266,auVar266,0xaa);
  fVar310 = auVar31._0_4_;
  fVar212 = auVar31._4_4_;
  fVar314 = auVar31._8_4_;
  fVar217 = auVar31._12_4_;
  fVar221 = auVar30._0_4_;
  fVar232 = auVar30._4_4_;
  fVar235 = auVar30._8_4_;
  fVar237 = auVar30._12_4_;
  fVar200 = auVar29._0_4_;
  fVar211 = auVar29._4_4_;
  fVar213 = auVar29._8_4_;
  fVar215 = auVar29._12_4_;
  auVar318._0_4_ = fVar200 * auVar164._0_4_ + fVar221 * auVar188._0_4_ + fVar310 * auVar189._0_4_;
  auVar318._4_4_ = fVar211 * auVar164._4_4_ + fVar232 * auVar188._4_4_ + fVar212 * auVar189._4_4_;
  auVar318._8_4_ = fVar213 * auVar164._8_4_ + fVar235 * auVar188._8_4_ + fVar314 * auVar189._8_4_;
  auVar318._12_4_ =
       fVar215 * auVar164._12_4_ + fVar237 * auVar188._12_4_ + fVar217 * auVar189._12_4_;
  auVar326._0_4_ = fVar200 * auVar204._0_4_ + fVar221 * auVar24._0_4_ + auVar25._0_4_ * fVar310;
  auVar326._4_4_ = fVar211 * auVar204._4_4_ + fVar232 * auVar24._4_4_ + auVar25._4_4_ * fVar212;
  auVar326._8_4_ = fVar213 * auVar204._8_4_ + fVar235 * auVar24._8_4_ + auVar25._8_4_ * fVar314;
  auVar326._12_4_ = fVar215 * auVar204._12_4_ + fVar237 * auVar24._12_4_ + auVar25._12_4_ * fVar217;
  auVar267._0_4_ = fVar200 * auVar26._0_4_ + fVar221 * auVar27._0_4_ + auVar28._0_4_ * fVar310;
  auVar267._4_4_ = fVar211 * auVar26._4_4_ + fVar232 * auVar27._4_4_ + auVar28._4_4_ * fVar212;
  auVar267._8_4_ = fVar213 * auVar26._8_4_ + fVar235 * auVar27._8_4_ + auVar28._8_4_ * fVar314;
  auVar267._12_4_ = fVar215 * auVar26._12_4_ + fVar237 * auVar27._12_4_ + auVar28._12_4_ * fVar217;
  auVar29 = vshufps_avx(auVar159,auVar159,0);
  auVar30 = vshufps_avx(auVar159,auVar159,0x55);
  auVar31 = vshufps_avx(auVar159,auVar159,0xaa);
  fVar310 = auVar31._0_4_;
  fVar212 = auVar31._4_4_;
  fVar314 = auVar31._8_4_;
  fVar217 = auVar31._12_4_;
  fVar221 = auVar30._0_4_;
  fVar232 = auVar30._4_4_;
  fVar235 = auVar30._8_4_;
  fVar237 = auVar30._12_4_;
  fVar200 = auVar29._0_4_;
  fVar211 = auVar29._4_4_;
  fVar213 = auVar29._8_4_;
  fVar215 = auVar29._12_4_;
  auVar160._0_4_ = fVar200 * auVar164._0_4_ + fVar221 * auVar188._0_4_ + fVar310 * auVar189._0_4_;
  auVar160._4_4_ = fVar211 * auVar164._4_4_ + fVar232 * auVar188._4_4_ + fVar212 * auVar189._4_4_;
  auVar160._8_4_ = fVar213 * auVar164._8_4_ + fVar235 * auVar188._8_4_ + fVar314 * auVar189._8_4_;
  auVar160._12_4_ =
       fVar215 * auVar164._12_4_ + fVar237 * auVar188._12_4_ + fVar217 * auVar189._12_4_;
  auVar133._0_4_ = fVar200 * auVar204._0_4_ + auVar25._0_4_ * fVar310 + fVar221 * auVar24._0_4_;
  auVar133._4_4_ = fVar211 * auVar204._4_4_ + auVar25._4_4_ * fVar212 + fVar232 * auVar24._4_4_;
  auVar133._8_4_ = fVar213 * auVar204._8_4_ + auVar25._8_4_ * fVar314 + fVar235 * auVar24._8_4_;
  auVar133._12_4_ = fVar215 * auVar204._12_4_ + auVar25._12_4_ * fVar217 + fVar237 * auVar24._12_4_;
  auVar275._8_4_ = 0x7fffffff;
  auVar275._0_8_ = 0x7fffffff7fffffff;
  auVar275._12_4_ = 0x7fffffff;
  auVar164 = vandps_avx(auVar318,auVar275);
  auVar224._8_4_ = 0x219392ef;
  auVar224._0_8_ = 0x219392ef219392ef;
  auVar224._12_4_ = 0x219392ef;
  auVar164 = vcmpps_avx(auVar164,auVar224,1);
  auVar188 = vblendvps_avx(auVar318,auVar224,auVar164);
  auVar164 = vandps_avx(auVar326,auVar275);
  auVar164 = vcmpps_avx(auVar164,auVar224,1);
  auVar189 = vblendvps_avx(auVar326,auVar224,auVar164);
  auVar164 = vandps_avx(auVar275,auVar267);
  auVar164 = vcmpps_avx(auVar164,auVar224,1);
  auVar164 = vblendvps_avx(auVar267,auVar224,auVar164);
  auVar183._0_4_ = fVar200 * auVar26._0_4_ + fVar221 * auVar27._0_4_ + auVar28._0_4_ * fVar310;
  auVar183._4_4_ = fVar211 * auVar26._4_4_ + fVar232 * auVar27._4_4_ + auVar28._4_4_ * fVar212;
  auVar183._8_4_ = fVar213 * auVar26._8_4_ + fVar235 * auVar27._8_4_ + auVar28._8_4_ * fVar314;
  auVar183._12_4_ = fVar215 * auVar26._12_4_ + fVar237 * auVar27._12_4_ + auVar28._12_4_ * fVar217;
  auVar204 = vrcpps_avx(auVar188);
  fVar200 = auVar204._0_4_;
  auVar201._0_4_ = fVar200 * auVar188._0_4_;
  fVar211 = auVar204._4_4_;
  auVar201._4_4_ = fVar211 * auVar188._4_4_;
  fVar213 = auVar204._8_4_;
  auVar201._8_4_ = fVar213 * auVar188._8_4_;
  fVar215 = auVar204._12_4_;
  auVar201._12_4_ = fVar215 * auVar188._12_4_;
  auVar255._8_4_ = 0x3f800000;
  auVar255._0_8_ = 0x3f8000003f800000;
  auVar255._12_4_ = 0x3f800000;
  auVar188 = vsubps_avx(auVar255,auVar201);
  fVar200 = fVar200 + fVar200 * auVar188._0_4_;
  fVar211 = fVar211 + fVar211 * auVar188._4_4_;
  fVar213 = fVar213 + fVar213 * auVar188._8_4_;
  fVar215 = fVar215 + fVar215 * auVar188._12_4_;
  auVar188 = vrcpps_avx(auVar189);
  fVar221 = auVar188._0_4_;
  auVar241._0_4_ = fVar221 * auVar189._0_4_;
  fVar232 = auVar188._4_4_;
  auVar241._4_4_ = fVar232 * auVar189._4_4_;
  fVar235 = auVar188._8_4_;
  auVar241._8_4_ = fVar235 * auVar189._8_4_;
  fVar237 = auVar188._12_4_;
  auVar241._12_4_ = fVar237 * auVar189._12_4_;
  auVar188 = vsubps_avx(auVar255,auVar241);
  fVar221 = fVar221 + fVar221 * auVar188._0_4_;
  fVar232 = fVar232 + fVar232 * auVar188._4_4_;
  fVar235 = fVar235 + fVar235 * auVar188._8_4_;
  fVar237 = fVar237 + fVar237 * auVar188._12_4_;
  auVar188 = vrcpps_avx(auVar164);
  fVar239 = auVar188._0_4_;
  auVar268._0_4_ = fVar239 * auVar164._0_4_;
  fVar246 = auVar188._4_4_;
  auVar268._4_4_ = fVar246 * auVar164._4_4_;
  fVar248 = auVar188._8_4_;
  auVar268._8_4_ = fVar248 * auVar164._8_4_;
  fVar250 = auVar188._12_4_;
  auVar268._12_4_ = fVar250 * auVar164._12_4_;
  auVar164 = vsubps_avx(auVar255,auVar268);
  fVar239 = fVar239 + fVar239 * auVar164._0_4_;
  fVar246 = fVar246 + fVar246 * auVar164._4_4_;
  fVar248 = fVar248 + fVar248 * auVar164._8_4_;
  fVar250 = fVar250 + fVar250 * auVar164._12_4_;
  auVar164 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar21 + 0x16)) *
                           *(float *)(prim + lVar21 + 0x1a)));
  auVar189 = vshufps_avx(auVar164,auVar164,0);
  auVar164._8_8_ = 0;
  auVar164._0_8_ = *(ulong *)(prim + uVar125 * 7 + 6);
  auVar164 = vpmovsxwd_avx(auVar164);
  auVar164 = vcvtdq2ps_avx(auVar164);
  auVar188._8_8_ = 0;
  auVar188._0_8_ = *(ulong *)(prim + uVar125 * 0xb + 6);
  auVar188 = vpmovsxwd_avx(auVar188);
  auVar188 = vcvtdq2ps_avx(auVar188);
  auVar204 = vsubps_avx(auVar188,auVar164);
  fVar310 = auVar189._0_4_;
  fVar212 = auVar189._4_4_;
  fVar314 = auVar189._8_4_;
  fVar217 = auVar189._12_4_;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = *(ulong *)(prim + uVar125 * 9 + 6);
  auVar188 = vpmovsxwd_avx(auVar189);
  auVar269._0_4_ = auVar204._0_4_ * fVar310 + auVar164._0_4_;
  auVar269._4_4_ = auVar204._4_4_ * fVar212 + auVar164._4_4_;
  auVar269._8_4_ = auVar204._8_4_ * fVar314 + auVar164._8_4_;
  auVar269._12_4_ = auVar204._12_4_ * fVar217 + auVar164._12_4_;
  auVar204._8_8_ = 0;
  auVar204._0_8_ = *(ulong *)(prim + uVar125 * 0xd + 6);
  auVar189 = vpmovsxwd_avx(auVar204);
  auVar164 = vcvtdq2ps_avx(auVar188);
  auVar188 = vcvtdq2ps_avx(auVar189);
  auVar188 = vsubps_avx(auVar188,auVar164);
  auVar276._0_4_ = auVar188._0_4_ * fVar310 + auVar164._0_4_;
  auVar276._4_4_ = auVar188._4_4_ * fVar212 + auVar164._4_4_;
  auVar276._8_4_ = auVar188._8_4_ * fVar314 + auVar164._8_4_;
  auVar276._12_4_ = auVar188._12_4_ * fVar217 + auVar164._12_4_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar125 * 0x12 + 6);
  auVar164 = vpmovsxwd_avx(auVar24);
  uVar127 = (ulong)(uint)((int)(uVar125 * 5) << 2);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar125 * 2 + uVar127 + 6);
  auVar188 = vpmovsxwd_avx(auVar25);
  auVar164 = vcvtdq2ps_avx(auVar164);
  auVar188 = vcvtdq2ps_avx(auVar188);
  auVar188 = vsubps_avx(auVar188,auVar164);
  auVar286._0_4_ = auVar188._0_4_ * fVar310 + auVar164._0_4_;
  auVar286._4_4_ = auVar188._4_4_ * fVar212 + auVar164._4_4_;
  auVar286._8_4_ = auVar188._8_4_ * fVar314 + auVar164._8_4_;
  auVar286._12_4_ = auVar188._12_4_ * fVar217 + auVar164._12_4_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar127 + 6);
  auVar164 = vpmovsxwd_avx(auVar26);
  auVar164 = vcvtdq2ps_avx(auVar164);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar125 * 0x18 + 6);
  auVar188 = vpmovsxwd_avx(auVar27);
  auVar188 = vcvtdq2ps_avx(auVar188);
  auVar189 = vsubps_avx(auVar188,auVar164);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar125 * 0x1d + 6);
  auVar188 = vpmovsxwd_avx(auVar28);
  auVar296._0_4_ = auVar189._0_4_ * fVar310 + auVar164._0_4_;
  auVar296._4_4_ = auVar189._4_4_ * fVar212 + auVar164._4_4_;
  auVar296._8_4_ = auVar189._8_4_ * fVar314 + auVar164._8_4_;
  auVar296._12_4_ = auVar189._12_4_ * fVar217 + auVar164._12_4_;
  auVar164 = vcvtdq2ps_avx(auVar188);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar125 + (ulong)(byte)PVar13 * 0x20 + 6);
  auVar188 = vpmovsxwd_avx(auVar29);
  auVar188 = vcvtdq2ps_avx(auVar188);
  auVar188 = vsubps_avx(auVar188,auVar164);
  auVar311._0_4_ = auVar188._0_4_ * fVar310 + auVar164._0_4_;
  auVar311._4_4_ = auVar188._4_4_ * fVar212 + auVar164._4_4_;
  auVar311._8_4_ = auVar188._8_4_ * fVar314 + auVar164._8_4_;
  auVar311._12_4_ = auVar188._12_4_ * fVar217 + auVar164._12_4_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar13 * 0x20 - uVar125) + 6);
  auVar164 = vpmovsxwd_avx(auVar30);
  auVar164 = vcvtdq2ps_avx(auVar164);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar125 * 0x23 + 6);
  auVar188 = vpmovsxwd_avx(auVar31);
  auVar188 = vcvtdq2ps_avx(auVar188);
  auVar188 = vsubps_avx(auVar188,auVar164);
  auVar256._0_4_ = auVar164._0_4_ + auVar188._0_4_ * fVar310;
  auVar256._4_4_ = auVar164._4_4_ + auVar188._4_4_ * fVar212;
  auVar256._8_4_ = auVar164._8_4_ + auVar188._8_4_ * fVar314;
  auVar256._12_4_ = auVar164._12_4_ + auVar188._12_4_ * fVar217;
  auVar164 = vsubps_avx(auVar269,auVar160);
  auVar270._0_4_ = fVar200 * auVar164._0_4_;
  auVar270._4_4_ = fVar211 * auVar164._4_4_;
  auVar270._8_4_ = fVar213 * auVar164._8_4_;
  auVar270._12_4_ = fVar215 * auVar164._12_4_;
  auVar164 = vsubps_avx(auVar276,auVar160);
  auVar161._0_4_ = fVar200 * auVar164._0_4_;
  auVar161._4_4_ = fVar211 * auVar164._4_4_;
  auVar161._8_4_ = fVar213 * auVar164._8_4_;
  auVar161._12_4_ = fVar215 * auVar164._12_4_;
  auVar164 = vsubps_avx(auVar286,auVar133);
  auVar202._0_4_ = fVar221 * auVar164._0_4_;
  auVar202._4_4_ = fVar232 * auVar164._4_4_;
  auVar202._8_4_ = fVar235 * auVar164._8_4_;
  auVar202._12_4_ = fVar237 * auVar164._12_4_;
  auVar164 = vsubps_avx(auVar296,auVar133);
  auVar134._0_4_ = fVar221 * auVar164._0_4_;
  auVar134._4_4_ = fVar232 * auVar164._4_4_;
  auVar134._8_4_ = fVar235 * auVar164._8_4_;
  auVar134._12_4_ = fVar237 * auVar164._12_4_;
  auVar164 = vsubps_avx(auVar311,auVar183);
  auVar225._0_4_ = fVar239 * auVar164._0_4_;
  auVar225._4_4_ = fVar246 * auVar164._4_4_;
  auVar225._8_4_ = fVar248 * auVar164._8_4_;
  auVar225._12_4_ = fVar250 * auVar164._12_4_;
  auVar164 = vsubps_avx(auVar256,auVar183);
  auVar184._0_4_ = fVar239 * auVar164._0_4_;
  auVar184._4_4_ = fVar246 * auVar164._4_4_;
  auVar184._8_4_ = fVar248 * auVar164._8_4_;
  auVar184._12_4_ = fVar250 * auVar164._12_4_;
  auVar164 = vpminsd_avx(auVar270,auVar161);
  auVar188 = vpminsd_avx(auVar202,auVar134);
  auVar164 = vmaxps_avx(auVar164,auVar188);
  auVar188 = vpminsd_avx(auVar225,auVar184);
  uVar12 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar277._4_4_ = uVar12;
  auVar277._0_4_ = uVar12;
  auVar277._8_4_ = uVar12;
  auVar277._12_4_ = uVar12;
  auVar188 = vmaxps_avx(auVar188,auVar277);
  auVar164 = vmaxps_avx(auVar164,auVar188);
  local_290._0_4_ = auVar164._0_4_ * 0.99999964;
  local_290._4_4_ = auVar164._4_4_ * 0.99999964;
  local_290._8_4_ = auVar164._8_4_ * 0.99999964;
  local_290._12_4_ = auVar164._12_4_ * 0.99999964;
  auVar164 = vpmaxsd_avx(auVar270,auVar161);
  auVar188 = vpmaxsd_avx(auVar202,auVar134);
  auVar164 = vminps_avx(auVar164,auVar188);
  auVar188 = vpmaxsd_avx(auVar225,auVar184);
  uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar185._4_4_ = uVar12;
  auVar185._0_4_ = uVar12;
  auVar185._8_4_ = uVar12;
  auVar185._12_4_ = uVar12;
  auVar188 = vminps_avx(auVar188,auVar185);
  auVar164 = vminps_avx(auVar164,auVar188);
  auVar135._0_4_ = auVar164._0_4_ * 1.0000004;
  auVar135._4_4_ = auVar164._4_4_ * 1.0000004;
  auVar135._8_4_ = auVar164._8_4_ * 1.0000004;
  auVar135._12_4_ = auVar164._12_4_ * 1.0000004;
  auVar164 = vpshufd_avx(ZEXT116((byte)PVar13),0);
  auVar188 = vpcmpgtd_avx(auVar164,_DAT_01f7fcf0);
  auVar164 = vcmpps_avx(local_290,auVar135,2);
  auVar164 = vandps_avx(auVar164,auVar188);
  uVar123 = vmovmskps_avx(auVar164);
  if (uVar123 != 0) {
    uVar123 = uVar123 & 0xff;
    local_5a0 = mm_lookupmask_ps._16_8_;
    uStack_598 = mm_lookupmask_ps._24_8_;
    uStack_590 = mm_lookupmask_ps._16_8_;
    uStack_588 = mm_lookupmask_ps._24_8_;
    local_5b0 = pre->ray_space + k;
    local_728 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    local_848 = pre;
    local_5a8 = prim;
    do {
      lVar21 = 0;
      if (uVar123 != 0) {
        for (; (uVar123 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
        }
      }
      uVar126 = *(uint *)(local_5a8 + 2);
      uVar14 = *(uint *)(local_5a8 + lVar21 * 4 + 6);
      pGVar130 = (context->scene->geometries).items[uVar126].ptr;
      uVar125 = (ulong)*(uint *)(*(long *)&pGVar130->field_0x58 +
                                (ulong)uVar14 *
                                pGVar130[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar310 = (pGVar130->time_range).lower;
      fVar310 = pGVar130->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar310) /
                ((pGVar130->time_range).upper - fVar310));
      auVar164 = vroundss_avx(ZEXT416((uint)fVar310),ZEXT416((uint)fVar310),9);
      auVar164 = vminss_avx(auVar164,ZEXT416((uint)(pGVar130->fnumTimeSegments + -1.0)));
      auVar164 = vmaxss_avx(ZEXT816(0) << 0x20,auVar164);
      fVar310 = fVar310 - auVar164._0_4_;
      _Var17 = pGVar130[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar129 = (long)(int)auVar164._0_4_ * 0x38;
      lVar21 = *(long *)(_Var17 + 0x10 + lVar129);
      lVar128 = *(long *)(_Var17 + 0x38 + lVar129);
      lVar18 = *(long *)(_Var17 + 0x48 + lVar129);
      auVar164 = vshufps_avx(ZEXT416((uint)fVar310),ZEXT416((uint)fVar310),0);
      pfVar1 = (float *)(lVar128 + uVar125 * lVar18);
      fVar212 = auVar164._0_4_;
      fVar314 = auVar164._4_4_;
      fVar217 = auVar164._8_4_;
      fVar200 = auVar164._12_4_;
      pfVar2 = (float *)(lVar128 + (uVar125 + 1) * lVar18);
      pfVar3 = (float *)(lVar128 + (uVar125 + 2) * lVar18);
      pfVar4 = (float *)(lVar128 + lVar18 * (uVar125 + 3));
      lVar128 = *(long *)(_Var17 + lVar129);
      auVar164 = vshufps_avx(ZEXT416((uint)(1.0 - fVar310)),ZEXT416((uint)(1.0 - fVar310)),0);
      pfVar5 = (float *)(lVar128 + lVar21 * uVar125);
      fVar310 = auVar164._0_4_;
      fVar211 = auVar164._4_4_;
      fVar213 = auVar164._8_4_;
      fVar215 = auVar164._12_4_;
      pfVar6 = (float *)(lVar128 + lVar21 * (uVar125 + 1));
      pfVar7 = (float *)(lVar128 + lVar21 * (uVar125 + 2));
      pfVar8 = (float *)(lVar128 + lVar21 * (uVar125 + 3));
      uVar15 = (uint)pGVar130[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar21 = (long)(int)uVar15 * 0x44;
      fVar222 = fVar212 * *pfVar1 + fVar310 * *pfVar5;
      fVar233 = fVar314 * pfVar1[1] + fVar211 * pfVar5[1];
      auVar226._0_8_ = CONCAT44(fVar233,fVar222);
      auVar226._8_4_ = fVar217 * pfVar1[2] + fVar213 * pfVar5[2];
      auVar226._12_4_ = fVar200 * pfVar1[3] + fVar215 * pfVar5[3];
      fVar333 = fVar310 * *pfVar6 + fVar212 * *pfVar2;
      fVar337 = fVar211 * pfVar6[1] + fVar314 * pfVar2[1];
      auVar335._0_8_ = CONCAT44(fVar337,fVar333);
      auVar335._8_4_ = fVar213 * pfVar6[2] + fVar217 * pfVar2[2];
      auVar335._12_4_ = fVar215 * pfVar6[3] + fVar200 * pfVar2[3];
      fVar341 = fVar310 * *pfVar7 + fVar212 * *pfVar3;
      fVar348 = fVar211 * pfVar7[1] + fVar314 * pfVar3[1];
      auVar343._0_8_ = CONCAT44(fVar348,fVar341);
      auVar343._8_4_ = fVar213 * pfVar7[2] + fVar217 * pfVar3[2];
      auVar343._12_4_ = fVar215 * pfVar7[3] + fVar200 * pfVar3[3];
      fVar317 = fVar310 * *pfVar8 + fVar212 * *pfVar4;
      fVar325 = fVar211 * pfVar8[1] + fVar314 * pfVar4[1];
      auVar319._0_8_ = CONCAT44(fVar325,fVar317);
      auVar319._8_4_ = fVar213 * pfVar8[2] + fVar217 * pfVar4[2];
      auVar319._12_4_ = fVar215 * pfVar8[3] + fVar200 * pfVar4[3];
      auVar164 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar204 = vinsertps_avx(auVar164,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar189 = vsubps_avx(auVar226,auVar204);
      auVar164 = vshufps_avx(auVar189,auVar189,0);
      auVar188 = vshufps_avx(auVar189,auVar189,0x55);
      auVar189 = vshufps_avx(auVar189,auVar189,0xaa);
      fVar310 = (local_5b0->vx).field_0.m128[0];
      fVar212 = (local_5b0->vx).field_0.m128[1];
      fVar314 = (local_5b0->vx).field_0.m128[2];
      fVar217 = (local_5b0->vx).field_0.m128[3];
      fVar200 = (local_5b0->vy).field_0.m128[0];
      fVar211 = (local_5b0->vy).field_0.m128[1];
      fVar213 = (local_5b0->vy).field_0.m128[2];
      fVar215 = (local_5b0->vy).field_0.m128[3];
      fVar221 = (local_5b0->vz).field_0.m128[0];
      fVar232 = (local_5b0->vz).field_0.m128[1];
      fVar235 = (local_5b0->vz).field_0.m128[2];
      fVar237 = (local_5b0->vz).field_0.m128[3];
      auVar203._0_8_ =
           CONCAT44(auVar164._4_4_ * fVar212 + auVar188._4_4_ * fVar211 + fVar232 * auVar189._4_4_,
                    auVar164._0_4_ * fVar310 + auVar188._0_4_ * fVar200 + fVar221 * auVar189._0_4_);
      auVar203._8_4_ =
           auVar164._8_4_ * fVar314 + auVar188._8_4_ * fVar213 + fVar235 * auVar189._8_4_;
      auVar203._12_4_ =
           auVar164._12_4_ * fVar217 + auVar188._12_4_ * fVar215 + fVar237 * auVar189._12_4_;
      auVar164 = vblendps_avx(auVar203,auVar226,8);
      auVar24 = vsubps_avx(auVar335,auVar204);
      auVar188 = vshufps_avx(auVar24,auVar24,0);
      auVar189 = vshufps_avx(auVar24,auVar24,0x55);
      auVar24 = vshufps_avx(auVar24,auVar24,0xaa);
      auVar271._0_4_ = auVar188._0_4_ * fVar310 + auVar189._0_4_ * fVar200 + fVar221 * auVar24._0_4_
      ;
      auVar271._4_4_ = auVar188._4_4_ * fVar212 + auVar189._4_4_ * fVar211 + fVar232 * auVar24._4_4_
      ;
      auVar271._8_4_ = auVar188._8_4_ * fVar314 + auVar189._8_4_ * fVar213 + fVar235 * auVar24._8_4_
      ;
      auVar271._12_4_ =
           auVar188._12_4_ * fVar217 + auVar189._12_4_ * fVar215 + fVar237 * auVar24._12_4_;
      auVar188 = vblendps_avx(auVar271,auVar335,8);
      auVar25 = vsubps_avx(auVar343,auVar204);
      auVar189 = vshufps_avx(auVar25,auVar25,0);
      auVar24 = vshufps_avx(auVar25,auVar25,0x55);
      auVar25 = vshufps_avx(auVar25,auVar25,0xaa);
      auVar278._0_4_ = auVar189._0_4_ * fVar310 + auVar24._0_4_ * fVar200 + auVar25._0_4_ * fVar221;
      auVar278._4_4_ = auVar189._4_4_ * fVar212 + auVar24._4_4_ * fVar211 + auVar25._4_4_ * fVar232;
      auVar278._8_4_ = auVar189._8_4_ * fVar314 + auVar24._8_4_ * fVar213 + auVar25._8_4_ * fVar235;
      auVar278._12_4_ =
           auVar189._12_4_ * fVar217 + auVar24._12_4_ * fVar215 + auVar25._12_4_ * fVar237;
      auVar189 = vblendps_avx(auVar278,auVar343,8);
      auVar25 = vsubps_avx(auVar319,auVar204);
      auVar204 = vshufps_avx(auVar25,auVar25,0);
      auVar24 = vshufps_avx(auVar25,auVar25,0x55);
      auVar25 = vshufps_avx(auVar25,auVar25,0xaa);
      auVar162._0_4_ = auVar204._0_4_ * fVar310 + auVar24._0_4_ * fVar200 + fVar221 * auVar25._0_4_;
      auVar162._4_4_ = auVar204._4_4_ * fVar212 + auVar24._4_4_ * fVar211 + fVar232 * auVar25._4_4_;
      auVar162._8_4_ = auVar204._8_4_ * fVar314 + auVar24._8_4_ * fVar213 + fVar235 * auVar25._8_4_;
      auVar162._12_4_ =
           auVar204._12_4_ * fVar217 + auVar24._12_4_ * fVar215 + fVar237 * auVar25._12_4_;
      auVar204 = vblendps_avx(auVar162,auVar319,8);
      auVar227._8_4_ = 0x7fffffff;
      auVar227._0_8_ = 0x7fffffff7fffffff;
      auVar227._12_4_ = 0x7fffffff;
      auVar164 = vandps_avx(auVar164,auVar227);
      auVar188 = vandps_avx(auVar188,auVar227);
      auVar24 = vmaxps_avx(auVar164,auVar188);
      auVar164 = vandps_avx(auVar189,auVar227);
      auVar188 = vandps_avx(auVar204,auVar227);
      auVar164 = vmaxps_avx(auVar164,auVar188);
      auVar164 = vmaxps_avx(auVar24,auVar164);
      auVar188 = vmovshdup_avx(auVar164);
      auVar188 = vmaxss_avx(auVar188,auVar164);
      auVar164 = vshufpd_avx(auVar164,auVar164,1);
      auVar164 = vmaxss_avx(auVar164,auVar188);
      fVar248 = *(float *)(catmullrom_basis0 + lVar21 + 0x908);
      fVar250 = *(float *)(catmullrom_basis0 + lVar21 + 0x90c);
      fVar332 = *(float *)(catmullrom_basis0 + lVar21 + 0x910);
      fVar179 = *(float *)(catmullrom_basis0 + lVar21 + 0x914);
      fVar214 = *(float *)(catmullrom_basis0 + lVar21 + 0x918);
      fVar305 = *(float *)(catmullrom_basis0 + lVar21 + 0x91c);
      fVar282 = *(float *)(catmullrom_basis0 + lVar21 + 0x920);
      auVar188 = vshufps_avx(auVar278,auVar278,0);
      register0x00001250 = auVar188;
      _local_6a0 = auVar188;
      auVar189 = vshufps_avx(auVar278,auVar278,0x55);
      register0x00001290 = auVar189;
      _local_780 = auVar189;
      fVar310 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar21 + 0xd8c);
      fVar212 = *(float *)(catmullrom_basis0 + lVar21 + 0xd90);
      fVar314 = *(float *)(catmullrom_basis0 + lVar21 + 0xd94);
      fVar217 = *(float *)(catmullrom_basis0 + lVar21 + 0xd98);
      fVar200 = *(float *)(catmullrom_basis0 + lVar21 + 0xd9c);
      fVar211 = *(float *)(catmullrom_basis0 + lVar21 + 0xda0);
      fVar213 = *(float *)(catmullrom_basis0 + lVar21 + 0xda4);
      auVar118 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar21 + 0xd8c);
      auVar204 = vshufps_avx(auVar162,auVar162,0);
      register0x00001210 = auVar204;
      _local_500 = auVar204;
      fVar131 = auVar204._0_4_;
      fVar132 = auVar204._4_4_;
      fVar152 = auVar204._8_4_;
      fVar220 = auVar204._12_4_;
      fVar158 = auVar188._0_4_;
      fVar176 = auVar188._4_4_;
      fVar177 = auVar188._8_4_;
      fVar178 = auVar188._12_4_;
      auVar188 = vshufps_avx(auVar162,auVar162,0x55);
      register0x000014d0 = auVar188;
      _local_600 = auVar188;
      fVar309 = auVar188._0_4_;
      fVar313 = auVar188._4_4_;
      fVar315 = auVar188._8_4_;
      fVar316 = auVar188._12_4_;
      fVar182 = auVar189._0_4_;
      fVar193 = auVar189._4_4_;
      fVar195 = auVar189._8_4_;
      fVar197 = auVar189._12_4_;
      auVar188 = vshufps_avx(auVar343,auVar343,0xff);
      register0x00001450 = auVar188;
      _local_80 = auVar188;
      auVar189 = vshufps_avx(auVar319,auVar319,0xff);
      register0x00001390 = auVar189;
      _local_a0 = auVar189;
      fVar254 = auVar189._0_4_;
      fVar261 = auVar189._4_4_;
      fVar262 = auVar189._8_4_;
      fVar263 = auVar189._12_4_;
      fVar180 = auVar188._0_4_;
      fVar292 = auVar188._4_4_;
      fVar293 = auVar188._8_4_;
      auVar189 = vshufps_avx(auVar271,auVar271,0);
      register0x00001310 = auVar189;
      _local_6c0 = auVar189;
      fVar215 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar21 + 0x484);
      fVar221 = *(float *)(catmullrom_basis0 + lVar21 + 0x488);
      fVar232 = *(float *)(catmullrom_basis0 + lVar21 + 0x48c);
      fVar235 = *(float *)(catmullrom_basis0 + lVar21 + 0x490);
      fVar237 = *(float *)(catmullrom_basis0 + lVar21 + 0x494);
      fVar239 = *(float *)(catmullrom_basis0 + lVar21 + 0x498);
      fVar246 = *(float *)(catmullrom_basis0 + lVar21 + 0x49c);
      auVar119 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar21 + 0x484);
      fVar223 = auVar189._0_4_;
      fVar234 = auVar189._4_4_;
      fVar236 = auVar189._8_4_;
      fVar238 = auVar189._12_4_;
      auVar189 = vshufps_avx(auVar271,auVar271,0x55);
      local_760._16_16_ = auVar189;
      local_760._0_16_ = auVar189;
      fVar342 = auVar189._0_4_;
      fVar349 = auVar189._4_4_;
      fVar350 = auVar189._8_4_;
      fVar351 = auVar189._12_4_;
      auVar189 = vshufps_avx(auVar335,auVar335,0xff);
      register0x00001590 = auVar189;
      _local_120 = auVar189;
      fVar329 = auVar189._0_4_;
      fVar330 = auVar189._4_4_;
      fVar331 = auVar189._8_4_;
      fVar334 = auVar189._12_4_;
      auVar110._8_4_ = auVar203._8_4_;
      auVar110._0_8_ = auVar203._0_8_;
      auVar110._12_4_ = auVar203._12_4_;
      auVar189 = vshufps_avx(auVar110,auVar110,0);
      register0x00001350 = auVar189;
      _local_4a0 = auVar189;
      local_540 = *(float *)(catmullrom_basis0 + lVar21);
      fStack_53c = *(float *)(catmullrom_basis0 + lVar21 + 4);
      fStack_538 = *(float *)(catmullrom_basis0 + lVar21 + 8);
      fStack_534 = *(float *)(catmullrom_basis0 + lVar21 + 0xc);
      fStack_530 = *(float *)(catmullrom_basis0 + lVar21 + 0x10);
      fStack_52c = *(float *)(catmullrom_basis0 + lVar21 + 0x14);
      fStack_528 = *(float *)(catmullrom_basis0 + lVar21 + 0x18);
      fStack_524 = *(float *)(catmullrom_basis0 + lVar21 + 0x1c);
      fVar240 = auVar189._0_4_;
      fVar247 = auVar189._4_4_;
      fVar249 = auVar189._8_4_;
      fVar251 = auVar189._12_4_;
      auVar272._0_4_ =
           fVar240 * local_540 + fVar223 * fVar215 + fVar158 * fVar248 + fVar131 * fVar310;
      auVar272._4_4_ =
           fVar247 * fStack_53c + fVar234 * fVar221 + fVar176 * fVar250 + fVar132 * fVar212;
      auVar272._8_4_ =
           fVar249 * fStack_538 + fVar236 * fVar232 + fVar177 * fVar332 + fVar152 * fVar314;
      auVar272._12_4_ =
           fVar251 * fStack_534 + fVar238 * fVar235 + fVar178 * fVar179 + fVar220 * fVar217;
      auVar272._16_4_ =
           fVar240 * fStack_530 + fVar223 * fVar237 + fVar158 * fVar214 + fVar131 * fVar200;
      auVar272._20_4_ =
           fVar247 * fStack_52c + fVar234 * fVar239 + fVar176 * fVar305 + fVar132 * fVar211;
      auVar272._24_4_ =
           fVar249 * fStack_528 + fVar236 * fVar246 + fVar177 * fVar282 + fVar152 * fVar213;
      auVar272._28_4_ = fVar251 + fVar178 + fVar220 + 0.0;
      auVar189 = vshufps_avx(auVar110,auVar110,0x55);
      register0x00001290 = auVar189;
      _local_300 = auVar189;
      fVar253 = auVar189._0_4_;
      fVar194 = auVar189._4_4_;
      fVar196 = auVar189._8_4_;
      fVar198 = auVar189._12_4_;
      auVar320._0_4_ =
           fVar253 * local_540 + fVar342 * fVar215 + fVar182 * fVar248 + fVar309 * fVar310;
      auVar320._4_4_ =
           fVar194 * fStack_53c + fVar349 * fVar221 + fVar193 * fVar250 + fVar313 * fVar212;
      auVar320._8_4_ =
           fVar196 * fStack_538 + fVar350 * fVar232 + fVar195 * fVar332 + fVar315 * fVar314;
      auVar320._12_4_ =
           fVar198 * fStack_534 + fVar351 * fVar235 + fVar197 * fVar179 + fVar316 * fVar217;
      auVar320._16_4_ =
           fVar253 * fStack_530 + fVar342 * fVar237 + fVar182 * fVar214 + fVar309 * fVar200;
      auVar320._20_4_ =
           fVar194 * fStack_52c + fVar349 * fVar239 + fVar193 * fVar305 + fVar313 * fVar211;
      auVar320._24_4_ =
           fVar196 * fStack_528 + fVar350 * fVar246 + fVar195 * fVar282 + fVar315 * fVar213;
      auVar320._28_4_ = fVar197 + 0.0 + 0.0 + 0.0;
      auVar189 = vpermilps_avx(auVar226,0xff);
      register0x00001490 = auVar189;
      _local_140 = auVar189;
      fVar294 = auVar189._0_4_;
      fVar302 = auVar189._4_4_;
      fVar304 = auVar189._8_4_;
      auVar138._0_4_ =
           fVar329 * fVar215 + fVar180 * fVar248 + fVar254 * fVar310 + fVar294 * local_540;
      auVar138._4_4_ =
           fVar330 * fVar221 + fVar292 * fVar250 + fVar261 * fVar212 + fVar302 * fStack_53c;
      auVar138._8_4_ =
           fVar331 * fVar232 + fVar293 * fVar332 + fVar262 * fVar314 + fVar304 * fStack_538;
      auVar138._12_4_ =
           fVar334 * fVar235 + auVar188._12_4_ * fVar179 + fVar263 * fVar217 +
           auVar189._12_4_ * fStack_534;
      auVar138._16_4_ =
           fVar329 * fVar237 + fVar180 * fVar214 + fVar254 * fVar200 + fVar294 * fStack_530;
      auVar138._20_4_ =
           fVar330 * fVar239 + fVar292 * fVar305 + fVar261 * fVar211 + fVar302 * fStack_52c;
      auVar138._24_4_ =
           fVar331 * fVar246 + fVar293 * fVar282 + fVar262 * fVar213 + fVar304 * fStack_528;
      auVar138._28_4_ = 0;
      fVar283 = *(float *)(catmullrom_basis1 + lVar21 + 0x908);
      fVar216 = *(float *)(catmullrom_basis1 + lVar21 + 0x90c);
      fVar306 = *(float *)(catmullrom_basis1 + lVar21 + 0x910);
      fVar284 = *(float *)(catmullrom_basis1 + lVar21 + 0x914);
      fVar285 = *(float *)(catmullrom_basis1 + lVar21 + 0x918);
      fVar218 = *(float *)(catmullrom_basis1 + lVar21 + 0x91c);
      fVar307 = *(float *)(catmullrom_basis1 + lVar21 + 0x920);
      fVar295 = *(float *)(catmullrom_basis1 + lVar21 + 0xd8c);
      fVar303 = *(float *)(catmullrom_basis1 + lVar21 + 0xd90);
      fVar219 = *(float *)(catmullrom_basis1 + lVar21 + 0xd94);
      fVar308 = *(float *)(catmullrom_basis1 + lVar21 + 0xd98);
      fVar157 = *(float *)(catmullrom_basis1 + lVar21 + 0xd9c);
      fVar181 = *(float *)(catmullrom_basis1 + lVar21 + 0xda0);
      fVar265 = *(float *)(catmullrom_basis1 + lVar21 + 0xda4);
      auVar150 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar21 + 0x484);
      auVar245 = ZEXT3264(auVar150);
      fVar310 = auVar150._0_4_;
      fVar314 = auVar150._4_4_;
      fVar200 = auVar150._8_4_;
      fVar213 = auVar150._12_4_;
      fVar221 = auVar150._16_4_;
      fVar235 = auVar150._20_4_;
      fVar239 = auVar150._24_4_;
      fVar199 = *(float *)(catmullrom_basis1 + lVar21);
      fVar252 = *(float *)(catmullrom_basis1 + lVar21 + 4);
      fVar264 = *(float *)(catmullrom_basis1 + lVar21 + 8);
      fVar153 = *(float *)(catmullrom_basis1 + lVar21 + 0xc);
      fVar154 = *(float *)(catmullrom_basis1 + lVar21 + 0x10);
      fVar155 = *(float *)(catmullrom_basis1 + lVar21 + 0x14);
      fVar156 = *(float *)(catmullrom_basis1 + lVar21 + 0x18);
      local_320._0_4_ =
           fVar240 * fVar199 + fVar223 * fVar310 + fVar283 * fVar158 + fVar295 * fVar131;
      local_320._4_4_ =
           fVar247 * fVar252 + fVar234 * fVar314 + fVar216 * fVar176 + fVar303 * fVar132;
      local_320._8_4_ =
           fVar249 * fVar264 + fVar236 * fVar200 + fVar306 * fVar177 + fVar219 * fVar152;
      local_320._12_4_ =
           fVar251 * fVar153 + fVar238 * fVar213 + fVar284 * fVar178 + fVar308 * fVar220;
      local_320._16_4_ =
           fVar240 * fVar154 + fVar223 * fVar221 + fVar285 * fVar158 + fVar157 * fVar131;
      local_320._20_4_ =
           fVar247 * fVar155 + fVar234 * fVar235 + fVar218 * fVar176 + fVar181 * fVar132;
      local_320._24_4_ =
           fVar249 * fVar156 + fVar236 * fVar239 + fVar307 * fVar177 + fVar265 * fVar152;
      local_320._28_4_ = fVar334 + fVar251 + 0.0 + 0.0;
      local_640._0_4_ =
           fVar253 * fVar199 + fVar342 * fVar310 + fVar283 * fVar182 + fVar309 * fVar295;
      local_640._4_4_ =
           fVar194 * fVar252 + fVar349 * fVar314 + fVar216 * fVar193 + fVar313 * fVar303;
      fStack_638 = fVar196 * fVar264 + fVar350 * fVar200 + fVar306 * fVar195 + fVar315 * fVar219;
      fStack_634 = fVar198 * fVar153 + fVar351 * fVar213 + fVar284 * fVar197 + fVar316 * fVar308;
      fStack_630 = fVar253 * fVar154 + fVar342 * fVar221 + fVar285 * fVar182 + fVar309 * fVar157;
      fStack_62c = fVar194 * fVar155 + fVar349 * fVar235 + fVar218 * fVar193 + fVar313 * fVar181;
      fStack_628 = fVar196 * fVar156 + fVar350 * fVar239 + fVar307 * fVar195 + fVar315 * fVar265;
      fStack_624 = fVar198 + fVar251 + 0.0 + 0.0;
      auVar287._0_4_ = fVar329 * fVar310 + fVar180 * fVar283 + fVar295 * fVar254 + fVar294 * fVar199
      ;
      auVar287._4_4_ = fVar330 * fVar314 + fVar292 * fVar216 + fVar303 * fVar261 + fVar302 * fVar252
      ;
      auVar287._8_4_ = fVar331 * fVar200 + fVar293 * fVar306 + fVar219 * fVar262 + fVar304 * fVar264
      ;
      auVar287._12_4_ =
           fVar334 * fVar213 + auVar188._12_4_ * fVar284 + fVar308 * fVar263 +
           auVar189._12_4_ * fVar153;
      auVar287._16_4_ =
           fVar329 * fVar221 + fVar180 * fVar285 + fVar157 * fVar254 + fVar294 * fVar154;
      auVar287._20_4_ =
           fVar330 * fVar235 + fVar292 * fVar218 + fVar181 * fVar261 + fVar302 * fVar155;
      auVar287._24_4_ =
           fVar331 * fVar239 + fVar293 * fVar307 + fVar265 * fVar262 + fVar304 * fVar156;
      auVar287._28_4_ = fVar263 + fVar251 + 0.0 + fVar198;
      local_380 = vsubps_avx(local_320,auVar272);
      auVar298 = vsubps_avx(_local_640,auVar320);
      fVar212 = local_380._0_4_;
      fVar217 = local_380._4_4_;
      auVar209._4_4_ = auVar320._4_4_ * fVar217;
      auVar209._0_4_ = auVar320._0_4_ * fVar212;
      fVar211 = local_380._8_4_;
      auVar209._8_4_ = auVar320._8_4_ * fVar211;
      fVar215 = local_380._12_4_;
      auVar209._12_4_ = auVar320._12_4_ * fVar215;
      fVar232 = local_380._16_4_;
      auVar209._16_4_ = auVar320._16_4_ * fVar232;
      fVar237 = local_380._20_4_;
      auVar209._20_4_ = auVar320._20_4_ * fVar237;
      fVar246 = local_380._24_4_;
      auVar209._24_4_ = auVar320._24_4_ * fVar246;
      auVar209._28_4_ = fVar198;
      fVar254 = auVar298._0_4_;
      fVar261 = auVar298._4_4_;
      auVar32._4_4_ = fVar261 * auVar272._4_4_;
      auVar32._0_4_ = fVar254 * auVar272._0_4_;
      fVar262 = auVar298._8_4_;
      auVar32._8_4_ = fVar262 * auVar272._8_4_;
      fVar263 = auVar298._12_4_;
      auVar32._12_4_ = fVar263 * auVar272._12_4_;
      fVar180 = auVar298._16_4_;
      auVar32._16_4_ = fVar180 * auVar272._16_4_;
      fVar292 = auVar298._20_4_;
      auVar32._20_4_ = fVar292 * auVar272._20_4_;
      fVar293 = auVar298._24_4_;
      auVar32._24_4_ = fVar293 * auVar272._24_4_;
      auVar32._28_4_ = fStack_624;
      auVar32 = vsubps_avx(auVar209,auVar32);
      auVar209 = vmaxps_avx(auVar138,auVar287);
      auVar143._4_4_ = auVar209._4_4_ * auVar209._4_4_ * (fVar217 * fVar217 + fVar261 * fVar261);
      auVar143._0_4_ = auVar209._0_4_ * auVar209._0_4_ * (fVar212 * fVar212 + fVar254 * fVar254);
      auVar143._8_4_ = auVar209._8_4_ * auVar209._8_4_ * (fVar211 * fVar211 + fVar262 * fVar262);
      auVar143._12_4_ = auVar209._12_4_ * auVar209._12_4_ * (fVar215 * fVar215 + fVar263 * fVar263);
      auVar143._16_4_ = auVar209._16_4_ * auVar209._16_4_ * (fVar232 * fVar232 + fVar180 * fVar180);
      auVar143._20_4_ = auVar209._20_4_ * auVar209._20_4_ * (fVar237 * fVar237 + fVar292 * fVar292);
      auVar143._24_4_ = auVar209._24_4_ * auVar209._24_4_ * (fVar246 * fVar246 + fVar293 * fVar293);
      auVar143._28_4_ = local_320._28_4_ + fStack_624;
      auVar22._4_4_ = auVar32._4_4_ * auVar32._4_4_;
      auVar22._0_4_ = auVar32._0_4_ * auVar32._0_4_;
      auVar22._8_4_ = auVar32._8_4_ * auVar32._8_4_;
      auVar22._12_4_ = auVar32._12_4_ * auVar32._12_4_;
      auVar22._16_4_ = auVar32._16_4_ * auVar32._16_4_;
      auVar22._20_4_ = auVar32._20_4_ * auVar32._20_4_;
      auVar22._24_4_ = auVar32._24_4_ * auVar32._24_4_;
      auVar22._28_4_ = auVar32._28_4_;
      auVar209 = vcmpps_avx(auVar22,auVar143,2);
      auVar188 = ZEXT416((uint)(float)(int)uVar15);
      local_4c0._0_16_ = auVar188;
      auVar188 = vshufps_avx(auVar188,auVar188,0);
      auVar205._16_16_ = auVar188;
      auVar205._0_16_ = auVar188;
      auVar32 = vcmpps_avx(_DAT_01faff40,auVar205,1);
      auVar210 = ZEXT3264(auVar32);
      auVar111._8_4_ = auVar203._8_4_;
      auVar111._0_8_ = auVar203._0_8_;
      auVar111._12_4_ = auVar203._12_4_;
      auVar188 = vpermilps_avx(auVar111,0xaa);
      register0x00001490 = auVar188;
      _local_340 = auVar188;
      auVar189 = vpermilps_avx(auVar271,0xaa);
      register0x00001550 = auVar189;
      _local_2e0 = auVar189;
      auVar204 = vpermilps_avx(auVar278,0xaa);
      register0x00001590 = auVar204;
      _local_c0 = auVar204;
      auVar24 = vpermilps_avx(auVar162,0xaa);
      register0x00001310 = auVar24;
      _local_800 = auVar24;
      auVar143 = auVar32 & auVar209;
      local_840 = *(uint *)(ray + k * 4 + 0x30);
      uStack_83c = 0;
      fStack_838 = 0.0;
      fStack_834 = 0.0;
      auVar164 = ZEXT416((uint)(auVar164._0_4_ * 4.7683716e-07));
      local_720._0_16_ = auVar164;
      uStack_868 = auVar226._8_8_;
      fVar212 = fVar182;
      fVar217 = fVar193;
      fVar211 = fVar195;
      fVar215 = fVar197;
      fVar232 = fVar223;
      fVar237 = fVar234;
      fVar246 = fVar236;
      _local_7e0 = auVar319;
      _local_7d0 = auVar343;
      _local_7c0 = auVar335;
      if ((((((((auVar143 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar143 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar143 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar143 >> 0x7f,0) == '\0') &&
            (auVar143 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar143 >> 0xbf,0) == '\0') &&
          (auVar143 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar143[0x1f]) {
        auVar291 = ZEXT3264(local_760);
        auVar298 = local_580;
      }
      else {
        auVar209 = vandps_avx(auVar209,auVar32);
        fVar292 = auVar188._0_4_;
        fVar293 = auVar188._4_4_;
        fVar294 = auVar188._8_4_;
        fVar302 = auVar188._12_4_;
        fVar304 = auVar189._0_4_;
        fVar329 = auVar189._4_4_;
        fVar330 = auVar189._8_4_;
        fVar331 = auVar189._12_4_;
        fVar334 = auVar204._0_4_;
        fVar338 = auVar204._4_4_;
        fVar339 = auVar204._8_4_;
        fVar340 = auVar204._12_4_;
        fVar254 = auVar24._0_4_;
        fVar261 = auVar24._4_4_;
        fVar262 = auVar24._8_4_;
        fVar263 = auVar24._12_4_;
        fVar180 = auVar32._28_4_ + *(float *)(catmullrom_basis1 + lVar21 + 0x924) + auVar150._28_4_;
        local_360 = fVar292 * fVar199 + fVar304 * fVar310 + fVar334 * fVar283 + fVar295 * fVar254;
        fStack_35c = fVar293 * fVar252 + fVar329 * fVar314 + fVar338 * fVar216 + fVar303 * fVar261;
        fStack_358 = fVar294 * fVar264 + fVar330 * fVar200 + fVar339 * fVar306 + fVar219 * fVar262;
        fStack_354 = fVar302 * fVar153 + fVar331 * fVar213 + fVar340 * fVar284 + fVar308 * fVar263;
        fStack_350 = fVar292 * fVar154 + fVar304 * fVar221 + fVar334 * fVar285 + fVar157 * fVar254;
        fStack_34c = fVar293 * fVar155 + fVar329 * fVar235 + fVar338 * fVar218 + fVar181 * fVar261;
        fStack_348 = fVar294 * fVar156 + fVar330 * fVar239 + fVar339 * fVar307 + fVar265 * fVar262;
        fStack_344 = auVar209._28_4_ + fVar180;
        local_700._0_4_ = auVar119._0_4_;
        local_700._4_4_ = auVar119._4_4_;
        fStack_6f8 = auVar119._8_4_;
        fStack_6f4 = auVar119._12_4_;
        fStack_6f0 = auVar119._16_4_;
        fStack_6ec = auVar119._20_4_;
        fStack_6e8 = auVar119._24_4_;
        local_660._0_4_ = auVar118._0_4_;
        local_660._4_4_ = auVar118._4_4_;
        fStack_658 = auVar118._8_4_;
        fStack_654 = auVar118._12_4_;
        fStack_650 = auVar118._16_4_;
        fStack_64c = auVar118._20_4_;
        fStack_648 = auVar118._24_4_;
        local_520 = fVar292 * local_540 +
                    fVar304 * (float)local_700._0_4_ +
                    fVar334 * fVar248 + fVar254 * (float)local_660._0_4_;
        fStack_51c = fVar293 * fStack_53c +
                     fVar329 * (float)local_700._4_4_ +
                     fVar338 * fVar250 + fVar261 * (float)local_660._4_4_;
        fStack_518 = fVar294 * fStack_538 +
                     fVar330 * fStack_6f8 + fVar339 * fVar332 + fVar262 * fStack_658;
        fStack_514 = fVar302 * fStack_534 +
                     fVar331 * fStack_6f4 + fVar340 * fVar179 + fVar263 * fStack_654;
        fStack_510 = fVar292 * fStack_530 +
                     fVar304 * fStack_6f0 + fVar334 * fVar214 + fVar254 * fStack_650;
        fStack_50c = fVar293 * fStack_52c +
                     fVar329 * fStack_6ec + fVar338 * fVar305 + fVar261 * fStack_64c;
        fStack_508 = fVar294 * fStack_528 +
                     fVar330 * fStack_6e8 + fVar339 * fVar282 + fVar262 * fStack_648;
        fStack_504 = fStack_344 + fVar180 + auVar209._28_4_ + auVar32._28_4_;
        fVar310 = *(float *)(catmullrom_basis0 + lVar21 + 0x1210);
        fVar314 = *(float *)(catmullrom_basis0 + lVar21 + 0x1214);
        fVar200 = *(float *)(catmullrom_basis0 + lVar21 + 0x1218);
        fVar213 = *(float *)(catmullrom_basis0 + lVar21 + 0x121c);
        fVar221 = *(float *)(catmullrom_basis0 + lVar21 + 0x1220);
        fVar235 = *(float *)(catmullrom_basis0 + lVar21 + 0x1224);
        fVar239 = *(float *)(catmullrom_basis0 + lVar21 + 0x1228);
        fVar248 = *(float *)(catmullrom_basis0 + lVar21 + 0x1694);
        fVar250 = *(float *)(catmullrom_basis0 + lVar21 + 0x1698);
        fVar332 = *(float *)(catmullrom_basis0 + lVar21 + 0x169c);
        fVar179 = *(float *)(catmullrom_basis0 + lVar21 + 0x16a0);
        fVar214 = *(float *)(catmullrom_basis0 + lVar21 + 0x16a4);
        fVar305 = *(float *)(catmullrom_basis0 + lVar21 + 0x16a8);
        fVar282 = *(float *)(catmullrom_basis0 + lVar21 + 0x16ac);
        fVar283 = *(float *)(catmullrom_basis0 + lVar21 + 0x1b18);
        fVar216 = *(float *)(catmullrom_basis0 + lVar21 + 0x1b1c);
        fVar306 = *(float *)(catmullrom_basis0 + lVar21 + 0x1b20);
        fVar284 = *(float *)(catmullrom_basis0 + lVar21 + 0x1b24);
        fVar285 = *(float *)(catmullrom_basis0 + lVar21 + 0x1b28);
        fVar218 = *(float *)(catmullrom_basis0 + lVar21 + 0x1b2c);
        fVar307 = *(float *)(catmullrom_basis0 + lVar21 + 0x1b30);
        fVar295 = *(float *)(catmullrom_basis0 + lVar21 + 0x1f9c);
        fVar303 = *(float *)(catmullrom_basis0 + lVar21 + 0x1fa0);
        fVar219 = *(float *)(catmullrom_basis0 + lVar21 + 0x1fa4);
        fVar308 = *(float *)(catmullrom_basis0 + lVar21 + 0x1fa8);
        fVar157 = *(float *)(catmullrom_basis0 + lVar21 + 0x1fac);
        fVar181 = *(float *)(catmullrom_basis0 + lVar21 + 0x1fb0);
        fVar265 = *(float *)(catmullrom_basis0 + lVar21 + 0x1fb4);
        fVar252 = auVar150._28_4_ + 0.0;
        fVar199 = *(float *)(catmullrom_basis0 + lVar21 + 0x1b34) +
                  *(float *)(catmullrom_basis0 + lVar21 + 0x1fb8);
        fVar264 = *(float *)(catmullrom_basis0 + lVar21 + 0x16b0) + fVar199;
        local_700._4_4_ =
             fVar247 * fVar314 + fVar234 * fVar250 + fVar176 * fVar216 + fVar132 * fVar303;
        local_700._0_4_ =
             fVar240 * fVar310 + fVar223 * fVar248 + fVar158 * fVar283 + fVar131 * fVar295;
        fStack_6f8 = fVar249 * fVar200 + fVar236 * fVar332 + fVar177 * fVar306 + fVar152 * fVar219;
        fStack_6f4 = fVar251 * fVar213 + fVar238 * fVar179 + fVar178 * fVar284 + fVar220 * fVar308;
        fStack_6f0 = fVar240 * fVar221 + fVar223 * fVar214 + fVar158 * fVar285 + fVar131 * fVar157;
        fStack_6ec = fVar247 * fVar235 + fVar234 * fVar305 + fVar176 * fVar218 + fVar132 * fVar181;
        fStack_6e8 = fVar249 * fVar239 + fVar236 * fVar282 + fVar177 * fVar307 + fVar152 * fVar265;
        fStack_6e4 = *(float *)(catmullrom_basis0 + lVar21 + 0x16b0) +
                     *(float *)(catmullrom_basis0 + lVar21 + 0x1fb8) + fVar252;
        auVar168._0_4_ =
             fVar253 * fVar310 + fVar342 * fVar248 + fVar182 * fVar283 + fVar309 * fVar295;
        auVar168._4_4_ =
             fVar194 * fVar314 + fVar349 * fVar250 + fVar193 * fVar216 + fVar313 * fVar303;
        auVar168._8_4_ =
             fVar196 * fVar200 + fVar350 * fVar332 + fVar195 * fVar306 + fVar315 * fVar219;
        auVar168._12_4_ =
             fVar198 * fVar213 + fVar351 * fVar179 + fVar197 * fVar284 + fVar316 * fVar308;
        auVar168._16_4_ =
             fVar253 * fVar221 + fVar342 * fVar214 + fVar182 * fVar285 + fVar309 * fVar157;
        auVar168._20_4_ =
             fVar194 * fVar235 + fVar349 * fVar305 + fVar193 * fVar218 + fVar313 * fVar181;
        auVar168._24_4_ =
             fVar196 * fVar239 + fVar350 * fVar282 + fVar195 * fVar307 + fVar315 * fVar265;
        auVar168._28_4_ = fVar199 + fVar252 + *(float *)(catmullrom_basis1 + lVar21 + 0x1c) + 0.0;
        auVar242._0_4_ =
             fVar292 * fVar310 + fVar304 * fVar248 + fVar334 * fVar283 + fVar254 * fVar295;
        auVar242._4_4_ =
             fVar293 * fVar314 + fVar329 * fVar250 + fVar338 * fVar216 + fVar261 * fVar303;
        auVar242._8_4_ =
             fVar294 * fVar200 + fVar330 * fVar332 + fVar339 * fVar306 + fVar262 * fVar219;
        auVar242._12_4_ =
             fVar302 * fVar213 + fVar331 * fVar179 + fVar340 * fVar284 + fVar263 * fVar308;
        auVar242._16_4_ =
             fVar292 * fVar221 + fVar304 * fVar214 + fVar334 * fVar285 + fVar254 * fVar157;
        auVar242._20_4_ =
             fVar293 * fVar235 + fVar329 * fVar305 + fVar338 * fVar218 + fVar261 * fVar181;
        auVar242._24_4_ =
             fVar294 * fVar239 + fVar330 * fVar282 + fVar339 * fVar307 + fVar262 * fVar265;
        auVar242._28_4_ = *(float *)(catmullrom_basis0 + lVar21 + 0x122c) + fVar264;
        fVar310 = *(float *)(catmullrom_basis1 + lVar21 + 0x1b18);
        fVar314 = *(float *)(catmullrom_basis1 + lVar21 + 0x1b1c);
        fVar200 = *(float *)(catmullrom_basis1 + lVar21 + 0x1b20);
        fVar213 = *(float *)(catmullrom_basis1 + lVar21 + 0x1b24);
        fVar221 = *(float *)(catmullrom_basis1 + lVar21 + 0x1b28);
        fVar235 = *(float *)(catmullrom_basis1 + lVar21 + 0x1b2c);
        fVar239 = *(float *)(catmullrom_basis1 + lVar21 + 0x1b30);
        fVar248 = *(float *)(catmullrom_basis1 + lVar21 + 0x1f9c);
        fVar250 = *(float *)(catmullrom_basis1 + lVar21 + 0x1fa0);
        fVar332 = *(float *)(catmullrom_basis1 + lVar21 + 0x1fa4);
        fVar179 = *(float *)(catmullrom_basis1 + lVar21 + 0x1fa8);
        fVar214 = *(float *)(catmullrom_basis1 + lVar21 + 0x1fac);
        fVar305 = *(float *)(catmullrom_basis1 + lVar21 + 0x1fb0);
        fVar282 = *(float *)(catmullrom_basis1 + lVar21 + 0x1fb4);
        fVar283 = *(float *)(catmullrom_basis1 + lVar21 + 0x1694);
        fVar216 = *(float *)(catmullrom_basis1 + lVar21 + 0x1698);
        fVar306 = *(float *)(catmullrom_basis1 + lVar21 + 0x169c);
        fVar284 = *(float *)(catmullrom_basis1 + lVar21 + 0x16a0);
        fVar285 = *(float *)(catmullrom_basis1 + lVar21 + 0x16a4);
        fVar218 = *(float *)(catmullrom_basis1 + lVar21 + 0x16a8);
        fVar307 = *(float *)(catmullrom_basis1 + lVar21 + 0x16ac);
        fVar295 = *(float *)(catmullrom_basis1 + lVar21 + 0x1210);
        fVar303 = *(float *)(catmullrom_basis1 + lVar21 + 0x1214);
        fVar219 = *(float *)(catmullrom_basis1 + lVar21 + 0x1218);
        fVar308 = *(float *)(catmullrom_basis1 + lVar21 + 0x121c);
        fVar157 = *(float *)(catmullrom_basis1 + lVar21 + 0x1220);
        fVar181 = *(float *)(catmullrom_basis1 + lVar21 + 0x1224);
        fVar265 = *(float *)(catmullrom_basis1 + lVar21 + 0x1228);
        auVar257._0_4_ =
             fVar295 * fVar240 + fVar223 * fVar283 + fVar158 * fVar310 + fVar131 * fVar248;
        auVar257._4_4_ =
             fVar303 * fVar247 + fVar234 * fVar216 + fVar176 * fVar314 + fVar132 * fVar250;
        auVar257._8_4_ =
             fVar219 * fVar249 + fVar236 * fVar306 + fVar177 * fVar200 + fVar152 * fVar332;
        auVar257._12_4_ =
             fVar308 * fVar251 + fVar238 * fVar284 + fVar178 * fVar213 + fVar220 * fVar179;
        auVar257._16_4_ =
             fVar157 * fVar240 + fVar223 * fVar285 + fVar158 * fVar221 + fVar131 * fVar214;
        auVar257._20_4_ =
             fVar181 * fVar247 + fVar234 * fVar218 + fVar176 * fVar235 + fVar132 * fVar305;
        auVar257._24_4_ =
             fVar265 * fVar249 + fVar236 * fVar307 + fVar177 * fVar239 + fVar152 * fVar282;
        auVar257._28_4_ = fVar302 + fVar302 + fVar251 + fVar264;
        auVar288._0_4_ =
             fVar253 * fVar295 + fVar342 * fVar283 + fVar182 * fVar310 + fVar309 * fVar248;
        auVar288._4_4_ =
             fVar194 * fVar303 + fVar349 * fVar216 + fVar193 * fVar314 + fVar313 * fVar250;
        auVar288._8_4_ =
             fVar196 * fVar219 + fVar350 * fVar306 + fVar195 * fVar200 + fVar315 * fVar332;
        auVar288._12_4_ =
             fVar198 * fVar308 + fVar351 * fVar284 + fVar197 * fVar213 + fVar316 * fVar179;
        auVar288._16_4_ =
             fVar253 * fVar157 + fVar342 * fVar285 + fVar182 * fVar221 + fVar309 * fVar214;
        auVar288._20_4_ =
             fVar194 * fVar181 + fVar349 * fVar218 + fVar193 * fVar235 + fVar313 * fVar305;
        auVar288._24_4_ =
             fVar196 * fVar265 + fVar350 * fVar307 + fVar195 * fVar239 + fVar315 * fVar282;
        auVar288._28_4_ = fVar302 + fVar302 + fVar302 + fVar251;
        auVar192._0_4_ =
             fVar292 * fVar295 + fVar304 * fVar283 + fVar334 * fVar310 + fVar248 * fVar254;
        auVar192._4_4_ =
             fVar293 * fVar303 + fVar329 * fVar216 + fVar338 * fVar314 + fVar250 * fVar261;
        auVar192._8_4_ =
             fVar294 * fVar219 + fVar330 * fVar306 + fVar339 * fVar200 + fVar332 * fVar262;
        auVar192._12_4_ =
             fVar302 * fVar308 + fVar331 * fVar284 + fVar340 * fVar213 + fVar179 * fVar263;
        auVar192._16_4_ =
             fVar292 * fVar157 + fVar304 * fVar285 + fVar334 * fVar221 + fVar214 * fVar254;
        auVar192._20_4_ =
             fVar293 * fVar181 + fVar329 * fVar218 + fVar338 * fVar235 + fVar305 * fVar261;
        auVar192._24_4_ =
             fVar294 * fVar265 + fVar330 * fVar307 + fVar339 * fVar239 + fVar282 * fVar262;
        auVar192._28_4_ =
             *(float *)(catmullrom_basis1 + lVar21 + 0x122c) +
             *(float *)(catmullrom_basis1 + lVar21 + 0x16b0) +
             *(float *)(catmullrom_basis1 + lVar21 + 0x1b34) +
             *(float *)(catmullrom_basis1 + lVar21 + 0x1fb8);
        auVar228._8_4_ = 0x7fffffff;
        auVar228._0_8_ = 0x7fffffff7fffffff;
        auVar228._12_4_ = 0x7fffffff;
        auVar228._16_4_ = 0x7fffffff;
        auVar228._20_4_ = 0x7fffffff;
        auVar228._24_4_ = 0x7fffffff;
        auVar228._28_4_ = 0x7fffffff;
        auVar150 = vandps_avx(_local_700,auVar228);
        auVar32 = vandps_avx(auVar168,auVar228);
        auVar32 = vmaxps_avx(auVar150,auVar32);
        auVar150 = vandps_avx(auVar242,auVar228);
        auVar150 = vmaxps_avx(auVar32,auVar150);
        auVar164 = vpermilps_avx(auVar164,0);
        auVar243._16_16_ = auVar164;
        auVar243._0_16_ = auVar164;
        auVar150 = vcmpps_avx(auVar150,auVar243,1);
        auVar143 = vblendvps_avx(_local_700,local_380,auVar150);
        auVar22 = vblendvps_avx(auVar168,auVar298,auVar150);
        auVar150 = vandps_avx(auVar257,auVar228);
        auVar32 = vandps_avx(auVar288,auVar228);
        auVar205 = vmaxps_avx(auVar150,auVar32);
        auVar150 = vandps_avx(auVar192,auVar228);
        auVar150 = vmaxps_avx(auVar205,auVar150);
        auVar205 = vcmpps_avx(auVar150,auVar243,1);
        auVar150 = vblendvps_avx(auVar257,local_380,auVar205);
        auVar298 = vblendvps_avx(auVar288,auVar298,auVar205);
        fVar252 = auVar143._0_4_;
        fVar264 = auVar143._4_4_;
        fVar153 = auVar143._8_4_;
        fVar154 = auVar143._12_4_;
        fVar155 = auVar143._16_4_;
        fVar156 = auVar143._20_4_;
        fVar131 = auVar143._24_4_;
        fVar253 = -auVar143._28_4_;
        fVar132 = auVar150._0_4_;
        fVar152 = auVar150._4_4_;
        fVar220 = auVar150._8_4_;
        fVar158 = auVar150._12_4_;
        fVar176 = auVar150._16_4_;
        fVar177 = auVar150._20_4_;
        fVar178 = auVar150._24_4_;
        fVar310 = auVar22._0_4_;
        fVar221 = auVar22._4_4_;
        fVar250 = auVar22._8_4_;
        fVar305 = auVar22._12_4_;
        fVar306 = auVar22._16_4_;
        fVar307 = auVar22._20_4_;
        fVar308 = auVar22._24_4_;
        auVar139._0_4_ = fVar310 * fVar310 + fVar252 * fVar252;
        auVar139._4_4_ = fVar221 * fVar221 + fVar264 * fVar264;
        auVar139._8_4_ = fVar250 * fVar250 + fVar153 * fVar153;
        auVar139._12_4_ = fVar305 * fVar305 + fVar154 * fVar154;
        auVar139._16_4_ = fVar306 * fVar306 + fVar155 * fVar155;
        auVar139._20_4_ = fVar307 * fVar307 + fVar156 * fVar156;
        auVar139._24_4_ = fVar308 * fVar308 + fVar131 * fVar131;
        auVar139._28_4_ = auVar288._28_4_ + auVar143._28_4_;
        auVar143 = vrsqrtps_avx(auVar139);
        fVar314 = auVar143._0_4_;
        fVar200 = auVar143._4_4_;
        auVar23._4_4_ = fVar200 * 1.5;
        auVar23._0_4_ = fVar314 * 1.5;
        fVar213 = auVar143._8_4_;
        auVar23._8_4_ = fVar213 * 1.5;
        fVar235 = auVar143._12_4_;
        auVar23._12_4_ = fVar235 * 1.5;
        fVar239 = auVar143._16_4_;
        auVar23._16_4_ = fVar239 * 1.5;
        fVar248 = auVar143._20_4_;
        auVar23._20_4_ = fVar248 * 1.5;
        fVar332 = auVar143._24_4_;
        fVar199 = auVar32._28_4_;
        auVar23._24_4_ = fVar332 * 1.5;
        auVar23._28_4_ = fVar199;
        auVar35._4_4_ = fVar200 * fVar200 * fVar200 * auVar139._4_4_ * 0.5;
        auVar35._0_4_ = fVar314 * fVar314 * fVar314 * auVar139._0_4_ * 0.5;
        auVar35._8_4_ = fVar213 * fVar213 * fVar213 * auVar139._8_4_ * 0.5;
        auVar35._12_4_ = fVar235 * fVar235 * fVar235 * auVar139._12_4_ * 0.5;
        auVar35._16_4_ = fVar239 * fVar239 * fVar239 * auVar139._16_4_ * 0.5;
        auVar35._20_4_ = fVar248 * fVar248 * fVar248 * auVar139._20_4_ * 0.5;
        auVar35._24_4_ = fVar332 * fVar332 * fVar332 * auVar139._24_4_ * 0.5;
        auVar35._28_4_ = auVar139._28_4_;
        auVar32 = vsubps_avx(auVar23,auVar35);
        fVar314 = auVar32._0_4_;
        fVar235 = auVar32._4_4_;
        fVar332 = auVar32._8_4_;
        fVar282 = auVar32._12_4_;
        fVar284 = auVar32._16_4_;
        fVar295 = auVar32._20_4_;
        fVar157 = auVar32._24_4_;
        fVar200 = auVar298._0_4_;
        fVar239 = auVar298._4_4_;
        fVar179 = auVar298._8_4_;
        fVar283 = auVar298._12_4_;
        fVar285 = auVar298._16_4_;
        fVar303 = auVar298._20_4_;
        fVar181 = auVar298._24_4_;
        auVar140._0_4_ = fVar200 * fVar200 + fVar132 * fVar132;
        auVar140._4_4_ = fVar239 * fVar239 + fVar152 * fVar152;
        auVar140._8_4_ = fVar179 * fVar179 + fVar220 * fVar220;
        auVar140._12_4_ = fVar283 * fVar283 + fVar158 * fVar158;
        auVar140._16_4_ = fVar285 * fVar285 + fVar176 * fVar176;
        auVar140._20_4_ = fVar303 * fVar303 + fVar177 * fVar177;
        auVar140._24_4_ = fVar181 * fVar181 + fVar178 * fVar178;
        auVar140._28_4_ = auVar150._28_4_ + auVar32._28_4_;
        auVar150 = vrsqrtps_avx(auVar140);
        fVar213 = auVar150._0_4_;
        fVar248 = auVar150._4_4_;
        auVar36._4_4_ = fVar248 * 1.5;
        auVar36._0_4_ = fVar213 * 1.5;
        fVar214 = auVar150._8_4_;
        auVar36._8_4_ = fVar214 * 1.5;
        fVar216 = auVar150._12_4_;
        auVar36._12_4_ = fVar216 * 1.5;
        fVar218 = auVar150._16_4_;
        auVar36._16_4_ = fVar218 * 1.5;
        fVar219 = auVar150._20_4_;
        auVar36._20_4_ = fVar219 * 1.5;
        fVar265 = auVar150._24_4_;
        auVar36._24_4_ = fVar265 * 1.5;
        auVar36._28_4_ = fVar199;
        auVar150._4_4_ = fVar248 * fVar248 * fVar248 * auVar140._4_4_ * 0.5;
        auVar150._0_4_ = fVar213 * fVar213 * fVar213 * auVar140._0_4_ * 0.5;
        auVar150._8_4_ = fVar214 * fVar214 * fVar214 * auVar140._8_4_ * 0.5;
        auVar150._12_4_ = fVar216 * fVar216 * fVar216 * auVar140._12_4_ * 0.5;
        auVar150._16_4_ = fVar218 * fVar218 * fVar218 * auVar140._16_4_ * 0.5;
        auVar150._20_4_ = fVar219 * fVar219 * fVar219 * auVar140._20_4_ * 0.5;
        auVar150._24_4_ = fVar265 * fVar265 * fVar265 * auVar140._24_4_ * 0.5;
        auVar150._28_4_ = auVar140._28_4_;
        auVar150 = vsubps_avx(auVar36,auVar150);
        fVar213 = auVar150._0_4_;
        fVar248 = auVar150._4_4_;
        fVar214 = auVar150._8_4_;
        fVar216 = auVar150._12_4_;
        fVar218 = auVar150._16_4_;
        fVar219 = auVar150._20_4_;
        fVar265 = auVar150._24_4_;
        fVar310 = auVar138._0_4_ * fVar310 * fVar314;
        fVar221 = auVar138._4_4_ * fVar221 * fVar235;
        auVar37._4_4_ = fVar221;
        auVar37._0_4_ = fVar310;
        fVar250 = auVar138._8_4_ * fVar250 * fVar332;
        auVar37._8_4_ = fVar250;
        fVar305 = auVar138._12_4_ * fVar305 * fVar282;
        auVar37._12_4_ = fVar305;
        fVar306 = auVar138._16_4_ * fVar306 * fVar284;
        auVar37._16_4_ = fVar306;
        fVar307 = auVar138._20_4_ * fVar307 * fVar295;
        auVar37._20_4_ = fVar307;
        fVar308 = auVar138._24_4_ * fVar308 * fVar157;
        auVar37._24_4_ = fVar308;
        auVar37._28_4_ = fVar199;
        local_660._4_4_ = fVar221 + auVar272._4_4_;
        local_660._0_4_ = fVar310 + auVar272._0_4_;
        fStack_658 = fVar250 + auVar272._8_4_;
        fStack_654 = fVar305 + auVar272._12_4_;
        fStack_650 = fVar306 + auVar272._16_4_;
        fStack_64c = fVar307 + auVar272._20_4_;
        fStack_648 = fVar308 + auVar272._24_4_;
        fStack_644 = fVar199 + auVar272._28_4_;
        fVar310 = auVar138._0_4_ * fVar314 * -fVar252;
        fVar221 = auVar138._4_4_ * fVar235 * -fVar264;
        auVar38._4_4_ = fVar221;
        auVar38._0_4_ = fVar310;
        fVar250 = auVar138._8_4_ * fVar332 * -fVar153;
        auVar38._8_4_ = fVar250;
        fVar305 = auVar138._12_4_ * fVar282 * -fVar154;
        auVar38._12_4_ = fVar305;
        fVar306 = auVar138._16_4_ * fVar284 * -fVar155;
        auVar38._16_4_ = fVar306;
        fVar307 = auVar138._20_4_ * fVar295 * -fVar156;
        auVar38._20_4_ = fVar307;
        fVar308 = auVar138._24_4_ * fVar157 * -fVar131;
        auVar38._24_4_ = fVar308;
        auVar38._28_4_ = fVar253;
        local_700._4_4_ = auVar320._4_4_ + fVar221;
        local_700._0_4_ = auVar320._0_4_ + fVar310;
        fStack_6f8 = auVar320._8_4_ + fVar250;
        fStack_6f4 = auVar320._12_4_ + fVar305;
        fStack_6f0 = auVar320._16_4_ + fVar306;
        fStack_6ec = auVar320._20_4_ + fVar307;
        fStack_6e8 = auVar320._24_4_ + fVar308;
        fStack_6e4 = auVar320._28_4_ + fVar253;
        fVar310 = fVar314 * 0.0 * auVar138._0_4_;
        fVar314 = fVar235 * 0.0 * auVar138._4_4_;
        auVar33._4_4_ = fVar314;
        auVar33._0_4_ = fVar310;
        fVar221 = fVar332 * 0.0 * auVar138._8_4_;
        auVar33._8_4_ = fVar221;
        fVar235 = fVar282 * 0.0 * auVar138._12_4_;
        auVar33._12_4_ = fVar235;
        fVar250 = fVar284 * 0.0 * auVar138._16_4_;
        auVar33._16_4_ = fVar250;
        fVar332 = fVar295 * 0.0 * auVar138._20_4_;
        auVar33._20_4_ = fVar332;
        fVar305 = fVar157 * 0.0 * auVar138._24_4_;
        auVar33._24_4_ = fVar305;
        auVar33._28_4_ = fVar331;
        auVar115._4_4_ = fStack_51c;
        auVar115._0_4_ = local_520;
        auVar115._8_4_ = fStack_518;
        auVar115._12_4_ = fStack_514;
        auVar115._16_4_ = fStack_510;
        auVar115._20_4_ = fStack_50c;
        auVar115._24_4_ = fStack_508;
        auVar115._28_4_ = fStack_504;
        auVar258._0_4_ = local_520 + fVar310;
        auVar258._4_4_ = fStack_51c + fVar314;
        auVar258._8_4_ = fStack_518 + fVar221;
        auVar258._12_4_ = fStack_514 + fVar235;
        auVar258._16_4_ = fStack_510 + fVar250;
        auVar258._20_4_ = fStack_50c + fVar332;
        auVar258._24_4_ = fStack_508 + fVar305;
        auVar258._28_4_ = fStack_504 + fVar331;
        fVar310 = auVar287._0_4_ * fVar200 * fVar213;
        fVar314 = auVar287._4_4_ * fVar239 * fVar248;
        auVar34._4_4_ = fVar314;
        auVar34._0_4_ = fVar310;
        fVar200 = auVar287._8_4_ * fVar179 * fVar214;
        auVar34._8_4_ = fVar200;
        fVar221 = auVar287._12_4_ * fVar283 * fVar216;
        auVar34._12_4_ = fVar221;
        fVar235 = auVar287._16_4_ * fVar285 * fVar218;
        auVar34._16_4_ = fVar235;
        fVar239 = auVar287._20_4_ * fVar303 * fVar219;
        auVar34._20_4_ = fVar239;
        fVar250 = auVar287._24_4_ * fVar181 * fVar265;
        auVar34._24_4_ = fVar250;
        auVar34._28_4_ = auVar298._28_4_;
        auVar272 = vsubps_avx(auVar272,auVar37);
        auVar297._0_4_ = local_320._0_4_ + fVar310;
        auVar297._4_4_ = local_320._4_4_ + fVar314;
        auVar297._8_4_ = local_320._8_4_ + fVar200;
        auVar297._12_4_ = local_320._12_4_ + fVar221;
        auVar297._16_4_ = local_320._16_4_ + fVar235;
        auVar297._20_4_ = local_320._20_4_ + fVar239;
        auVar297._24_4_ = local_320._24_4_ + fVar250;
        auVar297._28_4_ = local_320._28_4_ + auVar298._28_4_;
        fVar310 = auVar287._0_4_ * fVar213 * -fVar132;
        fVar314 = auVar287._4_4_ * fVar248 * -fVar152;
        auVar298._4_4_ = fVar314;
        auVar298._0_4_ = fVar310;
        fVar200 = auVar287._8_4_ * fVar214 * -fVar220;
        auVar298._8_4_ = fVar200;
        fVar221 = auVar287._12_4_ * fVar216 * -fVar158;
        auVar298._12_4_ = fVar221;
        fVar235 = auVar287._16_4_ * fVar218 * -fVar176;
        auVar298._16_4_ = fVar235;
        fVar239 = auVar287._20_4_ * fVar219 * -fVar177;
        auVar298._20_4_ = fVar239;
        fVar250 = auVar287._24_4_ * fVar265 * -fVar178;
        auVar298._24_4_ = fVar250;
        auVar298._28_4_ = fVar340;
        auVar320 = vsubps_avx(auVar320,auVar38);
        auVar312._0_4_ = fVar310 + (float)local_640._0_4_;
        auVar312._4_4_ = fVar314 + (float)local_640._4_4_;
        auVar312._8_4_ = fVar200 + fStack_638;
        auVar312._12_4_ = fVar221 + fStack_634;
        auVar312._16_4_ = fVar235 + fStack_630;
        auVar312._20_4_ = fVar239 + fStack_62c;
        auVar312._24_4_ = fVar250 + fStack_628;
        auVar312._28_4_ = fVar340 + fStack_624;
        fVar310 = fVar213 * 0.0 * auVar287._0_4_;
        fVar314 = fVar248 * 0.0 * auVar287._4_4_;
        auVar39._4_4_ = fVar314;
        auVar39._0_4_ = fVar310;
        fVar200 = fVar214 * 0.0 * auVar287._8_4_;
        auVar39._8_4_ = fVar200;
        fVar213 = fVar216 * 0.0 * auVar287._12_4_;
        auVar39._12_4_ = fVar213;
        fVar221 = fVar218 * 0.0 * auVar287._16_4_;
        auVar39._16_4_ = fVar221;
        fVar235 = fVar219 * 0.0 * auVar287._20_4_;
        auVar39._20_4_ = fVar235;
        fVar239 = fVar265 * 0.0 * auVar287._24_4_;
        auVar39._24_4_ = fVar239;
        auVar39._28_4_ = fVar253;
        auVar23 = vsubps_avx(auVar115,auVar33);
        auVar117._4_4_ = fStack_35c;
        auVar117._0_4_ = local_360;
        auVar117._8_4_ = fStack_358;
        auVar117._12_4_ = fStack_354;
        auVar117._16_4_ = fStack_350;
        auVar117._20_4_ = fStack_34c;
        auVar117._24_4_ = fStack_348;
        auVar117._28_4_ = fStack_344;
        auVar344._0_4_ = local_360 + fVar310;
        auVar344._4_4_ = fStack_35c + fVar314;
        auVar344._8_4_ = fStack_358 + fVar200;
        auVar344._12_4_ = fStack_354 + fVar213;
        auVar344._16_4_ = fStack_350 + fVar221;
        auVar344._20_4_ = fStack_34c + fVar235;
        auVar344._24_4_ = fStack_348 + fVar239;
        auVar344._28_4_ = fStack_344 + fVar253;
        auVar150 = vsubps_avx(local_320,auVar34);
        auVar32 = vsubps_avx(_local_640,auVar298);
        auVar298 = vsubps_avx(auVar117,auVar39);
        auVar143 = vsubps_avx(auVar312,auVar320);
        auVar22 = vsubps_avx(auVar344,auVar23);
        auVar40._4_4_ = auVar23._4_4_ * auVar143._4_4_;
        auVar40._0_4_ = auVar23._0_4_ * auVar143._0_4_;
        auVar40._8_4_ = auVar23._8_4_ * auVar143._8_4_;
        auVar40._12_4_ = auVar23._12_4_ * auVar143._12_4_;
        auVar40._16_4_ = auVar23._16_4_ * auVar143._16_4_;
        auVar40._20_4_ = auVar23._20_4_ * auVar143._20_4_;
        auVar40._24_4_ = auVar23._24_4_ * auVar143._24_4_;
        auVar40._28_4_ = fVar340;
        auVar41._4_4_ = auVar320._4_4_ * auVar22._4_4_;
        auVar41._0_4_ = auVar320._0_4_ * auVar22._0_4_;
        auVar41._8_4_ = auVar320._8_4_ * auVar22._8_4_;
        auVar41._12_4_ = auVar320._12_4_ * auVar22._12_4_;
        auVar41._16_4_ = auVar320._16_4_ * auVar22._16_4_;
        auVar41._20_4_ = auVar320._20_4_ * auVar22._20_4_;
        auVar41._24_4_ = auVar320._24_4_ * auVar22._24_4_;
        auVar41._28_4_ = fStack_624;
        auVar205 = vsubps_avx(auVar41,auVar40);
        auVar42._4_4_ = auVar272._4_4_ * auVar22._4_4_;
        auVar42._0_4_ = auVar272._0_4_ * auVar22._0_4_;
        auVar42._8_4_ = auVar272._8_4_ * auVar22._8_4_;
        auVar42._12_4_ = auVar272._12_4_ * auVar22._12_4_;
        auVar42._16_4_ = auVar272._16_4_ * auVar22._16_4_;
        auVar42._20_4_ = auVar272._20_4_ * auVar22._20_4_;
        auVar42._24_4_ = auVar272._24_4_ * auVar22._24_4_;
        auVar42._28_4_ = auVar22._28_4_;
        auVar35 = vsubps_avx(auVar297,auVar272);
        auVar43._4_4_ = auVar23._4_4_ * auVar35._4_4_;
        auVar43._0_4_ = auVar23._0_4_ * auVar35._0_4_;
        auVar43._8_4_ = auVar23._8_4_ * auVar35._8_4_;
        auVar43._12_4_ = auVar23._12_4_ * auVar35._12_4_;
        auVar43._16_4_ = auVar23._16_4_ * auVar35._16_4_;
        auVar43._20_4_ = auVar23._20_4_ * auVar35._20_4_;
        auVar43._24_4_ = auVar23._24_4_ * auVar35._24_4_;
        auVar43._28_4_ = local_320._28_4_;
        auVar36 = vsubps_avx(auVar43,auVar42);
        auVar44._4_4_ = auVar35._4_4_ * auVar320._4_4_;
        auVar44._0_4_ = auVar35._0_4_ * auVar320._0_4_;
        auVar44._8_4_ = auVar35._8_4_ * auVar320._8_4_;
        auVar44._12_4_ = auVar35._12_4_ * auVar320._12_4_;
        auVar44._16_4_ = auVar35._16_4_ * auVar320._16_4_;
        auVar44._20_4_ = auVar35._20_4_ * auVar320._20_4_;
        auVar44._24_4_ = auVar35._24_4_ * auVar320._24_4_;
        auVar44._28_4_ = auVar22._28_4_;
        auVar45._4_4_ = auVar272._4_4_ * auVar143._4_4_;
        auVar45._0_4_ = auVar272._0_4_ * auVar143._0_4_;
        auVar45._8_4_ = auVar272._8_4_ * auVar143._8_4_;
        auVar45._12_4_ = auVar272._12_4_ * auVar143._12_4_;
        auVar45._16_4_ = auVar272._16_4_ * auVar143._16_4_;
        auVar45._20_4_ = auVar272._20_4_ * auVar143._20_4_;
        auVar45._24_4_ = auVar272._24_4_ * auVar143._24_4_;
        auVar45._28_4_ = auVar143._28_4_;
        auVar143 = vsubps_avx(auVar45,auVar44);
        auVar141._0_4_ = auVar205._0_4_ * 0.0 + auVar143._0_4_ + auVar36._0_4_ * 0.0;
        auVar141._4_4_ = auVar205._4_4_ * 0.0 + auVar143._4_4_ + auVar36._4_4_ * 0.0;
        auVar141._8_4_ = auVar205._8_4_ * 0.0 + auVar143._8_4_ + auVar36._8_4_ * 0.0;
        auVar141._12_4_ = auVar205._12_4_ * 0.0 + auVar143._12_4_ + auVar36._12_4_ * 0.0;
        auVar141._16_4_ = auVar205._16_4_ * 0.0 + auVar143._16_4_ + auVar36._16_4_ * 0.0;
        auVar141._20_4_ = auVar205._20_4_ * 0.0 + auVar143._20_4_ + auVar36._20_4_ * 0.0;
        auVar141._24_4_ = auVar205._24_4_ * 0.0 + auVar143._24_4_ + auVar36._24_4_ * 0.0;
        auVar141._28_4_ = auVar143._28_4_ + auVar143._28_4_ + auVar36._28_4_;
        auVar35 = vcmpps_avx(auVar141,ZEXT432(0) << 0x20,2);
        auVar150 = vblendvps_avx(auVar150,_local_660,auVar35);
        auVar32 = vblendvps_avx(auVar32,_local_700,auVar35);
        auVar298 = vblendvps_avx(auVar298,auVar258,auVar35);
        auVar143 = vblendvps_avx(auVar272,auVar297,auVar35);
        auVar22 = vblendvps_avx(auVar320,auVar312,auVar35);
        auVar205 = vblendvps_avx(auVar23,auVar344,auVar35);
        auVar272 = vblendvps_avx(auVar297,auVar272,auVar35);
        auVar320 = vblendvps_avx(auVar312,auVar320,auVar35);
        auVar164 = vpackssdw_avx(auVar209._0_16_,auVar209._16_16_);
        auVar23 = vblendvps_avx(auVar344,auVar23,auVar35);
        auVar272 = vsubps_avx(auVar272,auVar150);
        auVar245 = ZEXT3264(auVar272);
        auVar36 = vsubps_avx(auVar320,auVar32);
        auVar23 = vsubps_avx(auVar23,auVar298);
        auVar37 = vsubps_avx(auVar32,auVar22);
        fVar310 = auVar36._0_4_;
        fVar131 = auVar298._0_4_;
        fVar235 = auVar36._4_4_;
        fVar132 = auVar298._4_4_;
        auVar46._4_4_ = fVar132 * fVar235;
        auVar46._0_4_ = fVar131 * fVar310;
        fVar179 = auVar36._8_4_;
        fVar152 = auVar298._8_4_;
        auVar46._8_4_ = fVar152 * fVar179;
        fVar216 = auVar36._12_4_;
        fVar220 = auVar298._12_4_;
        auVar46._12_4_ = fVar220 * fVar216;
        fVar307 = auVar36._16_4_;
        fVar158 = auVar298._16_4_;
        auVar46._16_4_ = fVar158 * fVar307;
        fVar157 = auVar36._20_4_;
        fVar176 = auVar298._20_4_;
        auVar46._20_4_ = fVar176 * fVar157;
        fVar264 = auVar36._24_4_;
        fVar177 = auVar298._24_4_;
        auVar46._24_4_ = fVar177 * fVar264;
        auVar46._28_4_ = auVar320._28_4_;
        fVar314 = auVar32._0_4_;
        fVar249 = auVar23._0_4_;
        fVar239 = auVar32._4_4_;
        fVar251 = auVar23._4_4_;
        auVar47._4_4_ = fVar251 * fVar239;
        auVar47._0_4_ = fVar249 * fVar314;
        fVar214 = auVar32._8_4_;
        fVar254 = auVar23._8_4_;
        auVar47._8_4_ = fVar254 * fVar214;
        fVar306 = auVar32._12_4_;
        fVar261 = auVar23._12_4_;
        auVar47._12_4_ = fVar261 * fVar306;
        fVar295 = auVar32._16_4_;
        fVar262 = auVar23._16_4_;
        auVar47._16_4_ = fVar262 * fVar295;
        fVar181 = auVar32._20_4_;
        fVar263 = auVar23._20_4_;
        auVar47._20_4_ = fVar263 * fVar181;
        fVar153 = auVar32._24_4_;
        fVar180 = auVar23._24_4_;
        auVar47._24_4_ = fVar180 * fVar153;
        auVar47._28_4_ = auVar312._28_4_;
        auVar320 = vsubps_avx(auVar47,auVar46);
        fVar200 = auVar150._0_4_;
        fVar248 = auVar150._4_4_;
        auVar48._4_4_ = fVar251 * fVar248;
        auVar48._0_4_ = fVar249 * fVar200;
        fVar305 = auVar150._8_4_;
        auVar48._8_4_ = fVar254 * fVar305;
        fVar284 = auVar150._12_4_;
        auVar48._12_4_ = fVar261 * fVar284;
        fVar303 = auVar150._16_4_;
        auVar48._16_4_ = fVar262 * fVar303;
        fVar265 = auVar150._20_4_;
        auVar48._20_4_ = fVar263 * fVar265;
        fVar154 = auVar150._24_4_;
        auVar48._24_4_ = fVar180 * fVar154;
        auVar48._28_4_ = auVar312._28_4_;
        fVar213 = auVar272._0_4_;
        auVar336._0_4_ = fVar131 * fVar213;
        fVar250 = auVar272._4_4_;
        auVar336._4_4_ = fVar132 * fVar250;
        fVar282 = auVar272._8_4_;
        auVar336._8_4_ = fVar152 * fVar282;
        fVar285 = auVar272._12_4_;
        auVar336._12_4_ = fVar220 * fVar285;
        fVar219 = auVar272._16_4_;
        auVar336._16_4_ = fVar158 * fVar219;
        fVar199 = auVar272._20_4_;
        auVar336._20_4_ = fVar176 * fVar199;
        fVar155 = auVar272._24_4_;
        auVar336._24_4_ = fVar177 * fVar155;
        auVar336._28_4_ = 0;
        auVar38 = vsubps_avx(auVar336,auVar48);
        auVar49._4_4_ = fVar239 * fVar250;
        auVar49._0_4_ = fVar314 * fVar213;
        auVar49._8_4_ = fVar214 * fVar282;
        auVar49._12_4_ = fVar306 * fVar285;
        auVar49._16_4_ = fVar295 * fVar219;
        auVar49._20_4_ = fVar181 * fVar199;
        auVar49._24_4_ = fVar153 * fVar155;
        auVar49._28_4_ = auVar312._28_4_;
        auVar50._4_4_ = fVar248 * fVar235;
        auVar50._0_4_ = fVar200 * fVar310;
        auVar50._8_4_ = fVar305 * fVar179;
        auVar50._12_4_ = fVar284 * fVar216;
        auVar50._16_4_ = fVar303 * fVar307;
        auVar50._20_4_ = fVar265 * fVar157;
        auVar50._24_4_ = fVar154 * fVar264;
        auVar50._28_4_ = auVar344._28_4_;
        auVar33 = vsubps_avx(auVar50,auVar49);
        auVar34 = vsubps_avx(auVar298,auVar205);
        fVar221 = auVar33._28_4_ + auVar38._28_4_;
        auVar169._0_4_ = auVar33._0_4_ + auVar38._0_4_ * 0.0 + auVar320._0_4_ * 0.0;
        auVar169._4_4_ = auVar33._4_4_ + auVar38._4_4_ * 0.0 + auVar320._4_4_ * 0.0;
        auVar169._8_4_ = auVar33._8_4_ + auVar38._8_4_ * 0.0 + auVar320._8_4_ * 0.0;
        auVar169._12_4_ = auVar33._12_4_ + auVar38._12_4_ * 0.0 + auVar320._12_4_ * 0.0;
        auVar169._16_4_ = auVar33._16_4_ + auVar38._16_4_ * 0.0 + auVar320._16_4_ * 0.0;
        auVar169._20_4_ = auVar33._20_4_ + auVar38._20_4_ * 0.0 + auVar320._20_4_ * 0.0;
        auVar169._24_4_ = auVar33._24_4_ + auVar38._24_4_ * 0.0 + auVar320._24_4_ * 0.0;
        auVar169._28_4_ = fVar221 + auVar320._28_4_;
        fVar178 = auVar37._0_4_;
        fVar253 = auVar37._4_4_;
        auVar51._4_4_ = fVar253 * auVar205._4_4_;
        auVar51._0_4_ = fVar178 * auVar205._0_4_;
        fVar194 = auVar37._8_4_;
        auVar51._8_4_ = fVar194 * auVar205._8_4_;
        fVar196 = auVar37._12_4_;
        auVar51._12_4_ = fVar196 * auVar205._12_4_;
        fVar198 = auVar37._16_4_;
        auVar51._16_4_ = fVar198 * auVar205._16_4_;
        fVar240 = auVar37._20_4_;
        auVar51._20_4_ = fVar240 * auVar205._20_4_;
        fVar247 = auVar37._24_4_;
        auVar51._24_4_ = fVar247 * auVar205._24_4_;
        auVar51._28_4_ = fVar221;
        fVar221 = auVar34._0_4_;
        fVar332 = auVar34._4_4_;
        auVar52._4_4_ = auVar22._4_4_ * fVar332;
        auVar52._0_4_ = auVar22._0_4_ * fVar221;
        fVar283 = auVar34._8_4_;
        auVar52._8_4_ = auVar22._8_4_ * fVar283;
        fVar218 = auVar34._12_4_;
        auVar52._12_4_ = auVar22._12_4_ * fVar218;
        fVar308 = auVar34._16_4_;
        auVar52._16_4_ = auVar22._16_4_ * fVar308;
        fVar252 = auVar34._20_4_;
        auVar52._20_4_ = auVar22._20_4_ * fVar252;
        fVar156 = auVar34._24_4_;
        auVar52._24_4_ = auVar22._24_4_ * fVar156;
        auVar52._28_4_ = auVar33._28_4_;
        auVar37 = vsubps_avx(auVar52,auVar51);
        auVar38 = vsubps_avx(auVar150,auVar143);
        fVar292 = auVar38._0_4_;
        fVar293 = auVar38._4_4_;
        auVar53._4_4_ = fVar293 * auVar205._4_4_;
        auVar53._0_4_ = fVar292 * auVar205._0_4_;
        fVar294 = auVar38._8_4_;
        auVar53._8_4_ = fVar294 * auVar205._8_4_;
        fVar302 = auVar38._12_4_;
        auVar53._12_4_ = fVar302 * auVar205._12_4_;
        fVar304 = auVar38._16_4_;
        auVar53._16_4_ = fVar304 * auVar205._16_4_;
        fVar309 = auVar38._20_4_;
        auVar53._20_4_ = fVar309 * auVar205._20_4_;
        fVar313 = auVar38._24_4_;
        auVar53._24_4_ = fVar313 * auVar205._24_4_;
        auVar53._28_4_ = auVar205._28_4_;
        auVar54._4_4_ = auVar143._4_4_ * fVar332;
        auVar54._0_4_ = auVar143._0_4_ * fVar221;
        auVar54._8_4_ = auVar143._8_4_ * fVar283;
        auVar54._12_4_ = auVar143._12_4_ * fVar218;
        auVar54._16_4_ = auVar143._16_4_ * fVar308;
        auVar54._20_4_ = auVar143._20_4_ * fVar252;
        auVar54._24_4_ = auVar143._24_4_ * fVar156;
        auVar54._28_4_ = auVar320._28_4_;
        auVar320 = vsubps_avx(auVar53,auVar54);
        auVar55._4_4_ = auVar22._4_4_ * fVar293;
        auVar55._0_4_ = auVar22._0_4_ * fVar292;
        auVar55._8_4_ = auVar22._8_4_ * fVar294;
        auVar55._12_4_ = auVar22._12_4_ * fVar302;
        auVar55._16_4_ = auVar22._16_4_ * fVar304;
        auVar55._20_4_ = auVar22._20_4_ * fVar309;
        auVar55._24_4_ = auVar22._24_4_ * fVar313;
        auVar55._28_4_ = auVar205._28_4_;
        auVar56._4_4_ = auVar143._4_4_ * fVar253;
        auVar56._0_4_ = auVar143._0_4_ * fVar178;
        auVar56._8_4_ = auVar143._8_4_ * fVar194;
        auVar56._12_4_ = auVar143._12_4_ * fVar196;
        auVar56._16_4_ = auVar143._16_4_ * fVar198;
        auVar56._20_4_ = auVar143._20_4_ * fVar240;
        auVar56._24_4_ = auVar143._24_4_ * fVar247;
        auVar56._28_4_ = auVar143._28_4_;
        auVar143 = vsubps_avx(auVar56,auVar55);
        auVar151 = ZEXT864(0) << 0x20;
        auVar229._0_4_ = auVar37._0_4_ * 0.0 + auVar143._0_4_ + auVar320._0_4_ * 0.0;
        auVar229._4_4_ = auVar37._4_4_ * 0.0 + auVar143._4_4_ + auVar320._4_4_ * 0.0;
        auVar229._8_4_ = auVar37._8_4_ * 0.0 + auVar143._8_4_ + auVar320._8_4_ * 0.0;
        auVar229._12_4_ = auVar37._12_4_ * 0.0 + auVar143._12_4_ + auVar320._12_4_ * 0.0;
        auVar229._16_4_ = auVar37._16_4_ * 0.0 + auVar143._16_4_ + auVar320._16_4_ * 0.0;
        auVar229._20_4_ = auVar37._20_4_ * 0.0 + auVar143._20_4_ + auVar320._20_4_ * 0.0;
        auVar229._24_4_ = auVar37._24_4_ * 0.0 + auVar143._24_4_ + auVar320._24_4_ * 0.0;
        auVar229._28_4_ = auVar143._28_4_ + auVar143._28_4_ + auVar320._28_4_;
        auVar143 = vmaxps_avx(auVar169,auVar229);
        auVar143 = vcmpps_avx(auVar143,ZEXT832(0) << 0x20,2);
        auVar188 = vpackssdw_avx(auVar143._0_16_,auVar143._16_16_);
        auVar164 = vpand_avx(auVar188,auVar164);
        auVar188 = vpmovsxwd_avx(auVar164);
        auVar189 = vpunpckhwd_avx(auVar164,auVar164);
        auVar206._16_16_ = auVar189;
        auVar206._0_16_ = auVar188;
        if ((((((((auVar206 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar206 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar206 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar206 >> 0x7f,0) == '\0') &&
              (auVar206 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar189 >> 0x3f,0) == '\0') &&
            (auVar206 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar189[0xf]) {
LAB_00fa93e7:
          auVar347 = ZEXT3264(local_580);
          auVar210 = ZEXT3264(auVar206);
          auVar281 = ZEXT3264(CONCAT824(uStack_588,
                                        CONCAT816(uStack_590,CONCAT88(uStack_598,local_5a0))));
        }
        else {
          auVar57._4_4_ = fVar332 * fVar235;
          auVar57._0_4_ = fVar221 * fVar310;
          auVar57._8_4_ = fVar283 * fVar179;
          auVar57._12_4_ = fVar218 * fVar216;
          auVar57._16_4_ = fVar308 * fVar307;
          auVar57._20_4_ = fVar252 * fVar157;
          auVar57._24_4_ = fVar156 * fVar264;
          auVar57._28_4_ = auVar189._12_4_;
          auVar321._0_4_ = fVar178 * fVar249;
          auVar321._4_4_ = fVar253 * fVar251;
          auVar321._8_4_ = fVar194 * fVar254;
          auVar321._12_4_ = fVar196 * fVar261;
          auVar321._16_4_ = fVar198 * fVar262;
          auVar321._20_4_ = fVar240 * fVar263;
          auVar321._24_4_ = fVar247 * fVar180;
          auVar321._28_4_ = 0;
          auVar143 = vsubps_avx(auVar321,auVar57);
          auVar58._4_4_ = fVar293 * fVar251;
          auVar58._0_4_ = fVar292 * fVar249;
          auVar58._8_4_ = fVar294 * fVar254;
          auVar58._12_4_ = fVar302 * fVar261;
          auVar58._16_4_ = fVar304 * fVar262;
          auVar58._20_4_ = fVar309 * fVar263;
          auVar58._24_4_ = fVar313 * fVar180;
          auVar58._28_4_ = auVar23._28_4_;
          auVar59._4_4_ = fVar332 * fVar250;
          auVar59._0_4_ = fVar221 * fVar213;
          auVar59._8_4_ = fVar283 * fVar282;
          auVar59._12_4_ = fVar218 * fVar285;
          auVar59._16_4_ = fVar308 * fVar219;
          auVar59._20_4_ = fVar252 * fVar199;
          auVar59._24_4_ = fVar156 * fVar155;
          auVar59._28_4_ = auVar34._28_4_;
          auVar205 = vsubps_avx(auVar59,auVar58);
          auVar60._4_4_ = fVar253 * fVar250;
          auVar60._0_4_ = fVar178 * fVar213;
          auVar60._8_4_ = fVar194 * fVar282;
          auVar60._12_4_ = fVar196 * fVar285;
          auVar60._16_4_ = fVar198 * fVar219;
          auVar60._20_4_ = fVar240 * fVar199;
          auVar60._24_4_ = fVar247 * fVar155;
          auVar60._28_4_ = auVar169._28_4_;
          auVar61._4_4_ = fVar293 * fVar235;
          auVar61._0_4_ = fVar292 * fVar310;
          auVar61._8_4_ = fVar294 * fVar179;
          auVar61._12_4_ = fVar302 * fVar216;
          auVar61._16_4_ = fVar304 * fVar307;
          auVar61._20_4_ = fVar309 * fVar157;
          auVar61._24_4_ = fVar313 * fVar264;
          auVar61._28_4_ = auVar36._28_4_;
          auVar320 = vsubps_avx(auVar61,auVar60);
          auVar273._0_4_ = auVar143._0_4_ * 0.0 + auVar320._0_4_ + auVar205._0_4_ * 0.0;
          auVar273._4_4_ = auVar143._4_4_ * 0.0 + auVar320._4_4_ + auVar205._4_4_ * 0.0;
          auVar273._8_4_ = auVar143._8_4_ * 0.0 + auVar320._8_4_ + auVar205._8_4_ * 0.0;
          auVar273._12_4_ = auVar143._12_4_ * 0.0 + auVar320._12_4_ + auVar205._12_4_ * 0.0;
          auVar273._16_4_ = auVar143._16_4_ * 0.0 + auVar320._16_4_ + auVar205._16_4_ * 0.0;
          auVar273._20_4_ = auVar143._20_4_ * 0.0 + auVar320._20_4_ + auVar205._20_4_ * 0.0;
          auVar273._24_4_ = auVar143._24_4_ * 0.0 + auVar320._24_4_ + auVar205._24_4_ * 0.0;
          auVar273._28_4_ = auVar36._28_4_ + auVar320._28_4_ + auVar169._28_4_;
          auVar22 = vrcpps_avx(auVar273);
          fVar310 = auVar22._0_4_;
          fVar213 = auVar22._4_4_;
          auVar62._4_4_ = auVar273._4_4_ * fVar213;
          auVar62._0_4_ = auVar273._0_4_ * fVar310;
          fVar221 = auVar22._8_4_;
          auVar62._8_4_ = auVar273._8_4_ * fVar221;
          fVar235 = auVar22._12_4_;
          auVar62._12_4_ = auVar273._12_4_ * fVar235;
          fVar250 = auVar22._16_4_;
          auVar62._16_4_ = auVar273._16_4_ * fVar250;
          fVar332 = auVar22._20_4_;
          auVar62._20_4_ = auVar273._20_4_ * fVar332;
          fVar179 = auVar22._24_4_;
          auVar62._24_4_ = auVar273._24_4_ * fVar179;
          auVar62._28_4_ = auVar34._28_4_;
          auVar322._8_4_ = 0x3f800000;
          auVar322._0_8_ = 0x3f8000003f800000;
          auVar322._12_4_ = 0x3f800000;
          auVar322._16_4_ = 0x3f800000;
          auVar322._20_4_ = 0x3f800000;
          auVar322._24_4_ = 0x3f800000;
          auVar322._28_4_ = 0x3f800000;
          auVar23 = vsubps_avx(auVar322,auVar62);
          fVar310 = auVar23._0_4_ * fVar310 + fVar310;
          fVar213 = auVar23._4_4_ * fVar213 + fVar213;
          fVar221 = auVar23._8_4_ * fVar221 + fVar221;
          fVar235 = auVar23._12_4_ * fVar235 + fVar235;
          fVar250 = auVar23._16_4_ * fVar250 + fVar250;
          fVar332 = auVar23._20_4_ * fVar332 + fVar332;
          fVar179 = auVar23._24_4_ * fVar179 + fVar179;
          auVar63._4_4_ =
               (auVar143._4_4_ * fVar248 + auVar205._4_4_ * fVar239 + auVar320._4_4_ * fVar132) *
               fVar213;
          auVar63._0_4_ =
               (auVar143._0_4_ * fVar200 + auVar205._0_4_ * fVar314 + auVar320._0_4_ * fVar131) *
               fVar310;
          auVar63._8_4_ =
               (auVar143._8_4_ * fVar305 + auVar205._8_4_ * fVar214 + auVar320._8_4_ * fVar152) *
               fVar221;
          auVar63._12_4_ =
               (auVar143._12_4_ * fVar284 + auVar205._12_4_ * fVar306 + auVar320._12_4_ * fVar220) *
               fVar235;
          auVar63._16_4_ =
               (auVar143._16_4_ * fVar303 + auVar205._16_4_ * fVar295 + auVar320._16_4_ * fVar158) *
               fVar250;
          auVar63._20_4_ =
               (auVar143._20_4_ * fVar265 + auVar205._20_4_ * fVar181 + auVar320._20_4_ * fVar176) *
               fVar332;
          auVar63._24_4_ =
               (auVar143._24_4_ * fVar154 + auVar205._24_4_ * fVar153 + auVar320._24_4_ * fVar177) *
               fVar179;
          auVar63._28_4_ = auVar272._28_4_ + auVar298._28_4_;
          auVar245 = ZEXT3264(auVar63);
          auVar188 = vpermilps_avx(ZEXT416(local_840),0);
          auVar142._16_16_ = auVar188;
          auVar142._0_16_ = auVar188;
          auVar298 = vcmpps_avx(auVar142,auVar63,2);
          uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar207._4_4_ = uVar12;
          auVar207._0_4_ = uVar12;
          auVar207._8_4_ = uVar12;
          auVar207._12_4_ = uVar12;
          auVar207._16_4_ = uVar12;
          auVar207._20_4_ = uVar12;
          auVar207._24_4_ = uVar12;
          auVar207._28_4_ = uVar12;
          auVar143 = vcmpps_avx(auVar63,auVar207,2);
          auVar298 = vandps_avx(auVar143,auVar298);
          auVar188 = vpackssdw_avx(auVar298._0_16_,auVar298._16_16_);
          auVar164 = vpand_avx(auVar164,auVar188);
          auVar188 = vpmovsxwd_avx(auVar164);
          auVar189 = vpshufd_avx(auVar164,0xee);
          auVar189 = vpmovsxwd_avx(auVar189);
          auVar206._16_16_ = auVar189;
          auVar206._0_16_ = auVar188;
          auVar347 = ZEXT3264(local_580);
          if ((((((((auVar206 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar206 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar206 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar206 >> 0x7f,0) == '\0') &&
                (auVar206 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar189 >> 0x3f,0) == '\0') &&
              (auVar206 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar189[0xf]) goto LAB_00fa93e7;
          auVar298 = vcmpps_avx(ZEXT832(0) << 0x20,auVar273,4);
          auVar188 = vpackssdw_avx(auVar298._0_16_,auVar298._16_16_);
          auVar164 = vpand_avx(auVar164,auVar188);
          auVar188 = vpmovsxwd_avx(auVar164);
          auVar210 = ZEXT1664(auVar188);
          auVar164 = vpunpckhwd_avx(auVar164,auVar164);
          auVar259._16_16_ = auVar164;
          auVar259._0_16_ = auVar188;
          auVar281 = ZEXT3264(CONCAT824(uStack_588,
                                        CONCAT816(uStack_590,CONCAT88(uStack_598,local_5a0))));
          if ((((((((auVar259 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar259 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar259 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar259 >> 0x7f,0) != '\0') ||
                (auVar259 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar164 >> 0x3f,0) != '\0') ||
              (auVar259 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar164[0xf] < '\0') {
            auVar64._4_4_ = auVar169._4_4_ * fVar213;
            auVar64._0_4_ = auVar169._0_4_ * fVar310;
            auVar64._8_4_ = auVar169._8_4_ * fVar221;
            auVar64._12_4_ = auVar169._12_4_ * fVar235;
            auVar64._16_4_ = auVar169._16_4_ * fVar250;
            auVar64._20_4_ = auVar169._20_4_ * fVar332;
            auVar64._24_4_ = auVar169._24_4_ * fVar179;
            auVar64._28_4_ = SUB84(uStack_588,4);
            auVar65._4_4_ = auVar229._4_4_ * fVar213;
            auVar65._0_4_ = auVar229._0_4_ * fVar310;
            auVar65._8_4_ = auVar229._8_4_ * fVar221;
            auVar65._12_4_ = auVar229._12_4_ * fVar235;
            auVar65._16_4_ = auVar229._16_4_ * fVar250;
            auVar65._20_4_ = auVar229._20_4_ * fVar332;
            auVar65._24_4_ = auVar229._24_4_ * fVar179;
            auVar65._28_4_ = auVar23._28_4_ + auVar22._28_4_;
            auVar230._8_4_ = 0x3f800000;
            auVar230._0_8_ = 0x3f8000003f800000;
            auVar230._12_4_ = 0x3f800000;
            auVar230._16_4_ = 0x3f800000;
            auVar230._20_4_ = 0x3f800000;
            auVar230._24_4_ = 0x3f800000;
            auVar230._28_4_ = 0x3f800000;
            auVar298 = vsubps_avx(auVar230,auVar64);
            auVar210 = ZEXT3264(auVar298);
            auVar298 = vblendvps_avx(auVar298,auVar64,auVar35);
            auVar347 = ZEXT3264(auVar298);
            auVar298 = vsubps_avx(auVar230,auVar65);
            _local_3a0 = vblendvps_avx(auVar298,auVar65,auVar35);
            auVar281 = ZEXT3264(auVar259);
            local_4e0 = auVar63;
          }
        }
        auVar291 = ZEXT3264(local_760);
        auVar298 = auVar347._0_32_;
        auVar143 = auVar281._0_32_;
        if ((((((((auVar143 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar143 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar143 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar143 >> 0x7f,0) != '\0') ||
              (auVar281 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar143 >> 0xbf,0) != '\0') ||
            (auVar281 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar281[0x1f] < '\0') {
          auVar22 = vsubps_avx(auVar287,auVar138);
          fVar314 = auVar138._0_4_ + auVar347._0_4_ * auVar22._0_4_;
          fVar200 = auVar138._4_4_ + auVar347._4_4_ * auVar22._4_4_;
          fVar213 = auVar138._8_4_ + auVar347._8_4_ * auVar22._8_4_;
          fVar221 = auVar138._12_4_ + auVar347._12_4_ * auVar22._12_4_;
          fVar235 = auVar138._16_4_ + auVar347._16_4_ * auVar22._16_4_;
          fVar239 = auVar138._20_4_ + auVar347._20_4_ * auVar22._20_4_;
          fVar248 = auVar138._24_4_ + auVar347._24_4_ * auVar22._24_4_;
          fVar250 = auVar22._28_4_ + 0.0;
          fVar310 = *(float *)((long)local_848->ray_space + k * 4 + -0x10);
          auVar66._4_4_ = (fVar200 + fVar200) * fVar310;
          auVar66._0_4_ = (fVar314 + fVar314) * fVar310;
          auVar66._8_4_ = (fVar213 + fVar213) * fVar310;
          auVar66._12_4_ = (fVar221 + fVar221) * fVar310;
          auVar66._16_4_ = (fVar235 + fVar235) * fVar310;
          auVar66._20_4_ = (fVar239 + fVar239) * fVar310;
          auVar66._24_4_ = (fVar248 + fVar248) * fVar310;
          auVar66._28_4_ = fVar250 + fVar250;
          auVar22 = vcmpps_avx(local_4e0,auVar66,6);
          auVar138 = auVar143 & auVar22;
          if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar138 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar138 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar138 >> 0x7f,0) != '\0') ||
                (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar138 >> 0xbf,0) != '\0') ||
              (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar138[0x1f] < '\0') {
            auVar210 = ZEXT3264(CONCAT428(0xbf800000,
                                          CONCAT424(0xbf800000,
                                                    CONCAT420(0xbf800000,
                                                              CONCAT416(0xbf800000,
                                                                        CONCAT412(0xbf800000,
                                                                                  CONCAT48(
                                                  0xbf800000,0xbf800000bf800000)))))));
            local_3a0._0_4_ = (float)local_3a0._0_4_ + (float)local_3a0._0_4_ + -1.0;
            local_3a0._4_4_ = (float)local_3a0._4_4_ + (float)local_3a0._4_4_ + -1.0;
            uStack_398._0_4_ = (float)uStack_398 + (float)uStack_398 + -1.0;
            uStack_398._4_4_ = uStack_398._4_4_ + uStack_398._4_4_ + -1.0;
            uStack_390._0_4_ = (float)uStack_390 + (float)uStack_390 + -1.0;
            uStack_390._4_4_ = uStack_390._4_4_ + uStack_390._4_4_ + -1.0;
            uStack_388._0_4_ = (float)uStack_388 + (float)uStack_388 + -1.0;
            uStack_388._4_4_ = uStack_388._4_4_ + uStack_388._4_4_ + -1.0;
            local_280 = auVar298;
            auVar121 = _local_3a0;
            auVar138 = _local_3a0;
            local_260 = (float)local_3a0._0_4_;
            fStack_25c = (float)local_3a0._4_4_;
            fStack_258 = (float)uStack_398;
            fStack_254 = uStack_398._4_4_;
            fStack_250 = (float)uStack_390;
            fStack_24c = uStack_390._4_4_;
            fStack_248 = (float)uStack_388;
            fStack_244 = uStack_388._4_4_;
            local_240 = local_4e0;
            local_220 = 0;
            local_21c = uVar15;
            local_210 = auVar226._0_8_;
            uStack_208 = uStack_868;
            uStack_7b8 = auVar335._8_8_;
            local_200 = auVar335._0_8_;
            uStack_1f8 = uStack_7b8;
            uStack_7c8 = auVar343._8_8_;
            local_1f0 = auVar343._0_8_;
            uStack_1e8 = uStack_7c8;
            uStack_7d8 = auVar319._8_8_;
            local_1e0 = auVar319._0_8_;
            uStack_1d8 = uStack_7d8;
            _local_3a0 = auVar138;
            if ((pGVar130->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              local_5e0 = vandps_avx(auVar22,auVar143);
              auVar186._0_4_ = 1.0 / (float)(int)uVar15;
              auVar186._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar164 = vshufps_avx(auVar186,auVar186,0);
              local_1a0[0] = auVar164._0_4_ * (auVar347._0_4_ + 0.0);
              local_1a0[1] = auVar164._4_4_ * (auVar347._4_4_ + 1.0);
              local_1a0[2] = auVar164._8_4_ * (auVar347._8_4_ + 2.0);
              local_1a0[3] = auVar164._12_4_ * (auVar347._12_4_ + 3.0);
              fStack_190 = auVar164._0_4_ * (auVar347._16_4_ + 4.0);
              fStack_18c = auVar164._4_4_ * (auVar347._20_4_ + 5.0);
              fStack_188 = auVar164._8_4_ * (auVar347._24_4_ + 6.0);
              fStack_184 = auVar347._28_4_ + 7.0;
              uStack_390 = auVar121._16_8_;
              uStack_388 = auVar138._24_8_;
              local_180 = local_3a0;
              uStack_178 = uStack_398;
              uStack_170 = uStack_390;
              uStack_168 = uStack_388;
              local_160 = local_4e0;
              auVar170._8_4_ = 0x7f800000;
              auVar170._0_8_ = 0x7f8000007f800000;
              auVar170._12_4_ = 0x7f800000;
              auVar170._16_4_ = 0x7f800000;
              auVar170._20_4_ = 0x7f800000;
              auVar170._24_4_ = 0x7f800000;
              auVar170._28_4_ = 0x7f800000;
              auVar143 = vblendvps_avx(auVar170,local_4e0,local_5e0);
              auVar22 = vshufps_avx(auVar143,auVar143,0xb1);
              auVar22 = vminps_avx(auVar143,auVar22);
              auVar138 = vshufpd_avx(auVar22,auVar22,5);
              auVar22 = vminps_avx(auVar22,auVar138);
              auVar138 = vperm2f128_avx(auVar22,auVar22,1);
              auVar22 = vminps_avx(auVar22,auVar138);
              auVar22 = vcmpps_avx(auVar143,auVar22,0);
              auVar138 = local_5e0 & auVar22;
              auVar143 = local_5e0;
              if ((((((((auVar138 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar138 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar138 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar138 >> 0x7f,0) != '\0') ||
                    (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar138 >> 0xbf,0) != '\0') ||
                  (auVar138 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar138[0x1f] < '\0') {
                auVar143 = vandps_avx(auVar22,local_5e0);
              }
              uVar124 = vmovmskps_avx(auVar143);
              uVar20 = 0;
              if (uVar124 != 0) {
                for (; (uVar124 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                }
              }
              uVar125 = (ulong)uVar20;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar130->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar310 = local_1a0[uVar125];
                fVar200 = 1.0 - fVar310;
                fVar314 = fVar310 * 3.0;
                auVar245 = ZEXT464(0x3f000000);
                auVar164 = ZEXT416((uint)((fVar200 * -2.0 * fVar310 + fVar310 * fVar310) * 0.5));
                auVar164 = vshufps_avx(auVar164,auVar164,0);
                auVar188 = ZEXT416((uint)(((fVar200 + fVar200) * (fVar314 + 2.0) +
                                          fVar200 * fVar200 * -3.0) * 0.5));
                auVar188 = vshufps_avx(auVar188,auVar188,0);
                auVar189 = ZEXT416((uint)(((fVar310 + fVar310) * (fVar314 + -5.0) +
                                          fVar310 * fVar314) * 0.5));
                auVar189 = vshufps_avx(auVar189,auVar189,0);
                uVar12 = *(undefined4 *)((long)&local_180 + uVar125 * 4);
                auVar204 = ZEXT416((uint)((fVar310 * (fVar200 + fVar200) - fVar200 * fVar200) * 0.5)
                                  );
                auVar204 = vshufps_avx(auVar204,auVar204,0);
                auVar163._0_4_ =
                     auVar204._0_4_ * fVar222 +
                     auVar189._0_4_ * fVar333 + auVar164._0_4_ * fVar317 + auVar188._0_4_ * fVar341;
                auVar163._4_4_ =
                     auVar204._4_4_ * fVar233 +
                     auVar189._4_4_ * fVar337 + auVar164._4_4_ * fVar325 + auVar188._4_4_ * fVar348;
                auVar163._8_4_ =
                     auVar204._8_4_ * auVar226._8_4_ +
                     auVar189._8_4_ * auVar335._8_4_ +
                     auVar164._8_4_ * auVar319._8_4_ + auVar188._8_4_ * auVar343._8_4_;
                auVar163._12_4_ =
                     auVar204._12_4_ * auVar226._12_4_ +
                     auVar189._12_4_ * auVar335._12_4_ +
                     auVar164._12_4_ * auVar319._12_4_ + auVar188._12_4_ * auVar343._12_4_;
                auVar210 = ZEXT464(*(uint *)(local_160 + uVar125 * 4));
                *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_160 + uVar125 * 4);
                *(float *)(ray + k * 4 + 0xc0) = auVar163._0_4_;
                uVar16 = vextractps_avx(auVar163,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar16;
                uVar16 = vextractps_avx(auVar163,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar16;
                *(float *)(ray + k * 4 + 0xf0) = fVar310;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar12;
                *(uint *)(ray + k * 4 + 0x110) = uVar14;
                *(uint *)(ray + k * 4 + 0x120) = uVar126;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_680._0_16_ = vshufps_avx(ZEXT416(uVar126),ZEXT416(uVar126),0);
                local_680._16_16_ = auVar287._16_16_;
                local_620._0_16_ = vshufps_avx(ZEXT416(uVar14),ZEXT416(uVar14),0);
                local_620._16_16_ = auVar150._16_16_;
                _auStack_6d0 = auVar32._16_16_;
                _local_6e0 = *local_728;
                auStack_810 = auVar209._16_16_;
                local_820 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                local_580 = auVar298;
                while( true ) {
                  local_440 = local_1a0[uVar125];
                  local_430 = *(undefined4 *)((long)&local_180 + uVar125 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar125 * 4);
                  fVar200 = 1.0 - local_440;
                  fVar314 = local_440 * 3.0;
                  fVar310 = (local_440 + local_440) * (fVar314 + -5.0) + local_440 * fVar314;
                  auVar245 = ZEXT464((uint)fVar310);
                  auVar164 = ZEXT416((uint)((fVar200 * -2.0 * local_440 + local_440 * local_440) *
                                           0.5));
                  auVar164 = vshufps_avx(auVar164,auVar164,0);
                  auVar188 = ZEXT416((uint)(((fVar200 + fVar200) * (fVar314 + 2.0) +
                                            fVar200 * fVar200 * -3.0) * 0.5));
                  auVar188 = vshufps_avx(auVar188,auVar188,0);
                  auVar189 = vshufps_avx(ZEXT416((uint)(fVar310 * 0.5)),
                                         ZEXT416((uint)(fVar310 * 0.5)),0);
                  local_7b0.context = context->user;
                  auVar204 = ZEXT416((uint)((local_440 * (fVar200 + fVar200) - fVar200 * fVar200) *
                                           0.5));
                  auVar204 = vshufps_avx(auVar204,auVar204,0);
                  auVar191._0_4_ =
                       auVar204._0_4_ * fVar222 +
                       auVar189._0_4_ * (float)local_7c0._0_4_ +
                       auVar164._0_4_ * (float)local_7e0._0_4_ +
                       auVar188._0_4_ * (float)local_7d0._0_4_;
                  auVar191._4_4_ =
                       auVar204._4_4_ * fVar233 +
                       auVar189._4_4_ * (float)local_7c0._4_4_ +
                       auVar164._4_4_ * (float)local_7e0._4_4_ +
                       auVar188._4_4_ * (float)local_7d0._4_4_;
                  auVar191._8_4_ =
                       auVar204._8_4_ * auVar226._8_4_ +
                       auVar189._8_4_ * (float)uStack_7b8 +
                       auVar164._8_4_ * (float)uStack_7d8 + auVar188._8_4_ * (float)uStack_7c8;
                  auVar191._12_4_ =
                       auVar204._12_4_ * auVar226._12_4_ +
                       auVar189._12_4_ * uStack_7b8._4_4_ +
                       auVar164._12_4_ * uStack_7d8._4_4_ + auVar188._12_4_ * uStack_7c8._4_4_;
                  auVar164 = vshufps_avx(auVar191,auVar191,0);
                  local_470[0] = (RTCHitN)auVar164[0];
                  local_470[1] = (RTCHitN)auVar164[1];
                  local_470[2] = (RTCHitN)auVar164[2];
                  local_470[3] = (RTCHitN)auVar164[3];
                  local_470[4] = (RTCHitN)auVar164[4];
                  local_470[5] = (RTCHitN)auVar164[5];
                  local_470[6] = (RTCHitN)auVar164[6];
                  local_470[7] = (RTCHitN)auVar164[7];
                  local_470[8] = (RTCHitN)auVar164[8];
                  local_470[9] = (RTCHitN)auVar164[9];
                  local_470[10] = (RTCHitN)auVar164[10];
                  local_470[0xb] = (RTCHitN)auVar164[0xb];
                  local_470[0xc] = (RTCHitN)auVar164[0xc];
                  local_470[0xd] = (RTCHitN)auVar164[0xd];
                  local_470[0xe] = (RTCHitN)auVar164[0xe];
                  local_470[0xf] = (RTCHitN)auVar164[0xf];
                  auVar164 = vshufps_avx(auVar191,auVar191,0x55);
                  local_460 = auVar164;
                  local_450 = vshufps_avx(auVar191,auVar191,0xaa);
                  fStack_43c = local_440;
                  fStack_438 = local_440;
                  fStack_434 = local_440;
                  uStack_42c = local_430;
                  uStack_428 = local_430;
                  uStack_424 = local_430;
                  local_420 = local_620._0_8_;
                  uStack_418 = local_620._8_8_;
                  local_410 = local_680._0_8_;
                  uStack_408 = local_680._8_8_;
                  vcmpps_avx(auVar151._0_32_,auVar151._0_32_,0xf);
                  uStack_3fc = (local_7b0.context)->instID[0];
                  local_400 = uStack_3fc;
                  uStack_3f8 = uStack_3fc;
                  uStack_3f4 = uStack_3fc;
                  uStack_3f0 = (local_7b0.context)->instPrimID[0];
                  uStack_3ec = uStack_3f0;
                  uStack_3e8 = uStack_3f0;
                  uStack_3e4 = uStack_3f0;
                  local_860 = _local_6e0;
                  local_7b0.valid = (int *)local_860;
                  local_7b0.geometryUserPtr = pGVar130->userPtr;
                  local_7b0.hit = local_470;
                  local_7b0.N = 4;
                  local_7b0.ray = (RTCRayN *)ray;
                  if (pGVar130->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar245 = ZEXT464((uint)fVar310);
                    (*pGVar130->intersectionFilterN)(&local_7b0);
                    auVar291 = ZEXT3264(local_760);
                    auVar347 = ZEXT3264(local_580);
                    auVar151 = ZEXT1664(ZEXT816(0) << 0x40);
                    fVar182 = (float)local_780._0_4_;
                    fVar193 = (float)local_780._4_4_;
                    fVar195 = fStack_778;
                    fVar197 = fStack_774;
                    fVar212 = fStack_770;
                    fVar217 = fStack_76c;
                    fVar211 = fStack_768;
                    fVar215 = fStack_764;
                    fVar223 = (float)local_6c0._0_4_;
                    fVar234 = (float)local_6c0._4_4_;
                    fVar236 = fStack_6b8;
                    fVar238 = fStack_6b4;
                    fVar232 = fStack_6b0;
                    fVar237 = fStack_6ac;
                    fVar246 = fStack_6a8;
                  }
                  if (local_860 == (undefined1  [16])0x0) {
                    auVar164 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar164 = auVar164 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var19 = context->args->filter;
                    if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar130->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar245 = ZEXT1664(auVar245._0_16_);
                      (*p_Var19)(&local_7b0);
                      auVar291 = ZEXT3264(local_760);
                      auVar347 = ZEXT3264(local_580);
                      auVar151 = ZEXT1664(ZEXT816(0) << 0x40);
                      fVar182 = (float)local_780._0_4_;
                      fVar193 = (float)local_780._4_4_;
                      fVar195 = fStack_778;
                      fVar197 = fStack_774;
                      fVar212 = fStack_770;
                      fVar217 = fStack_76c;
                      fVar211 = fStack_768;
                      fVar215 = fStack_764;
                      fVar223 = (float)local_6c0._0_4_;
                      fVar234 = (float)local_6c0._4_4_;
                      fVar236 = fStack_6b8;
                      fVar238 = fStack_6b4;
                      fVar232 = fStack_6b0;
                      fVar237 = fStack_6ac;
                      fVar246 = fStack_6a8;
                    }
                    auVar188 = vpcmpeqd_avx(local_860,_DAT_01f7aa10);
                    auVar189 = vpcmpeqd_avx(auVar164,auVar164);
                    auVar164 = auVar188 ^ auVar189;
                    if (local_860 != (undefined1  [16])0x0) {
                      auVar188 = auVar188 ^ auVar189;
                      auVar189 = vmaskmovps_avx(auVar188,*(undefined1 (*) [16])local_7b0.hit);
                      *(undefined1 (*) [16])(local_7b0.ray + 0xc0) = auVar189;
                      auVar189 = vmaskmovps_avx(auVar188,*(undefined1 (*) [16])
                                                          (local_7b0.hit + 0x10));
                      *(undefined1 (*) [16])(local_7b0.ray + 0xd0) = auVar189;
                      auVar189 = vmaskmovps_avx(auVar188,*(undefined1 (*) [16])
                                                          (local_7b0.hit + 0x20));
                      *(undefined1 (*) [16])(local_7b0.ray + 0xe0) = auVar189;
                      auVar189 = vmaskmovps_avx(auVar188,*(undefined1 (*) [16])
                                                          (local_7b0.hit + 0x30));
                      *(undefined1 (*) [16])(local_7b0.ray + 0xf0) = auVar189;
                      auVar189 = vmaskmovps_avx(auVar188,*(undefined1 (*) [16])
                                                          (local_7b0.hit + 0x40));
                      *(undefined1 (*) [16])(local_7b0.ray + 0x100) = auVar189;
                      auVar189 = vmaskmovps_avx(auVar188,*(undefined1 (*) [16])
                                                          (local_7b0.hit + 0x50));
                      *(undefined1 (*) [16])(local_7b0.ray + 0x110) = auVar189;
                      auVar189 = vmaskmovps_avx(auVar188,*(undefined1 (*) [16])
                                                          (local_7b0.hit + 0x60));
                      *(undefined1 (*) [16])(local_7b0.ray + 0x120) = auVar189;
                      auVar189 = vmaskmovps_avx(auVar188,*(undefined1 (*) [16])
                                                          (local_7b0.hit + 0x70));
                      *(undefined1 (*) [16])(local_7b0.ray + 0x130) = auVar189;
                      auVar188 = vmaskmovps_avx(auVar188,*(undefined1 (*) [16])
                                                          (local_7b0.hit + 0x80));
                      *(undefined1 (*) [16])(local_7b0.ray + 0x140) = auVar188;
                    }
                  }
                  auVar150 = local_4e0;
                  auVar298 = auVar347._0_32_;
                  auVar167._8_8_ = 0x100000001;
                  auVar167._0_8_ = 0x100000001;
                  if ((auVar167 & auVar164) == (undefined1  [16])0x0) {
                    *(int *)(ray + k * 4 + 0x80) = local_820._0_4_;
                    auVar164 = local_820;
                  }
                  else {
                    auVar164 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                  }
                  auVar210 = ZEXT3264(local_4e0);
                  *(undefined4 *)(local_5e0 + uVar125 * 4) = 0;
                  local_820 = auVar164;
                  auVar164 = vshufps_avx(auVar164,auVar164,0);
                  auVar149._16_16_ = auVar164;
                  auVar149._0_16_ = auVar164;
                  auVar32 = vcmpps_avx(auVar150,auVar149,2);
                  auVar209 = vandps_avx(auVar32,local_5e0);
                  local_5e0 = local_5e0 & auVar32;
                  if ((((((((local_5e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_5e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_5e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_5e0 >> 0x7f,0) == '\0') &&
                        (local_5e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_5e0 >> 0xbf,0) == '\0') &&
                      (local_5e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_5e0[0x1f]) break;
                  auVar175._8_4_ = 0x7f800000;
                  auVar175._0_8_ = 0x7f8000007f800000;
                  auVar175._12_4_ = 0x7f800000;
                  auVar175._16_4_ = 0x7f800000;
                  auVar175._20_4_ = 0x7f800000;
                  auVar175._24_4_ = 0x7f800000;
                  auVar175._28_4_ = 0x7f800000;
                  auVar150 = vblendvps_avx(auVar175,auVar150,auVar209);
                  auVar32 = vshufps_avx(auVar150,auVar150,0xb1);
                  auVar32 = vminps_avx(auVar150,auVar32);
                  auVar298 = vshufpd_avx(auVar32,auVar32,5);
                  auVar32 = vminps_avx(auVar32,auVar298);
                  auVar298 = vperm2f128_avx(auVar32,auVar32,1);
                  auVar32 = vminps_avx(auVar32,auVar298);
                  auVar32 = vcmpps_avx(auVar150,auVar32,0);
                  auVar298 = auVar209 & auVar32;
                  auVar150 = auVar209;
                  if ((((((((auVar298 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar298 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar298 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar298 >> 0x7f,0) != '\0') ||
                        (auVar298 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar298 >> 0xbf,0) != '\0') ||
                      (auVar298 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar298[0x1f] < '\0') {
                    auVar150 = vandps_avx(auVar32,auVar209);
                  }
                  uVar124 = vmovmskps_avx(auVar150);
                  uVar20 = 0;
                  if (uVar124 != 0) {
                    for (; (uVar124 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                    }
                  }
                  uVar125 = (ulong)uVar20;
                  local_5e0 = auVar209;
                }
              }
            }
          }
        }
      }
      local_580 = auVar298;
      if (8 < (int)uVar15) {
        auVar164 = vpshufd_avx(ZEXT416(uVar15),0);
        local_360 = auVar164._0_4_;
        fStack_35c = auVar164._4_4_;
        fStack_358 = auVar164._8_4_;
        fStack_354 = auVar164._12_4_;
        auVar164 = vshufps_avx(local_720._0_16_,local_720._0_16_,0);
        local_380._16_16_ = auVar164;
        local_380._0_16_ = auVar164;
        auVar112._4_4_ = uStack_83c;
        auVar112._0_4_ = local_840;
        auVar112._8_4_ = fStack_838;
        auVar112._12_4_ = fStack_834;
        auVar164 = vpermilps_avx(auVar112,0);
        local_e0._16_16_ = auVar164;
        local_e0._0_16_ = auVar164;
        auVar137._0_4_ = 1.0 / (float)local_4c0._0_4_;
        auVar137._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar164 = vshufps_avx(auVar137,auVar137,0);
        register0x00001210 = auVar164;
        _local_100 = auVar164;
        local_2a0 = vshufps_avx(ZEXT416(uVar126),ZEXT416(uVar126),0);
        local_2b0 = vshufps_avx(ZEXT416(uVar14),ZEXT416(uVar14),0);
        auVar151 = ZEXT1664(local_2b0);
        lVar128 = 8;
        fVar310 = (float)local_600._0_4_;
        fVar314 = (float)local_600._4_4_;
        fVar200 = fStack_5f8;
        fVar213 = fStack_5f4;
        fVar221 = fStack_5f0;
        fVar235 = fStack_5ec;
        fVar239 = fStack_5e8;
        do {
          pauVar9 = (undefined1 (*) [28])(catmullrom_basis0 + lVar128 * 4 + lVar21);
          fVar248 = *(float *)*pauVar9;
          fVar250 = *(float *)(*pauVar9 + 4);
          fVar332 = *(float *)(*pauVar9 + 8);
          fVar179 = *(float *)(*pauVar9 + 0xc);
          fVar214 = *(float *)(*pauVar9 + 0x10);
          fVar305 = *(float *)(*pauVar9 + 0x14);
          fVar282 = *(float *)(*pauVar9 + 0x18);
          auVar120 = *pauVar9;
          pauVar9 = (undefined1 (*) [28])(lVar21 + 0x21b37f0 + lVar128 * 4);
          fVar283 = *(float *)*pauVar9;
          fVar216 = *(float *)(*pauVar9 + 4);
          fVar306 = *(float *)(*pauVar9 + 8);
          fVar284 = *(float *)(*pauVar9 + 0xc);
          fVar285 = *(float *)(*pauVar9 + 0x10);
          fVar218 = *(float *)(*pauVar9 + 0x14);
          fVar307 = *(float *)(*pauVar9 + 0x18);
          auVar119 = *pauVar9;
          pfVar1 = (float *)(lVar21 + 0x21b3c74 + lVar128 * 4);
          local_520 = *pfVar1;
          fStack_51c = pfVar1[1];
          fStack_518 = pfVar1[2];
          fStack_514 = pfVar1[3];
          fStack_510 = pfVar1[4];
          fStack_50c = pfVar1[5];
          fStack_508 = pfVar1[6];
          fStack_504 = pfVar1[7];
          pauVar11 = (undefined1 (*) [32])(lVar21 + 0x21b40f8 + lVar128 * 4);
          fVar295 = *(float *)*pauVar11;
          fVar303 = *(float *)(*pauVar11 + 4);
          fVar219 = *(float *)(*pauVar11 + 8);
          fVar308 = *(float *)(*pauVar11 + 0xc);
          fVar157 = *(float *)(*pauVar11 + 0x10);
          fVar181 = *(float *)(*pauVar11 + 0x14);
          fVar265 = *(float *)(*pauVar11 + 0x18);
          auVar118 = *(undefined1 (*) [28])*pauVar11;
          fVar252 = auVar210._28_4_;
          fVar199 = fVar252 + *(float *)(*pauVar11 + 0x1c);
          fStack_824 = fVar252 + fVar252 + auVar151._28_4_;
          fVar158 = auVar291._0_4_;
          fVar176 = auVar291._4_4_;
          fVar177 = auVar291._8_4_;
          fVar178 = auVar291._12_4_;
          fVar253 = auVar291._16_4_;
          fVar194 = auVar291._20_4_;
          fVar196 = auVar291._24_4_;
          fVar220 = fVar252 + fVar199;
          auVar345._0_4_ =
               (float)local_4a0._0_4_ * fVar248 +
               fVar223 * fVar283 +
               local_520 * (float)local_6a0._0_4_ + (float)local_500._0_4_ * fVar295;
          auVar345._4_4_ =
               (float)local_4a0._4_4_ * fVar250 +
               fVar234 * fVar216 +
               fStack_51c * (float)local_6a0._4_4_ + (float)local_500._4_4_ * fVar303;
          auVar345._8_4_ =
               fStack_498 * fVar332 +
               fVar236 * fVar306 + fStack_518 * fStack_698 + fStack_4f8 * fVar219;
          auVar345._12_4_ =
               fStack_494 * fVar179 +
               fVar238 * fVar284 + fStack_514 * fStack_694 + fStack_4f4 * fVar308;
          auVar345._16_4_ =
               fStack_490 * fVar214 +
               fVar232 * fVar285 + fStack_510 * fStack_690 + fStack_4f0 * fVar157;
          auVar345._20_4_ =
               fStack_48c * fVar305 +
               fVar237 * fVar218 + fStack_50c * fStack_68c + fStack_4ec * fVar181;
          auVar345._24_4_ =
               fStack_488 * fVar282 +
               fVar246 * fVar307 + fStack_508 * fStack_688 + fStack_4e8 * fVar265;
          auVar345._28_4_ = fVar199 + fStack_824;
          local_720._0_4_ =
               (float)local_300._0_4_ * fVar248 +
               fVar158 * fVar283 + fVar182 * local_520 + fVar310 * fVar295;
          local_720._4_4_ =
               (float)local_300._4_4_ * fVar250 +
               fVar176 * fVar216 + fVar193 * fStack_51c + fVar314 * fVar303;
          local_720._8_4_ =
               fStack_2f8 * fVar332 + fVar177 * fVar306 + fVar195 * fStack_518 + fVar200 * fVar219;
          local_720._12_4_ =
               fStack_2f4 * fVar179 + fVar178 * fVar284 + fVar197 * fStack_514 + fVar213 * fVar308;
          local_720._16_4_ =
               fStack_2f0 * fVar214 + fVar253 * fVar285 + fVar212 * fStack_510 + fVar221 * fVar157;
          local_720._20_4_ =
               fStack_2ec * fVar305 + fVar194 * fVar218 + fVar217 * fStack_50c + fVar235 * fVar181;
          local_720._24_4_ =
               fStack_2e8 * fVar282 + fVar196 * fVar307 + fVar211 * fStack_508 + fVar239 * fVar265;
          local_720._28_4_ = fStack_824 + fVar252 + fVar252 + auVar245._28_4_;
          fVar132 = fVar248 * (float)local_140._0_4_ +
                    fVar283 * (float)local_120._0_4_ +
                    (float)local_80._0_4_ * local_520 + (float)local_a0._0_4_ * fVar295;
          fVar152 = fVar250 * (float)local_140._4_4_ +
                    fVar216 * (float)local_120._4_4_ +
                    (float)local_80._4_4_ * fStack_51c + (float)local_a0._4_4_ * fVar303;
          fStack_838 = fVar332 * fStack_138 +
                       fVar306 * fStack_118 + fStack_78 * fStack_518 + fStack_98 * fVar219;
          fStack_834 = fVar179 * fStack_134 +
                       fVar284 * fStack_114 + fStack_74 * fStack_514 + fStack_94 * fVar308;
          fStack_830 = fVar214 * fStack_130 +
                       fVar285 * fStack_110 + fStack_70 * fStack_510 + fStack_90 * fVar157;
          fStack_82c = fVar305 * fStack_12c +
                       fVar218 * fStack_10c + fStack_6c * fStack_50c + fStack_8c * fVar181;
          fStack_828 = fVar282 * fStack_128 +
                       fVar307 * fStack_108 + fStack_68 * fStack_508 + fStack_88 * fVar265;
          fStack_824 = fStack_824 + fVar220;
          pauVar10 = (undefined1 (*) [32])(catmullrom_basis1 + lVar128 * 4 + lVar21);
          auVar121 = *(undefined1 (*) [24])*pauVar10;
          pfVar1 = (float *)(lVar21 + 0x21b5c10 + lVar128 * 4);
          fVar283 = *pfVar1;
          fVar216 = pfVar1[1];
          fVar306 = pfVar1[2];
          fVar284 = pfVar1[3];
          fVar285 = pfVar1[4];
          fVar218 = pfVar1[5];
          fVar307 = pfVar1[6];
          pauVar9 = (undefined1 (*) [28])(lVar21 + 0x21b6094 + lVar128 * 4);
          fVar295 = *(float *)*pauVar9;
          fVar303 = *(float *)(*pauVar9 + 4);
          fVar219 = *(float *)(*pauVar9 + 8);
          fVar308 = *(float *)(*pauVar9 + 0xc);
          fVar157 = *(float *)(*pauVar9 + 0x10);
          fVar181 = *(float *)(*pauVar9 + 0x14);
          fVar265 = *(float *)(*pauVar9 + 0x18);
          auVar122 = *pauVar9;
          pfVar2 = (float *)(lVar21 + 0x21b6518 + lVar128 * 4);
          fVar199 = *pfVar2;
          fVar252 = pfVar2[1];
          fVar264 = pfVar2[2];
          fVar153 = pfVar2[3];
          fVar154 = pfVar2[4];
          fVar155 = pfVar2[5];
          fVar156 = pfVar2[6];
          fVar131 = pfVar2[7];
          auVar151 = ZEXT3264(*pauVar10);
          fVar220 = fVar131 + fVar131 + fVar220;
          fVar248 = auVar121._0_4_;
          fVar250 = auVar121._4_4_;
          fVar332 = auVar121._8_4_;
          fVar179 = auVar121._12_4_;
          fVar214 = auVar121._16_4_;
          fVar305 = auVar121._20_4_;
          fVar282 = (float)*(undefined8 *)(*pauVar10 + 0x18);
          local_680._0_4_ =
               (float)local_4a0._0_4_ * fVar248 +
               fVar223 * fVar283 +
               fVar295 * (float)local_6a0._0_4_ + (float)local_500._0_4_ * fVar199;
          local_680._4_4_ =
               (float)local_4a0._4_4_ * fVar250 +
               fVar234 * fVar216 +
               fVar303 * (float)local_6a0._4_4_ + (float)local_500._4_4_ * fVar252;
          local_680._8_4_ =
               fStack_498 * fVar332 +
               fVar236 * fVar306 + fVar219 * fStack_698 + fStack_4f8 * fVar264;
          local_680._12_4_ =
               fStack_494 * fVar179 +
               fVar238 * fVar284 + fVar308 * fStack_694 + fStack_4f4 * fVar153;
          local_680._16_4_ =
               fStack_490 * fVar214 +
               fVar232 * fVar285 + fVar157 * fStack_690 + fStack_4f0 * fVar154;
          local_680._20_4_ =
               fStack_48c * fVar305 +
               fVar237 * fVar218 + fVar181 * fStack_68c + fStack_4ec * fVar155;
          local_680._24_4_ =
               fStack_488 * fVar282 +
               fVar246 * fVar307 + fVar265 * fStack_688 + fStack_4e8 * fVar156;
          local_680._28_4_ = fVar131 + fStack_84 + fVar220;
          local_620._0_4_ =
               (float)local_300._0_4_ * fVar248 +
               fVar158 * fVar283 + fVar182 * fVar295 + fVar310 * fVar199;
          local_620._4_4_ =
               (float)local_300._4_4_ * fVar250 +
               fVar176 * fVar216 + fVar193 * fVar303 + fVar314 * fVar252;
          local_620._8_4_ =
               fStack_2f8 * fVar332 + fVar177 * fVar306 + fVar195 * fVar219 + fVar200 * fVar264;
          local_620._12_4_ =
               fStack_2f4 * fVar179 + fVar178 * fVar284 + fVar197 * fVar308 + fVar213 * fVar153;
          local_620._16_4_ =
               fStack_2f0 * fVar214 + fVar253 * fVar285 + fVar212 * fVar157 + fVar221 * fVar154;
          local_620._20_4_ =
               fStack_2ec * fVar305 + fVar194 * fVar218 + fVar217 * fVar181 + fVar235 * fVar155;
          local_620._24_4_ =
               fStack_2e8 * fVar282 + fVar196 * fVar307 + fVar211 * fVar265 + fVar239 * fVar156;
          local_620._28_4_ = fVar220 + fVar131 + fVar131 + auVar291._28_4_;
          auVar274._0_4_ =
               fVar283 * (float)local_120._0_4_ +
               (float)local_80._0_4_ * fVar295 + (float)local_a0._0_4_ * fVar199 +
               fVar248 * (float)local_140._0_4_;
          auVar274._4_4_ =
               fVar216 * (float)local_120._4_4_ +
               (float)local_80._4_4_ * fVar303 + (float)local_a0._4_4_ * fVar252 +
               fVar250 * (float)local_140._4_4_;
          auVar274._8_4_ =
               fVar306 * fStack_118 + fStack_78 * fVar219 + fStack_98 * fVar264 +
               fVar332 * fStack_138;
          auVar274._12_4_ =
               fVar284 * fStack_114 + fStack_74 * fVar308 + fStack_94 * fVar153 +
               fVar179 * fStack_134;
          auVar274._16_4_ =
               fVar285 * fStack_110 + fStack_70 * fVar157 + fStack_90 * fVar154 +
               fVar214 * fStack_130;
          auVar274._20_4_ =
               fVar218 * fStack_10c + fStack_6c * fVar181 + fStack_8c * fVar155 +
               fVar305 * fStack_12c;
          auVar274._24_4_ =
               fVar307 * fStack_108 + fStack_68 * fVar265 + fStack_88 * fVar156 +
               fVar282 * fStack_128;
          auVar274._28_4_ = fVar131 + fVar131 + fStack_84 + fVar220;
          auVar209 = vsubps_avx(local_680,auVar345);
          auVar32 = vsubps_avx(local_620,local_720);
          fVar237 = auVar209._0_4_;
          fVar239 = auVar209._4_4_;
          auVar67._4_4_ = fVar239 * local_720._4_4_;
          auVar67._0_4_ = fVar237 * local_720._0_4_;
          fVar246 = auVar209._8_4_;
          auVar67._8_4_ = fVar246 * local_720._8_4_;
          fVar295 = auVar209._12_4_;
          auVar67._12_4_ = fVar295 * local_720._12_4_;
          fVar303 = auVar209._16_4_;
          auVar67._16_4_ = fVar303 * local_720._16_4_;
          fVar219 = auVar209._20_4_;
          auVar67._20_4_ = fVar219 * local_720._20_4_;
          fVar308 = auVar209._24_4_;
          auVar67._24_4_ = fVar308 * local_720._24_4_;
          auVar67._28_4_ = fVar220;
          fVar310 = auVar32._0_4_;
          fVar314 = auVar32._4_4_;
          auVar68._4_4_ = auVar345._4_4_ * fVar314;
          auVar68._0_4_ = auVar345._0_4_ * fVar310;
          fVar200 = auVar32._8_4_;
          auVar68._8_4_ = auVar345._8_4_ * fVar200;
          fVar213 = auVar32._12_4_;
          auVar68._12_4_ = auVar345._12_4_ * fVar213;
          fVar221 = auVar32._16_4_;
          auVar68._16_4_ = auVar345._16_4_ * fVar221;
          fVar232 = auVar32._20_4_;
          auVar68._20_4_ = auVar345._20_4_ * fVar232;
          fVar235 = auVar32._24_4_;
          auVar68._24_4_ = auVar345._24_4_ * fVar235;
          auVar68._28_4_ = local_620._28_4_;
          auVar298 = vsubps_avx(auVar67,auVar68);
          auVar113._4_4_ = fVar152;
          auVar113._0_4_ = fVar132;
          auVar113._8_4_ = fStack_838;
          auVar113._12_4_ = fStack_834;
          auVar113._16_4_ = fStack_830;
          auVar113._20_4_ = fStack_82c;
          auVar113._24_4_ = fStack_828;
          auVar113._28_4_ = fStack_824;
          auVar150 = vmaxps_avx(auVar113,auVar274);
          auVar69._4_4_ = auVar150._4_4_ * auVar150._4_4_ * (fVar239 * fVar239 + fVar314 * fVar314);
          auVar69._0_4_ = auVar150._0_4_ * auVar150._0_4_ * (fVar237 * fVar237 + fVar310 * fVar310);
          auVar69._8_4_ = auVar150._8_4_ * auVar150._8_4_ * (fVar246 * fVar246 + fVar200 * fVar200);
          auVar69._12_4_ =
               auVar150._12_4_ * auVar150._12_4_ * (fVar295 * fVar295 + fVar213 * fVar213);
          auVar69._16_4_ =
               auVar150._16_4_ * auVar150._16_4_ * (fVar303 * fVar303 + fVar221 * fVar221);
          auVar69._20_4_ =
               auVar150._20_4_ * auVar150._20_4_ * (fVar219 * fVar219 + fVar232 * fVar232);
          auVar69._24_4_ =
               auVar150._24_4_ * auVar150._24_4_ * (fVar308 * fVar308 + fVar235 * fVar235);
          auVar69._28_4_ = local_680._28_4_ + local_620._28_4_;
          auVar70._4_4_ = auVar298._4_4_ * auVar298._4_4_;
          auVar70._0_4_ = auVar298._0_4_ * auVar298._0_4_;
          auVar70._8_4_ = auVar298._8_4_ * auVar298._8_4_;
          auVar70._12_4_ = auVar298._12_4_ * auVar298._12_4_;
          auVar70._16_4_ = auVar298._16_4_ * auVar298._16_4_;
          auVar70._20_4_ = auVar298._20_4_ * auVar298._20_4_;
          auVar70._24_4_ = auVar298._24_4_ * auVar298._24_4_;
          auVar70._28_4_ = auVar298._28_4_;
          auVar150 = vcmpps_avx(auVar70,auVar69,2);
          local_220 = (uint)lVar128;
          auVar188 = vpshufd_avx(ZEXT416(local_220),0);
          auVar164 = vpor_avx(auVar188,_DAT_01f7fcf0);
          auVar188 = vpor_avx(auVar188,_DAT_01fafea0);
          auVar116._4_4_ = fStack_35c;
          auVar116._0_4_ = local_360;
          auVar116._8_4_ = fStack_358;
          auVar116._12_4_ = fStack_354;
          auVar210 = ZEXT1664(auVar116);
          auVar164 = vpcmpgtd_avx(auVar116,auVar164);
          auVar188 = vpcmpgtd_avx(auVar116,auVar188);
          auVar245 = ZEXT1664(auVar188);
          local_320._16_16_ = auVar188;
          local_320._0_16_ = auVar164;
          auVar298 = local_320 & auVar150;
          if ((((((((auVar298 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar298 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar298 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar298 >> 0x7f,0) == '\0') &&
                (auVar298 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar298 >> 0xbf,0) == '\0') &&
              (auVar298 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar298[0x1f]) {
            auVar291 = ZEXT3264(auVar291._0_32_);
            fVar310 = (float)local_600._0_4_;
            fVar314 = (float)local_600._4_4_;
            fVar200 = fStack_5f8;
            fVar213 = fStack_5f4;
            fVar221 = fStack_5f0;
            fVar235 = fStack_5ec;
            fVar239 = fStack_5e8;
          }
          else {
            local_700._0_4_ = auVar122._0_4_;
            local_700._4_4_ = auVar122._4_4_;
            fStack_6f8 = auVar122._8_4_;
            fStack_6f4 = auVar122._12_4_;
            fStack_6f0 = auVar122._16_4_;
            fStack_6ec = auVar122._20_4_;
            fStack_6e8 = auVar122._24_4_;
            local_540 = fVar248 * (float)local_340._0_4_ +
                        fVar283 * (float)local_2e0._0_4_ +
                        (float)local_c0._0_4_ * (float)local_700._0_4_ +
                        (float)local_800._0_4_ * fVar199;
            fStack_53c = fVar250 * (float)local_340._4_4_ +
                         fVar216 * (float)local_2e0._4_4_ +
                         (float)local_c0._4_4_ * (float)local_700._4_4_ +
                         (float)local_800._4_4_ * fVar252;
            fStack_538 = fVar332 * fStack_338 +
                         fVar306 * fStack_2d8 + fStack_b8 * fStack_6f8 + fStack_7f8 * fVar264;
            fStack_534 = fVar179 * fStack_334 +
                         fVar284 * fStack_2d4 + fStack_b4 * fStack_6f4 + fStack_7f4 * fVar153;
            fStack_530 = fVar214 * fStack_330 +
                         fVar285 * fStack_2d0 + fStack_b0 * fStack_6f0 + fStack_7f0 * fVar154;
            fStack_52c = fVar305 * fStack_32c +
                         fVar218 * fStack_2cc + fStack_ac * fStack_6ec + fStack_7ec * fVar155;
            fStack_528 = fVar282 * fStack_328 +
                         fVar307 * fStack_2c8 + fStack_a8 * fStack_6e8 + fStack_7e8 * fVar156;
            fStack_524 = auVar32._28_4_ +
                         (float)((ulong)*(undefined8 *)(*pauVar10 + 0x18) >> 0x20) + auVar150._28_4_
                         + 0.0;
            local_640._0_4_ = auVar119._0_4_;
            local_640._4_4_ = auVar119._4_4_;
            fStack_638 = auVar119._8_4_;
            fStack_634 = auVar119._12_4_;
            fStack_630 = auVar119._16_4_;
            fStack_62c = auVar119._20_4_;
            fStack_628 = auVar119._24_4_;
            local_660._0_4_ = auVar118._0_4_;
            local_660._4_4_ = auVar118._4_4_;
            fStack_658 = auVar118._8_4_;
            fStack_654 = auVar118._12_4_;
            fStack_650 = auVar118._16_4_;
            fStack_64c = auVar118._20_4_;
            fStack_648 = auVar118._24_4_;
            pfVar2 = (float *)(lVar21 + 0x21b4e84 + lVar128 * 4);
            fVar310 = *pfVar2;
            fVar314 = pfVar2[1];
            fVar200 = pfVar2[2];
            fVar213 = pfVar2[3];
            fVar221 = pfVar2[4];
            fVar232 = pfVar2[5];
            fVar235 = pfVar2[6];
            pfVar3 = (float *)(lVar21 + 0x21b5308 + lVar128 * 4);
            fVar237 = *pfVar3;
            fVar239 = pfVar3[1];
            fVar246 = pfVar3[2];
            fVar248 = pfVar3[3];
            fVar250 = pfVar3[4];
            fVar332 = pfVar3[5];
            fVar179 = pfVar3[6];
            fVar265 = pfVar1[7] + 0.0;
            pfVar4 = (float *)(lVar21 + 0x21b4a00 + lVar128 * 4);
            fVar214 = *pfVar4;
            fVar305 = pfVar4[1];
            fVar282 = pfVar4[2];
            fVar283 = pfVar4[3];
            fVar216 = pfVar4[4];
            fVar306 = pfVar4[5];
            fVar284 = pfVar4[6];
            fVar157 = pfVar2[7] + pfVar3[7];
            fVar181 = pfVar3[7] + fVar265;
            fVar265 = pfVar1[7] + fStack_2e4 + fVar265;
            pfVar1 = (float *)(lVar21 + 0x21b457c + lVar128 * 4);
            fVar285 = *pfVar1;
            fVar218 = pfVar1[1];
            fVar307 = pfVar1[2];
            fVar295 = pfVar1[3];
            fVar303 = pfVar1[4];
            fVar219 = pfVar1[5];
            fVar308 = pfVar1[6];
            auVar144._0_4_ =
                 fVar285 * (float)local_4a0._0_4_ +
                 fVar214 * (float)local_6c0._0_4_ +
                 (float)local_6a0._0_4_ * fVar310 + (float)local_500._0_4_ * fVar237;
            auVar144._4_4_ =
                 fVar218 * (float)local_4a0._4_4_ +
                 fVar305 * (float)local_6c0._4_4_ +
                 (float)local_6a0._4_4_ * fVar314 + (float)local_500._4_4_ * fVar239;
            auVar144._8_4_ =
                 fVar307 * fStack_498 +
                 fVar282 * fStack_6b8 + fStack_698 * fVar200 + fStack_4f8 * fVar246;
            auVar144._12_4_ =
                 fVar295 * fStack_494 +
                 fVar283 * fStack_6b4 + fStack_694 * fVar213 + fStack_4f4 * fVar248;
            auVar144._16_4_ =
                 fVar303 * fStack_490 +
                 fVar216 * fStack_6b0 + fStack_690 * fVar221 + fStack_4f0 * fVar250;
            auVar144._20_4_ =
                 fVar219 * fStack_48c +
                 fVar306 * fStack_6ac + fStack_68c * fVar232 + fStack_4ec * fVar332;
            auVar144._24_4_ =
                 fVar308 * fStack_488 +
                 fVar284 * fStack_6a8 + fStack_688 * fVar235 + fStack_4e8 * fVar179;
            auVar144._28_4_ = fVar157 + fVar181;
            auVar171._0_4_ =
                 (float)local_300._0_4_ * fVar285 +
                 fVar182 * fVar310 + (float)local_600._0_4_ * fVar237 + fVar158 * fVar214;
            auVar171._4_4_ =
                 (float)local_300._4_4_ * fVar218 +
                 fVar193 * fVar314 + (float)local_600._4_4_ * fVar239 + fVar176 * fVar305;
            auVar171._8_4_ =
                 fStack_2f8 * fVar307 + fVar195 * fVar200 + fStack_5f8 * fVar246 + fVar177 * fVar282
            ;
            auVar171._12_4_ =
                 fStack_2f4 * fVar295 + fVar197 * fVar213 + fStack_5f4 * fVar248 + fVar178 * fVar283
            ;
            auVar171._16_4_ =
                 fStack_2f0 * fVar303 + fVar212 * fVar221 + fStack_5f0 * fVar250 + fVar253 * fVar216
            ;
            auVar171._20_4_ =
                 fStack_2ec * fVar219 + fVar217 * fVar232 + fStack_5ec * fVar332 + fVar194 * fVar306
            ;
            auVar171._24_4_ =
                 fStack_2e8 * fVar308 + fVar211 * fVar235 + fStack_5e8 * fVar179 + fVar196 * fVar284
            ;
            auVar171._28_4_ = fVar181 + fVar265;
            auVar327._0_4_ =
                 fVar214 * (float)local_2e0._0_4_ +
                 (float)local_c0._0_4_ * fVar310 + (float)local_800._0_4_ * fVar237 +
                 fVar285 * (float)local_340._0_4_;
            auVar327._4_4_ =
                 fVar305 * (float)local_2e0._4_4_ +
                 (float)local_c0._4_4_ * fVar314 + (float)local_800._4_4_ * fVar239 +
                 fVar218 * (float)local_340._4_4_;
            auVar327._8_4_ =
                 fVar282 * fStack_2d8 + fStack_b8 * fVar200 + fStack_7f8 * fVar246 +
                 fVar307 * fStack_338;
            auVar327._12_4_ =
                 fVar283 * fStack_2d4 + fStack_b4 * fVar213 + fStack_7f4 * fVar248 +
                 fVar295 * fStack_334;
            auVar327._16_4_ =
                 fVar216 * fStack_2d0 + fStack_b0 * fVar221 + fStack_7f0 * fVar250 +
                 fVar303 * fStack_330;
            auVar327._20_4_ =
                 fVar306 * fStack_2cc + fStack_ac * fVar232 + fStack_7ec * fVar332 +
                 fVar219 * fStack_32c;
            auVar327._24_4_ =
                 fVar284 * fStack_2c8 + fStack_a8 * fVar235 + fStack_7e8 * fVar179 +
                 fVar308 * fStack_328;
            auVar327._28_4_ = pfVar4[7] + fVar157 + fVar265;
            pfVar1 = (float *)(lVar21 + 0x21b72a4 + lVar128 * 4);
            fVar310 = *pfVar1;
            fVar314 = pfVar1[1];
            fVar200 = pfVar1[2];
            fVar213 = pfVar1[3];
            fVar221 = pfVar1[4];
            fVar232 = pfVar1[5];
            fVar235 = pfVar1[6];
            pfVar2 = (float *)(lVar21 + 0x21b7728 + lVar128 * 4);
            fVar237 = *pfVar2;
            fVar239 = pfVar2[1];
            fVar246 = pfVar2[2];
            fVar248 = pfVar2[3];
            fVar250 = pfVar2[4];
            fVar332 = pfVar2[5];
            fVar179 = pfVar2[6];
            pfVar3 = (float *)(lVar21 + 0x21b6e20 + lVar128 * 4);
            fVar214 = *pfVar3;
            fVar305 = pfVar3[1];
            fVar282 = pfVar3[2];
            fVar283 = pfVar3[3];
            fVar216 = pfVar3[4];
            fVar306 = pfVar3[5];
            fVar284 = pfVar3[6];
            pfVar4 = (float *)(lVar21 + 0x21b699c + lVar128 * 4);
            fVar285 = *pfVar4;
            fVar218 = pfVar4[1];
            fVar307 = pfVar4[2];
            fVar295 = pfVar4[3];
            fVar303 = pfVar4[4];
            fVar219 = pfVar4[5];
            fVar308 = pfVar4[6];
            auVar289._0_4_ =
                 fVar285 * (float)local_4a0._0_4_ +
                 fVar214 * (float)local_6c0._0_4_ +
                 (float)local_6a0._0_4_ * fVar310 + (float)local_500._0_4_ * fVar237;
            auVar289._4_4_ =
                 fVar218 * (float)local_4a0._4_4_ +
                 fVar305 * (float)local_6c0._4_4_ +
                 (float)local_6a0._4_4_ * fVar314 + (float)local_500._4_4_ * fVar239;
            auVar289._8_4_ =
                 fVar307 * fStack_498 +
                 fVar282 * fStack_6b8 + fStack_698 * fVar200 + fStack_4f8 * fVar246;
            auVar289._12_4_ =
                 fVar295 * fStack_494 +
                 fVar283 * fStack_6b4 + fStack_694 * fVar213 + fStack_4f4 * fVar248;
            auVar289._16_4_ =
                 fVar303 * fStack_490 +
                 fVar216 * fStack_6b0 + fStack_690 * fVar221 + fStack_4f0 * fVar250;
            auVar289._20_4_ =
                 fVar219 * fStack_48c +
                 fVar306 * fStack_6ac + fStack_68c * fVar232 + fStack_4ec * fVar332;
            auVar289._24_4_ =
                 fVar308 * fStack_488 +
                 fVar284 * fStack_6a8 + fStack_688 * fVar235 + fStack_4e8 * fVar179;
            auVar289._28_4_ = fStack_2e4 + fStack_2e4 + fStack_4e4 + fStack_2e4;
            auVar323._0_4_ =
                 fVar285 * (float)local_300._0_4_ +
                 fVar158 * fVar214 + fVar182 * fVar310 + fVar237 * (float)local_600._0_4_;
            auVar323._4_4_ =
                 fVar218 * (float)local_300._4_4_ +
                 fVar176 * fVar305 + fVar193 * fVar314 + fVar239 * (float)local_600._4_4_;
            auVar323._8_4_ =
                 fVar307 * fStack_2f8 + fVar177 * fVar282 + fVar195 * fVar200 + fVar246 * fStack_5f8
            ;
            auVar323._12_4_ =
                 fVar295 * fStack_2f4 + fVar178 * fVar283 + fVar197 * fVar213 + fVar248 * fStack_5f4
            ;
            auVar323._16_4_ =
                 fVar303 * fStack_2f0 + fVar253 * fVar216 + fVar212 * fVar221 + fVar250 * fStack_5f0
            ;
            auVar323._20_4_ =
                 fVar219 * fStack_2ec + fVar194 * fVar306 + fVar217 * fVar232 + fVar332 * fStack_5ec
            ;
            auVar323._24_4_ =
                 fVar308 * fStack_2e8 + fVar196 * fVar284 + fVar211 * fVar235 + fVar179 * fStack_5e8
            ;
            auVar323._28_4_ = fStack_2e4 + fStack_2e4 + fVar215 + fStack_2e4;
            auVar244._8_4_ = 0x7fffffff;
            auVar244._0_8_ = 0x7fffffff7fffffff;
            auVar244._12_4_ = 0x7fffffff;
            auVar244._16_4_ = 0x7fffffff;
            auVar244._20_4_ = 0x7fffffff;
            auVar244._24_4_ = 0x7fffffff;
            auVar244._28_4_ = 0x7fffffff;
            auVar298 = vandps_avx(auVar144,auVar244);
            auVar143 = vandps_avx(auVar171,auVar244);
            auVar143 = vmaxps_avx(auVar298,auVar143);
            auVar298 = vandps_avx(auVar327,auVar244);
            auVar143 = vmaxps_avx(auVar143,auVar298);
            auVar143 = vcmpps_avx(auVar143,local_380,1);
            auVar22 = vblendvps_avx(auVar144,auVar209,auVar143);
            auVar145._0_4_ =
                 fVar285 * (float)local_340._0_4_ +
                 fVar214 * (float)local_2e0._0_4_ +
                 fVar237 * (float)local_800._0_4_ + (float)local_c0._0_4_ * fVar310;
            auVar145._4_4_ =
                 fVar218 * (float)local_340._4_4_ +
                 fVar305 * (float)local_2e0._4_4_ +
                 fVar239 * (float)local_800._4_4_ + (float)local_c0._4_4_ * fVar314;
            auVar145._8_4_ =
                 fVar307 * fStack_338 +
                 fVar282 * fStack_2d8 + fVar246 * fStack_7f8 + fStack_b8 * fVar200;
            auVar145._12_4_ =
                 fVar295 * fStack_334 +
                 fVar283 * fStack_2d4 + fVar248 * fStack_7f4 + fStack_b4 * fVar213;
            auVar145._16_4_ =
                 fVar303 * fStack_330 +
                 fVar216 * fStack_2d0 + fVar250 * fStack_7f0 + fStack_b0 * fVar221;
            auVar145._20_4_ =
                 fVar219 * fStack_32c +
                 fVar306 * fStack_2cc + fVar332 * fStack_7ec + fStack_ac * fVar232;
            auVar145._24_4_ =
                 fVar308 * fStack_328 +
                 fVar284 * fStack_2c8 + fVar179 * fStack_7e8 + fStack_a8 * fVar235;
            auVar145._28_4_ = auVar298._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar138 = vblendvps_avx(auVar171,auVar32,auVar143);
            auVar298 = vandps_avx(auVar289,auVar244);
            auVar143 = vandps_avx(auVar323,auVar244);
            auVar205 = vmaxps_avx(auVar298,auVar143);
            auVar298 = vandps_avx(auVar145,auVar244);
            auVar298 = vmaxps_avx(auVar205,auVar298);
            local_6e0._0_4_ = auVar120._0_4_;
            local_6e0._4_4_ = auVar120._4_4_;
            fStack_6d8 = auVar120._8_4_;
            fStack_6d4 = auVar120._12_4_;
            auStack_6d0._0_4_ = auVar120._16_4_;
            auStack_6d0._4_4_ = auVar120._20_4_;
            fStack_6c8 = auVar120._24_4_;
            auVar143 = vcmpps_avx(auVar298,local_380,1);
            auVar298 = vblendvps_avx(auVar289,auVar209,auVar143);
            auVar146._0_4_ =
                 (float)local_340._0_4_ * (float)local_6e0._0_4_ +
                 (float)local_2e0._0_4_ * (float)local_640._0_4_ +
                 (float)local_c0._0_4_ * local_520 + (float)local_800._0_4_ * (float)local_660._0_4_
            ;
            auVar146._4_4_ =
                 (float)local_340._4_4_ * (float)local_6e0._4_4_ +
                 (float)local_2e0._4_4_ * (float)local_640._4_4_ +
                 (float)local_c0._4_4_ * fStack_51c +
                 (float)local_800._4_4_ * (float)local_660._4_4_;
            auVar146._8_4_ =
                 fStack_338 * fStack_6d8 +
                 fStack_2d8 * fStack_638 + fStack_b8 * fStack_518 + fStack_7f8 * fStack_658;
            auVar146._12_4_ =
                 fStack_334 * fStack_6d4 +
                 fStack_2d4 * fStack_634 + fStack_b4 * fStack_514 + fStack_7f4 * fStack_654;
            auVar146._16_4_ =
                 fStack_330 * (float)auStack_6d0._0_4_ +
                 fStack_2d0 * fStack_630 + fStack_b0 * fStack_510 + fStack_7f0 * fStack_650;
            auVar146._20_4_ =
                 fStack_32c * (float)auStack_6d0._4_4_ +
                 fStack_2cc * fStack_62c + fStack_ac * fStack_50c + fStack_7ec * fStack_64c;
            auVar146._24_4_ =
                 fStack_328 * fStack_6c8 +
                 fStack_2c8 * fStack_628 + fStack_a8 * fStack_508 + fStack_7e8 * fStack_648;
            auVar146._28_4_ = auVar205._28_4_ + fStack_524 + auVar150._28_4_ + 0.0;
            auVar143 = vblendvps_avx(auVar323,auVar32,auVar143);
            fVar199 = auVar22._0_4_;
            fVar252 = auVar22._4_4_;
            fVar264 = auVar22._8_4_;
            fVar153 = auVar22._12_4_;
            fVar154 = auVar22._16_4_;
            fVar155 = auVar22._20_4_;
            fVar156 = auVar22._24_4_;
            fVar182 = auVar22._28_4_;
            fVar248 = auVar298._0_4_;
            fVar332 = auVar298._4_4_;
            fVar214 = auVar298._8_4_;
            fVar282 = auVar298._12_4_;
            fVar216 = auVar298._16_4_;
            fVar284 = auVar298._20_4_;
            fVar218 = auVar298._24_4_;
            fVar310 = auVar138._0_4_;
            fVar314 = auVar138._4_4_;
            fVar200 = auVar138._8_4_;
            fVar213 = auVar138._12_4_;
            fVar221 = auVar138._16_4_;
            fVar235 = auVar138._20_4_;
            fVar239 = auVar138._24_4_;
            auVar299._0_4_ = fVar310 * fVar310 + fVar199 * fVar199;
            auVar299._4_4_ = fVar314 * fVar314 + fVar252 * fVar252;
            auVar299._8_4_ = fVar200 * fVar200 + fVar264 * fVar264;
            auVar299._12_4_ = fVar213 * fVar213 + fVar153 * fVar153;
            auVar299._16_4_ = fVar221 * fVar221 + fVar154 * fVar154;
            auVar299._20_4_ = fVar235 * fVar235 + fVar155 * fVar155;
            auVar299._24_4_ = fVar239 * fVar239 + fVar156 * fVar156;
            auVar299._28_4_ = auVar209._28_4_ + fStack_684;
            auVar209 = vrsqrtps_avx(auVar299);
            fVar212 = auVar209._0_4_;
            fVar217 = auVar209._4_4_;
            auVar71._4_4_ = fVar217 * 1.5;
            auVar71._0_4_ = fVar212 * 1.5;
            fVar211 = auVar209._8_4_;
            auVar71._8_4_ = fVar211 * 1.5;
            fVar215 = auVar209._12_4_;
            auVar71._12_4_ = fVar215 * 1.5;
            fVar232 = auVar209._16_4_;
            auVar71._16_4_ = fVar232 * 1.5;
            fVar237 = auVar209._20_4_;
            auVar71._20_4_ = fVar237 * 1.5;
            fVar246 = auVar209._24_4_;
            auVar71._24_4_ = fVar246 * 1.5;
            auVar71._28_4_ = auVar323._28_4_;
            auVar72._4_4_ = fVar217 * fVar217 * fVar217 * auVar299._4_4_ * 0.5;
            auVar72._0_4_ = fVar212 * fVar212 * fVar212 * auVar299._0_4_ * 0.5;
            auVar72._8_4_ = fVar211 * fVar211 * fVar211 * auVar299._8_4_ * 0.5;
            auVar72._12_4_ = fVar215 * fVar215 * fVar215 * auVar299._12_4_ * 0.5;
            auVar72._16_4_ = fVar232 * fVar232 * fVar232 * auVar299._16_4_ * 0.5;
            auVar72._20_4_ = fVar237 * fVar237 * fVar237 * auVar299._20_4_ * 0.5;
            auVar72._24_4_ = fVar246 * fVar246 * fVar246 * auVar299._24_4_ * 0.5;
            auVar72._28_4_ = auVar299._28_4_;
            auVar22 = vsubps_avx(auVar71,auVar72);
            fVar295 = auVar22._0_4_;
            fVar303 = auVar22._4_4_;
            fVar219 = auVar22._8_4_;
            fVar308 = auVar22._12_4_;
            fVar157 = auVar22._16_4_;
            fVar181 = auVar22._20_4_;
            fVar265 = auVar22._24_4_;
            fVar212 = auVar143._0_4_;
            fVar217 = auVar143._4_4_;
            fVar211 = auVar143._8_4_;
            fVar215 = auVar143._12_4_;
            fVar232 = auVar143._16_4_;
            fVar237 = auVar143._20_4_;
            fVar246 = auVar143._24_4_;
            auVar279._0_4_ = fVar212 * fVar212 + fVar248 * fVar248;
            auVar279._4_4_ = fVar217 * fVar217 + fVar332 * fVar332;
            auVar279._8_4_ = fVar211 * fVar211 + fVar214 * fVar214;
            auVar279._12_4_ = fVar215 * fVar215 + fVar282 * fVar282;
            auVar279._16_4_ = fVar232 * fVar232 + fVar216 * fVar216;
            auVar279._20_4_ = fVar237 * fVar237 + fVar284 * fVar284;
            auVar279._24_4_ = fVar246 * fVar246 + fVar218 * fVar218;
            auVar279._28_4_ = auVar209._28_4_ + auVar298._28_4_;
            auVar209 = vrsqrtps_avx(auVar279);
            fVar250 = auVar209._0_4_;
            fVar179 = auVar209._4_4_;
            auVar73._4_4_ = fVar179 * 1.5;
            auVar73._0_4_ = fVar250 * 1.5;
            fVar305 = auVar209._8_4_;
            auVar73._8_4_ = fVar305 * 1.5;
            fVar283 = auVar209._12_4_;
            auVar73._12_4_ = fVar283 * 1.5;
            fVar306 = auVar209._16_4_;
            auVar73._16_4_ = fVar306 * 1.5;
            fVar285 = auVar209._20_4_;
            auVar73._20_4_ = fVar285 * 1.5;
            fVar307 = auVar209._24_4_;
            auVar73._24_4_ = fVar307 * 1.5;
            auVar73._28_4_ = auVar323._28_4_;
            auVar74._4_4_ = fVar179 * fVar179 * fVar179 * auVar279._4_4_ * 0.5;
            auVar74._0_4_ = fVar250 * fVar250 * fVar250 * auVar279._0_4_ * 0.5;
            auVar74._8_4_ = fVar305 * fVar305 * fVar305 * auVar279._8_4_ * 0.5;
            auVar74._12_4_ = fVar283 * fVar283 * fVar283 * auVar279._12_4_ * 0.5;
            auVar74._16_4_ = fVar306 * fVar306 * fVar306 * auVar279._16_4_ * 0.5;
            auVar74._20_4_ = fVar285 * fVar285 * fVar285 * auVar279._20_4_ * 0.5;
            auVar74._24_4_ = fVar307 * fVar307 * fVar307 * auVar279._24_4_ * 0.5;
            auVar74._28_4_ = auVar279._28_4_;
            auVar298 = vsubps_avx(auVar73,auVar74);
            fVar250 = auVar298._0_4_;
            fVar179 = auVar298._4_4_;
            fVar305 = auVar298._8_4_;
            fVar283 = auVar298._12_4_;
            fVar306 = auVar298._16_4_;
            fVar285 = auVar298._20_4_;
            fVar307 = auVar298._24_4_;
            fVar310 = fVar132 * fVar295 * fVar310;
            fVar314 = fVar152 * fVar303 * fVar314;
            auVar75._4_4_ = fVar314;
            auVar75._0_4_ = fVar310;
            fVar200 = fStack_838 * fVar219 * fVar200;
            auVar75._8_4_ = fVar200;
            fVar213 = fStack_834 * fVar308 * fVar213;
            auVar75._12_4_ = fVar213;
            fVar221 = fStack_830 * fVar157 * fVar221;
            auVar75._16_4_ = fVar221;
            fVar235 = fStack_82c * fVar181 * fVar235;
            auVar75._20_4_ = fVar235;
            fVar239 = fStack_828 * fVar265 * fVar239;
            auVar75._24_4_ = fVar239;
            auVar75._28_4_ = auVar209._28_4_;
            local_6e0._4_4_ = fVar314 + auVar345._4_4_;
            local_6e0._0_4_ = fVar310 + auVar345._0_4_;
            fStack_6d8 = fVar200 + auVar345._8_4_;
            fStack_6d4 = fVar213 + auVar345._12_4_;
            auStack_6d0._0_4_ = fVar221 + auVar345._16_4_;
            auStack_6d0._4_4_ = fVar235 + auVar345._20_4_;
            fStack_6c8 = fVar239 + auVar345._24_4_;
            fStack_6c4 = auVar209._28_4_ + auVar345._28_4_;
            fVar310 = fVar132 * fVar295 * -fVar199;
            fVar314 = fVar152 * fVar303 * -fVar252;
            auVar76._4_4_ = fVar314;
            auVar76._0_4_ = fVar310;
            fVar200 = fStack_838 * fVar219 * -fVar264;
            auVar76._8_4_ = fVar200;
            fVar213 = fStack_834 * fVar308 * -fVar153;
            auVar76._12_4_ = fVar213;
            fVar221 = fStack_830 * fVar157 * -fVar154;
            auVar76._16_4_ = fVar221;
            fVar235 = fStack_82c * fVar181 * -fVar155;
            auVar76._20_4_ = fVar235;
            fVar239 = fStack_828 * fVar265 * -fVar156;
            auVar76._24_4_ = fVar239;
            auVar76._28_4_ = -fVar182;
            local_640._4_4_ = local_720._4_4_ + fVar314;
            local_640._0_4_ = local_720._0_4_ + fVar310;
            fStack_638 = local_720._8_4_ + fVar200;
            fStack_634 = local_720._12_4_ + fVar213;
            fStack_630 = local_720._16_4_ + fVar221;
            fStack_62c = local_720._20_4_ + fVar235;
            fStack_628 = local_720._24_4_ + fVar239;
            fStack_624 = local_720._28_4_ + -fVar182;
            fVar310 = fVar295 * 0.0 * fVar132;
            fVar314 = fVar303 * 0.0 * fVar152;
            auVar77._4_4_ = fVar314;
            auVar77._0_4_ = fVar310;
            fVar200 = fVar219 * 0.0 * fStack_838;
            auVar77._8_4_ = fVar200;
            fVar213 = fVar308 * 0.0 * fStack_834;
            auVar77._12_4_ = fVar213;
            fVar221 = fVar157 * 0.0 * fStack_830;
            auVar77._16_4_ = fVar221;
            fVar235 = fVar181 * 0.0 * fStack_82c;
            auVar77._20_4_ = fVar235;
            fVar239 = fVar265 * 0.0 * fStack_828;
            auVar77._24_4_ = fVar239;
            auVar77._28_4_ = fVar182;
            auVar272 = vsubps_avx(auVar345,auVar75);
            auVar346._0_4_ = fVar310 + auVar146._0_4_;
            auVar346._4_4_ = fVar314 + auVar146._4_4_;
            auVar346._8_4_ = fVar200 + auVar146._8_4_;
            auVar346._12_4_ = fVar213 + auVar146._12_4_;
            auVar346._16_4_ = fVar221 + auVar146._16_4_;
            auVar346._20_4_ = fVar235 + auVar146._20_4_;
            auVar346._24_4_ = fVar239 + auVar146._24_4_;
            auVar346._28_4_ = fVar182 + auVar146._28_4_;
            fVar310 = auVar274._0_4_ * fVar250 * fVar212;
            fVar212 = auVar274._4_4_ * fVar179 * fVar217;
            auVar78._4_4_ = fVar212;
            auVar78._0_4_ = fVar310;
            fVar314 = auVar274._8_4_ * fVar305 * fVar211;
            auVar78._8_4_ = fVar314;
            fVar217 = auVar274._12_4_ * fVar283 * fVar215;
            auVar78._12_4_ = fVar217;
            fVar200 = auVar274._16_4_ * fVar306 * fVar232;
            auVar78._16_4_ = fVar200;
            fVar211 = auVar274._20_4_ * fVar285 * fVar237;
            auVar78._20_4_ = fVar211;
            fVar213 = auVar274._24_4_ * fVar307 * fVar246;
            auVar78._24_4_ = fVar213;
            auVar78._28_4_ = fStack_824;
            auVar35 = vsubps_avx(local_720,auVar76);
            auVar328._0_4_ = local_680._0_4_ + fVar310;
            auVar328._4_4_ = local_680._4_4_ + fVar212;
            auVar328._8_4_ = local_680._8_4_ + fVar314;
            auVar328._12_4_ = local_680._12_4_ + fVar217;
            auVar328._16_4_ = local_680._16_4_ + fVar200;
            auVar328._20_4_ = local_680._20_4_ + fVar211;
            auVar328._24_4_ = local_680._24_4_ + fVar213;
            auVar328._28_4_ = local_680._28_4_ + fStack_824;
            fVar310 = fVar250 * -fVar248 * auVar274._0_4_;
            fVar212 = fVar179 * -fVar332 * auVar274._4_4_;
            auVar79._4_4_ = fVar212;
            auVar79._0_4_ = fVar310;
            fVar314 = fVar305 * -fVar214 * auVar274._8_4_;
            auVar79._8_4_ = fVar314;
            fVar217 = fVar283 * -fVar282 * auVar274._12_4_;
            auVar79._12_4_ = fVar217;
            fVar200 = fVar306 * -fVar216 * auVar274._16_4_;
            auVar79._16_4_ = fVar200;
            fVar211 = fVar285 * -fVar284 * auVar274._20_4_;
            auVar79._20_4_ = fVar211;
            fVar213 = fVar307 * -fVar218 * auVar274._24_4_;
            auVar79._24_4_ = fVar213;
            auVar79._28_4_ = auVar345._28_4_;
            auVar36 = vsubps_avx(auVar146,auVar77);
            auVar231._0_4_ = local_620._0_4_ + fVar310;
            auVar231._4_4_ = local_620._4_4_ + fVar212;
            auVar231._8_4_ = local_620._8_4_ + fVar314;
            auVar231._12_4_ = local_620._12_4_ + fVar217;
            auVar231._16_4_ = local_620._16_4_ + fVar200;
            auVar231._20_4_ = local_620._20_4_ + fVar211;
            auVar231._24_4_ = local_620._24_4_ + fVar213;
            auVar231._28_4_ = local_620._28_4_ + auVar345._28_4_;
            fVar310 = fVar250 * 0.0 * auVar274._0_4_;
            fVar212 = fVar179 * 0.0 * auVar274._4_4_;
            auVar80._4_4_ = fVar212;
            auVar80._0_4_ = fVar310;
            fVar314 = fVar305 * 0.0 * auVar274._8_4_;
            auVar80._8_4_ = fVar314;
            fVar217 = fVar283 * 0.0 * auVar274._12_4_;
            auVar80._12_4_ = fVar217;
            fVar200 = fVar306 * 0.0 * auVar274._16_4_;
            auVar80._16_4_ = fVar200;
            fVar211 = fVar285 * 0.0 * auVar274._20_4_;
            auVar80._20_4_ = fVar211;
            fVar213 = fVar307 * 0.0 * auVar274._24_4_;
            auVar80._24_4_ = fVar213;
            auVar80._28_4_ = auVar146._28_4_;
            auVar209 = vsubps_avx(local_680,auVar78);
            auVar114._4_4_ = fStack_53c;
            auVar114._0_4_ = local_540;
            auVar114._8_4_ = fStack_538;
            auVar114._12_4_ = fStack_534;
            auVar114._16_4_ = fStack_530;
            auVar114._20_4_ = fStack_52c;
            auVar114._24_4_ = fStack_528;
            auVar114._28_4_ = fStack_524;
            auVar290._0_4_ = local_540 + fVar310;
            auVar290._4_4_ = fStack_53c + fVar212;
            auVar290._8_4_ = fStack_538 + fVar314;
            auVar290._12_4_ = fStack_534 + fVar217;
            auVar290._16_4_ = fStack_530 + fVar200;
            auVar290._20_4_ = fStack_52c + fVar211;
            auVar290._24_4_ = fStack_528 + fVar213;
            auVar290._28_4_ = fStack_524 + auVar146._28_4_;
            auVar143 = vsubps_avx(local_620,auVar79);
            auVar22 = vsubps_avx(auVar114,auVar80);
            auVar138 = vsubps_avx(auVar231,auVar35);
            auVar205 = vsubps_avx(auVar290,auVar36);
            auVar81._4_4_ = auVar36._4_4_ * auVar138._4_4_;
            auVar81._0_4_ = auVar36._0_4_ * auVar138._0_4_;
            auVar81._8_4_ = auVar36._8_4_ * auVar138._8_4_;
            auVar81._12_4_ = auVar36._12_4_ * auVar138._12_4_;
            auVar81._16_4_ = auVar36._16_4_ * auVar138._16_4_;
            auVar81._20_4_ = auVar36._20_4_ * auVar138._20_4_;
            auVar81._24_4_ = auVar36._24_4_ * auVar138._24_4_;
            auVar81._28_4_ = auVar323._28_4_;
            auVar82._4_4_ = auVar35._4_4_ * auVar205._4_4_;
            auVar82._0_4_ = auVar35._0_4_ * auVar205._0_4_;
            auVar82._8_4_ = auVar35._8_4_ * auVar205._8_4_;
            auVar82._12_4_ = auVar35._12_4_ * auVar205._12_4_;
            auVar82._16_4_ = auVar35._16_4_ * auVar205._16_4_;
            auVar82._20_4_ = auVar35._20_4_ * auVar205._20_4_;
            auVar82._24_4_ = auVar35._24_4_ * auVar205._24_4_;
            auVar82._28_4_ = fStack_524;
            auVar287 = vsubps_avx(auVar82,auVar81);
            auVar83._4_4_ = auVar272._4_4_ * auVar205._4_4_;
            auVar83._0_4_ = auVar272._0_4_ * auVar205._0_4_;
            auVar83._8_4_ = auVar272._8_4_ * auVar205._8_4_;
            auVar83._12_4_ = auVar272._12_4_ * auVar205._12_4_;
            auVar83._16_4_ = auVar272._16_4_ * auVar205._16_4_;
            auVar83._20_4_ = auVar272._20_4_ * auVar205._20_4_;
            auVar83._24_4_ = auVar272._24_4_ * auVar205._24_4_;
            auVar83._28_4_ = auVar205._28_4_;
            auVar205 = vsubps_avx(auVar328,auVar272);
            auVar84._4_4_ = auVar36._4_4_ * auVar205._4_4_;
            auVar84._0_4_ = auVar36._0_4_ * auVar205._0_4_;
            auVar84._8_4_ = auVar36._8_4_ * auVar205._8_4_;
            auVar84._12_4_ = auVar36._12_4_ * auVar205._12_4_;
            auVar84._16_4_ = auVar36._16_4_ * auVar205._16_4_;
            auVar84._20_4_ = auVar36._20_4_ * auVar205._20_4_;
            auVar84._24_4_ = auVar36._24_4_ * auVar205._24_4_;
            auVar84._28_4_ = auVar298._28_4_;
            auVar320 = vsubps_avx(auVar84,auVar83);
            auVar85._4_4_ = auVar35._4_4_ * auVar205._4_4_;
            auVar85._0_4_ = auVar35._0_4_ * auVar205._0_4_;
            auVar85._8_4_ = auVar35._8_4_ * auVar205._8_4_;
            auVar85._12_4_ = auVar35._12_4_ * auVar205._12_4_;
            auVar85._16_4_ = auVar35._16_4_ * auVar205._16_4_;
            auVar85._20_4_ = auVar35._20_4_ * auVar205._20_4_;
            auVar85._24_4_ = auVar35._24_4_ * auVar205._24_4_;
            auVar85._28_4_ = auVar298._28_4_;
            auVar86._4_4_ = auVar272._4_4_ * auVar138._4_4_;
            auVar86._0_4_ = auVar272._0_4_ * auVar138._0_4_;
            auVar86._8_4_ = auVar272._8_4_ * auVar138._8_4_;
            auVar86._12_4_ = auVar272._12_4_ * auVar138._12_4_;
            auVar86._16_4_ = auVar272._16_4_ * auVar138._16_4_;
            auVar86._20_4_ = auVar272._20_4_ * auVar138._20_4_;
            auVar86._24_4_ = auVar272._24_4_ * auVar138._24_4_;
            auVar86._28_4_ = auVar138._28_4_;
            auVar298 = vsubps_avx(auVar86,auVar85);
            auVar172._0_4_ = auVar287._0_4_ * 0.0 + auVar298._0_4_ + auVar320._0_4_ * 0.0;
            auVar172._4_4_ = auVar287._4_4_ * 0.0 + auVar298._4_4_ + auVar320._4_4_ * 0.0;
            auVar172._8_4_ = auVar287._8_4_ * 0.0 + auVar298._8_4_ + auVar320._8_4_ * 0.0;
            auVar172._12_4_ = auVar287._12_4_ * 0.0 + auVar298._12_4_ + auVar320._12_4_ * 0.0;
            auVar172._16_4_ = auVar287._16_4_ * 0.0 + auVar298._16_4_ + auVar320._16_4_ * 0.0;
            auVar172._20_4_ = auVar287._20_4_ * 0.0 + auVar298._20_4_ + auVar320._20_4_ * 0.0;
            auVar172._24_4_ = auVar287._24_4_ * 0.0 + auVar298._24_4_ + auVar320._24_4_ * 0.0;
            auVar172._28_4_ = auVar287._28_4_ + auVar298._28_4_ + auVar320._28_4_;
            auVar23 = vcmpps_avx(auVar172,ZEXT832(0) << 0x20,2);
            auVar209 = vblendvps_avx(auVar209,_local_6e0,auVar23);
            auVar298 = vblendvps_avx(auVar143,_local_640,auVar23);
            auVar143 = vblendvps_avx(auVar22,auVar346,auVar23);
            auVar22 = vblendvps_avx(auVar272,auVar328,auVar23);
            auVar138 = vblendvps_avx(auVar35,auVar231,auVar23);
            auVar205 = vblendvps_avx(auVar36,auVar290,auVar23);
            auVar272 = vblendvps_avx(auVar328,auVar272,auVar23);
            auVar287 = vblendvps_avx(auVar231,auVar35,auVar23);
            auVar320 = vblendvps_avx(auVar290,auVar36,auVar23);
            local_720 = vandps_avx(local_320,auVar150);
            auVar272 = vsubps_avx(auVar272,auVar209);
            auVar37 = vsubps_avx(auVar287,auVar298);
            auVar245 = ZEXT3264(auVar37);
            auVar320 = vsubps_avx(auVar320,auVar143);
            auVar38 = vsubps_avx(auVar298,auVar138);
            fVar310 = auVar37._0_4_;
            fVar238 = auVar143._0_4_;
            fVar215 = auVar37._4_4_;
            fVar131 = auVar143._4_4_;
            auVar87._4_4_ = fVar131 * fVar215;
            auVar87._0_4_ = fVar238 * fVar310;
            fVar248 = auVar37._8_4_;
            fVar220 = auVar143._8_4_;
            auVar87._8_4_ = fVar220 * fVar248;
            fVar283 = auVar37._12_4_;
            fVar158 = auVar143._12_4_;
            auVar87._12_4_ = fVar158 * fVar283;
            fVar295 = auVar37._16_4_;
            fVar176 = auVar143._16_4_;
            auVar87._16_4_ = fVar176 * fVar295;
            fVar199 = auVar37._20_4_;
            fVar177 = auVar143._20_4_;
            auVar87._20_4_ = fVar177 * fVar199;
            fVar182 = auVar37._24_4_;
            fVar178 = auVar143._24_4_;
            auVar87._24_4_ = fVar178 * fVar182;
            auVar87._28_4_ = auVar287._28_4_;
            fVar212 = auVar298._0_4_;
            fVar253 = auVar320._0_4_;
            fVar221 = auVar298._4_4_;
            fVar194 = auVar320._4_4_;
            auVar88._4_4_ = fVar194 * fVar221;
            auVar88._0_4_ = fVar253 * fVar212;
            fVar250 = auVar298._8_4_;
            fVar196 = auVar320._8_4_;
            auVar88._8_4_ = fVar196 * fVar250;
            fVar216 = auVar298._12_4_;
            fVar198 = auVar320._12_4_;
            auVar88._12_4_ = fVar198 * fVar216;
            fVar303 = auVar298._16_4_;
            fVar240 = auVar320._16_4_;
            auVar88._16_4_ = fVar240 * fVar303;
            fVar252 = auVar298._20_4_;
            fVar247 = auVar320._20_4_;
            auVar88._20_4_ = fVar247 * fVar252;
            fVar193 = auVar298._24_4_;
            fVar249 = auVar320._24_4_;
            uVar12 = auVar35._28_4_;
            auVar88._24_4_ = fVar249 * fVar193;
            auVar88._28_4_ = uVar12;
            auVar287 = vsubps_avx(auVar88,auVar87);
            fVar314 = auVar209._0_4_;
            fVar232 = auVar209._4_4_;
            auVar89._4_4_ = fVar194 * fVar232;
            auVar89._0_4_ = fVar253 * fVar314;
            fVar332 = auVar209._8_4_;
            auVar89._8_4_ = fVar196 * fVar332;
            fVar306 = auVar209._12_4_;
            auVar89._12_4_ = fVar198 * fVar306;
            fVar219 = auVar209._16_4_;
            auVar89._16_4_ = fVar240 * fVar219;
            fVar264 = auVar209._20_4_;
            auVar89._20_4_ = fVar247 * fVar264;
            fVar195 = auVar209._24_4_;
            auVar89._24_4_ = fVar249 * fVar195;
            auVar89._28_4_ = uVar12;
            fVar217 = auVar272._0_4_;
            fVar235 = auVar272._4_4_;
            auVar90._4_4_ = fVar131 * fVar235;
            auVar90._0_4_ = fVar238 * fVar217;
            fVar179 = auVar272._8_4_;
            auVar90._8_4_ = fVar220 * fVar179;
            fVar284 = auVar272._12_4_;
            auVar90._12_4_ = fVar158 * fVar284;
            fVar308 = auVar272._16_4_;
            auVar90._16_4_ = fVar176 * fVar308;
            fVar153 = auVar272._20_4_;
            auVar90._20_4_ = fVar177 * fVar153;
            fVar197 = auVar272._24_4_;
            auVar90._24_4_ = fVar178 * fVar197;
            auVar90._28_4_ = auVar328._28_4_;
            auVar35 = vsubps_avx(auVar90,auVar89);
            auVar91._4_4_ = fVar221 * fVar235;
            auVar91._0_4_ = fVar212 * fVar217;
            auVar91._8_4_ = fVar250 * fVar179;
            auVar91._12_4_ = fVar216 * fVar284;
            auVar91._16_4_ = fVar303 * fVar308;
            auVar91._20_4_ = fVar252 * fVar153;
            auVar91._24_4_ = fVar193 * fVar197;
            auVar91._28_4_ = uVar12;
            auVar92._4_4_ = fVar232 * fVar215;
            auVar92._0_4_ = fVar314 * fVar310;
            auVar92._8_4_ = fVar332 * fVar248;
            auVar92._12_4_ = fVar306 * fVar283;
            auVar92._16_4_ = fVar219 * fVar295;
            auVar92._20_4_ = fVar264 * fVar199;
            auVar92._24_4_ = fVar195 * fVar182;
            auVar92._28_4_ = auVar36._28_4_;
            auVar36 = vsubps_avx(auVar92,auVar91);
            auVar143 = vsubps_avx(auVar143,auVar205);
            fVar211 = auVar36._28_4_ + auVar35._28_4_;
            auVar300._0_4_ = auVar36._0_4_ + auVar35._0_4_ * 0.0 + auVar287._0_4_ * 0.0;
            auVar300._4_4_ = auVar36._4_4_ + auVar35._4_4_ * 0.0 + auVar287._4_4_ * 0.0;
            auVar300._8_4_ = auVar36._8_4_ + auVar35._8_4_ * 0.0 + auVar287._8_4_ * 0.0;
            auVar300._12_4_ = auVar36._12_4_ + auVar35._12_4_ * 0.0 + auVar287._12_4_ * 0.0;
            auVar300._16_4_ = auVar36._16_4_ + auVar35._16_4_ * 0.0 + auVar287._16_4_ * 0.0;
            auVar300._20_4_ = auVar36._20_4_ + auVar35._20_4_ * 0.0 + auVar287._20_4_ * 0.0;
            auVar300._24_4_ = auVar36._24_4_ + auVar35._24_4_ * 0.0 + auVar287._24_4_ * 0.0;
            auVar300._28_4_ = fVar211 + auVar287._28_4_;
            fVar200 = auVar38._0_4_;
            fVar237 = auVar38._4_4_;
            auVar93._4_4_ = auVar205._4_4_ * fVar237;
            auVar93._0_4_ = auVar205._0_4_ * fVar200;
            fVar214 = auVar38._8_4_;
            auVar93._8_4_ = auVar205._8_4_ * fVar214;
            fVar285 = auVar38._12_4_;
            auVar93._12_4_ = auVar205._12_4_ * fVar285;
            fVar157 = auVar38._16_4_;
            auVar93._16_4_ = auVar205._16_4_ * fVar157;
            fVar154 = auVar38._20_4_;
            auVar93._20_4_ = auVar205._20_4_ * fVar154;
            fVar223 = auVar38._24_4_;
            auVar93._24_4_ = auVar205._24_4_ * fVar223;
            auVar93._28_4_ = fVar211;
            fVar211 = auVar143._0_4_;
            fVar239 = auVar143._4_4_;
            auVar94._4_4_ = auVar138._4_4_ * fVar239;
            auVar94._0_4_ = auVar138._0_4_ * fVar211;
            fVar305 = auVar143._8_4_;
            auVar94._8_4_ = auVar138._8_4_ * fVar305;
            fVar218 = auVar143._12_4_;
            auVar94._12_4_ = auVar138._12_4_ * fVar218;
            fVar181 = auVar143._16_4_;
            auVar94._16_4_ = auVar138._16_4_ * fVar181;
            fVar155 = auVar143._20_4_;
            auVar94._20_4_ = auVar138._20_4_ * fVar155;
            fVar234 = auVar143._24_4_;
            auVar94._24_4_ = auVar138._24_4_ * fVar234;
            auVar94._28_4_ = auVar36._28_4_;
            auVar35 = vsubps_avx(auVar94,auVar93);
            auVar209 = vsubps_avx(auVar209,auVar22);
            fVar213 = auVar209._0_4_;
            fVar246 = auVar209._4_4_;
            auVar95._4_4_ = auVar205._4_4_ * fVar246;
            auVar95._0_4_ = auVar205._0_4_ * fVar213;
            fVar282 = auVar209._8_4_;
            auVar95._8_4_ = auVar205._8_4_ * fVar282;
            fVar307 = auVar209._12_4_;
            auVar95._12_4_ = auVar205._12_4_ * fVar307;
            fVar265 = auVar209._16_4_;
            auVar95._16_4_ = auVar205._16_4_ * fVar265;
            fVar156 = auVar209._20_4_;
            auVar95._20_4_ = auVar205._20_4_ * fVar156;
            fVar236 = auVar209._24_4_;
            auVar95._24_4_ = auVar205._24_4_ * fVar236;
            auVar95._28_4_ = auVar205._28_4_;
            auVar96._4_4_ = fVar239 * auVar22._4_4_;
            auVar96._0_4_ = fVar211 * auVar22._0_4_;
            auVar96._8_4_ = fVar305 * auVar22._8_4_;
            auVar96._12_4_ = fVar218 * auVar22._12_4_;
            auVar96._16_4_ = fVar181 * auVar22._16_4_;
            auVar96._20_4_ = fVar155 * auVar22._20_4_;
            auVar96._24_4_ = fVar234 * auVar22._24_4_;
            auVar96._28_4_ = auVar287._28_4_;
            auVar209 = vsubps_avx(auVar95,auVar96);
            auVar347 = ZEXT1264(ZEXT412(0)) << 0x20;
            auVar97._4_4_ = auVar138._4_4_ * fVar246;
            auVar97._0_4_ = auVar138._0_4_ * fVar213;
            auVar97._8_4_ = auVar138._8_4_ * fVar282;
            auVar97._12_4_ = auVar138._12_4_ * fVar307;
            auVar97._16_4_ = auVar138._16_4_ * fVar265;
            auVar97._20_4_ = auVar138._20_4_ * fVar156;
            auVar97._24_4_ = auVar138._24_4_ * fVar236;
            auVar97._28_4_ = auVar138._28_4_;
            auVar98._4_4_ = fVar237 * auVar22._4_4_;
            auVar98._0_4_ = fVar200 * auVar22._0_4_;
            auVar98._8_4_ = fVar214 * auVar22._8_4_;
            auVar98._12_4_ = fVar285 * auVar22._12_4_;
            auVar98._16_4_ = fVar157 * auVar22._16_4_;
            auVar98._20_4_ = fVar154 * auVar22._20_4_;
            auVar98._24_4_ = fVar223 * auVar22._24_4_;
            auVar98._28_4_ = auVar22._28_4_;
            auVar22 = vsubps_avx(auVar98,auVar97);
            auVar138 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar147._0_4_ = auVar35._0_4_ * 0.0 + auVar22._0_4_ + auVar209._0_4_ * 0.0;
            auVar147._4_4_ = auVar35._4_4_ * 0.0 + auVar22._4_4_ + auVar209._4_4_ * 0.0;
            auVar147._8_4_ = auVar35._8_4_ * 0.0 + auVar22._8_4_ + auVar209._8_4_ * 0.0;
            auVar147._12_4_ = auVar35._12_4_ * 0.0 + auVar22._12_4_ + auVar209._12_4_ * 0.0;
            auVar147._16_4_ = auVar35._16_4_ * 0.0 + auVar22._16_4_ + auVar209._16_4_ * 0.0;
            auVar147._20_4_ = auVar35._20_4_ * 0.0 + auVar22._20_4_ + auVar209._20_4_ * 0.0;
            auVar147._24_4_ = auVar35._24_4_ * 0.0 + auVar22._24_4_ + auVar209._24_4_ * 0.0;
            auVar147._28_4_ = auVar209._28_4_ + auVar22._28_4_ + auVar209._28_4_;
            auVar151 = ZEXT3264(auVar147);
            auVar209 = vmaxps_avx(auVar300,auVar147);
            auVar209 = vcmpps_avx(auVar209,auVar138,2);
            auVar22 = local_720 & auVar209;
            if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar22 >> 0x7f,0) == '\0') &&
                  (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar22 >> 0xbf,0) == '\0') &&
                (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar22[0x1f]) {
LAB_00fa8f4e:
              auVar210 = ZEXT3264(CONCAT824(uStack_588,
                                            CONCAT816(uStack_590,CONCAT88(uStack_598,local_5a0))));
              auVar301._4_4_ = fVar152;
              auVar301._0_4_ = fVar132;
              auVar301._8_4_ = fStack_838;
              auVar301._12_4_ = fStack_834;
              auVar301._16_4_ = fStack_830;
              auVar301._20_4_ = fStack_82c;
              auVar301._24_4_ = fStack_828;
              auVar301._28_4_ = fStack_824;
            }
            else {
              auVar22 = vandps_avx(auVar209,local_720);
              auVar99._4_4_ = fVar239 * fVar215;
              auVar99._0_4_ = fVar211 * fVar310;
              auVar99._8_4_ = fVar305 * fVar248;
              auVar99._12_4_ = fVar218 * fVar283;
              auVar99._16_4_ = fVar181 * fVar295;
              auVar99._20_4_ = fVar155 * fVar199;
              auVar99._24_4_ = fVar234 * fVar182;
              auVar99._28_4_ = local_720._28_4_;
              auVar100._4_4_ = fVar237 * fVar194;
              auVar100._0_4_ = fVar200 * fVar253;
              auVar100._8_4_ = fVar214 * fVar196;
              auVar100._12_4_ = fVar285 * fVar198;
              auVar100._16_4_ = fVar157 * fVar240;
              auVar100._20_4_ = fVar154 * fVar247;
              auVar100._24_4_ = fVar223 * fVar249;
              auVar100._28_4_ = auVar209._28_4_;
              auVar205 = vsubps_avx(auVar100,auVar99);
              auVar101._4_4_ = fVar246 * fVar194;
              auVar101._0_4_ = fVar213 * fVar253;
              auVar101._8_4_ = fVar282 * fVar196;
              auVar101._12_4_ = fVar307 * fVar198;
              auVar101._16_4_ = fVar265 * fVar240;
              auVar101._20_4_ = fVar156 * fVar247;
              auVar101._24_4_ = fVar236 * fVar249;
              auVar101._28_4_ = auVar320._28_4_;
              auVar102._4_4_ = fVar239 * fVar235;
              auVar102._0_4_ = fVar211 * fVar217;
              auVar102._8_4_ = fVar305 * fVar179;
              auVar102._12_4_ = fVar218 * fVar284;
              auVar102._16_4_ = fVar181 * fVar308;
              auVar102._20_4_ = fVar155 * fVar153;
              auVar102._24_4_ = fVar234 * fVar197;
              auVar102._28_4_ = auVar143._28_4_;
              auVar287 = vsubps_avx(auVar102,auVar101);
              auVar103._4_4_ = fVar237 * fVar235;
              auVar103._0_4_ = fVar200 * fVar217;
              auVar103._8_4_ = fVar214 * fVar179;
              auVar103._12_4_ = fVar285 * fVar284;
              auVar103._16_4_ = fVar157 * fVar308;
              auVar103._20_4_ = fVar154 * fVar153;
              auVar103._24_4_ = fVar223 * fVar197;
              auVar103._28_4_ = auVar272._28_4_;
              auVar104._4_4_ = fVar246 * fVar215;
              auVar104._0_4_ = fVar213 * fVar310;
              auVar104._8_4_ = fVar282 * fVar248;
              auVar104._12_4_ = fVar307 * fVar283;
              auVar104._16_4_ = fVar265 * fVar295;
              auVar104._20_4_ = fVar156 * fVar199;
              auVar104._24_4_ = fVar236 * fVar182;
              auVar104._28_4_ = auVar37._28_4_;
              auVar320 = vsubps_avx(auVar104,auVar103);
              auVar280._0_4_ = auVar205._0_4_ * 0.0 + auVar320._0_4_ + auVar287._0_4_ * 0.0;
              auVar280._4_4_ = auVar205._4_4_ * 0.0 + auVar320._4_4_ + auVar287._4_4_ * 0.0;
              auVar280._8_4_ = auVar205._8_4_ * 0.0 + auVar320._8_4_ + auVar287._8_4_ * 0.0;
              auVar280._12_4_ = auVar205._12_4_ * 0.0 + auVar320._12_4_ + auVar287._12_4_ * 0.0;
              auVar280._16_4_ = auVar205._16_4_ * 0.0 + auVar320._16_4_ + auVar287._16_4_ * 0.0;
              auVar280._20_4_ = auVar205._20_4_ * 0.0 + auVar320._20_4_ + auVar287._20_4_ * 0.0;
              auVar280._24_4_ = auVar205._24_4_ * 0.0 + auVar320._24_4_ + auVar287._24_4_ * 0.0;
              auVar280._28_4_ = auVar38._28_4_ + auVar320._28_4_ + auVar272._28_4_;
              auVar209 = vrcpps_avx(auVar280);
              fVar310 = auVar209._0_4_;
              fVar217 = auVar209._4_4_;
              auVar105._4_4_ = auVar280._4_4_ * fVar217;
              auVar105._0_4_ = auVar280._0_4_ * fVar310;
              fVar200 = auVar209._8_4_;
              auVar105._8_4_ = auVar280._8_4_ * fVar200;
              fVar211 = auVar209._12_4_;
              auVar105._12_4_ = auVar280._12_4_ * fVar211;
              fVar213 = auVar209._16_4_;
              auVar105._16_4_ = auVar280._16_4_ * fVar213;
              fVar215 = auVar209._20_4_;
              auVar105._20_4_ = auVar280._20_4_ * fVar215;
              fVar235 = auVar209._24_4_;
              auVar105._24_4_ = auVar280._24_4_ * fVar235;
              auVar105._28_4_ = auVar143._28_4_;
              auVar324._8_4_ = 0x3f800000;
              auVar324._0_8_ = 0x3f8000003f800000;
              auVar324._12_4_ = 0x3f800000;
              auVar324._16_4_ = 0x3f800000;
              auVar324._20_4_ = 0x3f800000;
              auVar324._24_4_ = 0x3f800000;
              auVar324._28_4_ = 0x3f800000;
              auVar209 = vsubps_avx(auVar324,auVar105);
              fVar310 = auVar209._0_4_ * fVar310 + fVar310;
              fVar217 = auVar209._4_4_ * fVar217 + fVar217;
              fVar200 = auVar209._8_4_ * fVar200 + fVar200;
              fVar211 = auVar209._12_4_ * fVar211 + fVar211;
              fVar213 = auVar209._16_4_ * fVar213 + fVar213;
              fVar215 = auVar209._20_4_ * fVar215 + fVar215;
              fVar235 = auVar209._24_4_ * fVar235 + fVar235;
              auVar106._4_4_ =
                   (fVar232 * auVar205._4_4_ + auVar287._4_4_ * fVar221 + fVar131 * auVar320._4_4_)
                   * fVar217;
              auVar106._0_4_ =
                   (fVar314 * auVar205._0_4_ + auVar287._0_4_ * fVar212 + fVar238 * auVar320._0_4_)
                   * fVar310;
              auVar106._8_4_ =
                   (fVar332 * auVar205._8_4_ + auVar287._8_4_ * fVar250 + fVar220 * auVar320._8_4_)
                   * fVar200;
              auVar106._12_4_ =
                   (fVar306 * auVar205._12_4_ +
                   auVar287._12_4_ * fVar216 + fVar158 * auVar320._12_4_) * fVar211;
              auVar106._16_4_ =
                   (fVar219 * auVar205._16_4_ +
                   auVar287._16_4_ * fVar303 + fVar176 * auVar320._16_4_) * fVar213;
              auVar106._20_4_ =
                   (fVar264 * auVar205._20_4_ +
                   auVar287._20_4_ * fVar252 + fVar177 * auVar320._20_4_) * fVar215;
              auVar106._24_4_ =
                   (fVar195 * auVar205._24_4_ +
                   auVar287._24_4_ * fVar193 + fVar178 * auVar320._24_4_) * fVar235;
              auVar106._28_4_ = auVar298._28_4_ + auVar320._28_4_;
              auVar245 = ZEXT3264(auVar106);
              uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar208._4_4_ = uVar12;
              auVar208._0_4_ = uVar12;
              auVar208._8_4_ = uVar12;
              auVar208._12_4_ = uVar12;
              auVar208._16_4_ = uVar12;
              auVar208._20_4_ = uVar12;
              auVar208._24_4_ = uVar12;
              auVar208._28_4_ = uVar12;
              auVar298 = vcmpps_avx(local_e0,auVar106,2);
              auVar209 = vcmpps_avx(auVar106,auVar208,2);
              auVar209 = vandps_avx(auVar298,auVar209);
              auVar143 = auVar22 & auVar209;
              if ((((((((auVar143 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar143 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar143 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar143 >> 0x7f,0) == '\0') &&
                    (auVar143 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar143 >> 0xbf,0) == '\0') &&
                  (auVar143 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar143[0x1f]) goto LAB_00fa8f4e;
              auVar209 = vandps_avx(auVar22,auVar209);
              auVar143 = vcmpps_avx(auVar280,auVar138,4);
              auVar22 = auVar209 & auVar143;
              auVar210 = ZEXT3264(CONCAT824(uStack_588,
                                            CONCAT816(uStack_590,CONCAT88(uStack_598,local_5a0))));
              auVar301._4_4_ = fVar152;
              auVar301._0_4_ = fVar132;
              auVar301._8_4_ = fStack_838;
              auVar301._12_4_ = fStack_834;
              auVar301._16_4_ = fStack_830;
              auVar301._20_4_ = fStack_82c;
              auVar301._24_4_ = fStack_828;
              auVar301._28_4_ = fStack_824;
              if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar22 >> 0x7f,0) != '\0') ||
                    (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar22 >> 0xbf,0) != '\0') ||
                  (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar22[0x1f] < '\0') {
                auVar209 = vandps_avx(auVar143,auVar209);
                auVar210 = ZEXT3264(auVar209);
                auVar107._4_4_ = auVar300._4_4_ * fVar217;
                auVar107._0_4_ = auVar300._0_4_ * fVar310;
                auVar107._8_4_ = auVar300._8_4_ * fVar200;
                auVar107._12_4_ = auVar300._12_4_ * fVar211;
                auVar107._16_4_ = auVar300._16_4_ * fVar213;
                auVar107._20_4_ = auVar300._20_4_ * fVar215;
                auVar107._24_4_ = auVar300._24_4_ * fVar235;
                auVar107._28_4_ = auVar298._28_4_;
                auVar108._4_4_ = auVar147._4_4_ * fVar217;
                auVar108._0_4_ = auVar147._0_4_ * fVar310;
                auVar108._8_4_ = auVar147._8_4_ * fVar200;
                auVar108._12_4_ = auVar147._12_4_ * fVar211;
                auVar108._16_4_ = auVar147._16_4_ * fVar213;
                auVar108._20_4_ = auVar147._20_4_ * fVar215;
                auVar108._24_4_ = auVar147._24_4_ * fVar235;
                auVar108._28_4_ = auVar147._28_4_;
                auVar260._8_4_ = 0x3f800000;
                auVar260._0_8_ = 0x3f8000003f800000;
                auVar260._12_4_ = 0x3f800000;
                auVar260._16_4_ = 0x3f800000;
                auVar260._20_4_ = 0x3f800000;
                auVar260._24_4_ = 0x3f800000;
                auVar260._28_4_ = 0x3f800000;
                auVar209 = vsubps_avx(auVar260,auVar107);
                local_3c0 = vblendvps_avx(auVar209,auVar107,auVar23);
                auVar209 = vsubps_avx(auVar260,auVar108);
                _local_3e0 = vblendvps_avx(auVar209,auVar108,auVar23);
                auVar151 = ZEXT3264(_local_3e0);
                local_560 = auVar106;
              }
            }
            auVar291 = ZEXT3264(local_760);
            auVar209 = auVar210._0_32_;
            fVar182 = (float)local_780._0_4_;
            fVar193 = (float)local_780._4_4_;
            fVar195 = fStack_778;
            fVar197 = fStack_774;
            fVar212 = fStack_770;
            fVar217 = fStack_76c;
            fVar211 = fStack_768;
            fVar215 = fStack_764;
            local_4c0 = auVar32;
            if ((((((((auVar209 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar209 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar209 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar209 >> 0x7f,0) != '\0') ||
                  (auVar210 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 SUB321(auVar209 >> 0xbf,0) != '\0') ||
                (auVar210 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                auVar210[0x1f] < '\0') {
              auVar32 = vsubps_avx(auVar274,auVar301);
              fVar314 = auVar301._0_4_ + local_3c0._0_4_ * auVar32._0_4_;
              fVar200 = auVar301._4_4_ + local_3c0._4_4_ * auVar32._4_4_;
              fVar213 = auVar301._8_4_ + local_3c0._8_4_ * auVar32._8_4_;
              fVar221 = auVar301._12_4_ + local_3c0._12_4_ * auVar32._12_4_;
              fVar232 = auVar301._16_4_ + local_3c0._16_4_ * auVar32._16_4_;
              fVar235 = auVar301._20_4_ + local_3c0._20_4_ * auVar32._20_4_;
              fVar237 = auVar301._24_4_ + local_3c0._24_4_ * auVar32._24_4_;
              fVar239 = auVar301._28_4_ + auVar32._28_4_;
              fVar310 = *(float *)((long)local_848->ray_space + k * 4 + -0x10);
              auVar109._4_4_ = (fVar200 + fVar200) * fVar310;
              auVar109._0_4_ = (fVar314 + fVar314) * fVar310;
              auVar109._8_4_ = (fVar213 + fVar213) * fVar310;
              auVar109._12_4_ = (fVar221 + fVar221) * fVar310;
              auVar109._16_4_ = (fVar232 + fVar232) * fVar310;
              auVar109._20_4_ = (fVar235 + fVar235) * fVar310;
              auVar109._24_4_ = (fVar237 + fVar237) * fVar310;
              auVar109._28_4_ = fVar239 + fVar239;
              auVar32 = vcmpps_avx(local_560,auVar109,6);
              auVar151 = ZEXT3264(auVar32);
              auVar298 = auVar209 & auVar32;
              if ((((((((auVar298 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar298 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar298 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar298 >> 0x7f,0) != '\0') ||
                    (auVar298 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar298 >> 0xbf,0) != '\0') ||
                  (auVar298 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar298[0x1f] < '\0') {
                local_3e0._0_4_ = (float)local_3e0._0_4_ + (float)local_3e0._0_4_ + -1.0;
                local_3e0._4_4_ = (float)local_3e0._4_4_ + (float)local_3e0._4_4_ + -1.0;
                uStack_3d8._0_4_ = (float)uStack_3d8 + (float)uStack_3d8 + -1.0;
                uStack_3d8._4_4_ = uStack_3d8._4_4_ + uStack_3d8._4_4_ + -1.0;
                uStack_3d0._0_4_ = (float)uStack_3d0 + (float)uStack_3d0 + -1.0;
                uStack_3d0._4_4_ = uStack_3d0._4_4_ + uStack_3d0._4_4_ + -1.0;
                uStack_3c8._0_4_ = (float)uStack_3c8 + (float)uStack_3c8 + -1.0;
                uStack_3c8._4_4_ = uStack_3c8._4_4_ + uStack_3c8._4_4_ + -1.0;
                local_280 = local_3c0;
                auVar121 = _local_3e0;
                auVar298 = _local_3e0;
                local_260 = (float)local_3e0._0_4_;
                fStack_25c = (float)local_3e0._4_4_;
                fStack_258 = (float)uStack_3d8;
                fStack_254 = uStack_3d8._4_4_;
                fStack_250 = (float)uStack_3d0;
                fStack_24c = uStack_3d0._4_4_;
                fStack_248 = (float)uStack_3c8;
                fStack_244 = uStack_3c8._4_4_;
                local_240 = local_560;
                local_21c = uVar15;
                local_210 = auVar226._0_8_;
                uStack_208 = uStack_868;
                local_200 = local_7c0;
                uStack_1f8 = uStack_7b8;
                local_1f0 = local_7d0;
                uStack_1e8 = uStack_7c8;
                local_1e0 = local_7e0;
                uStack_1d8 = uStack_7d8;
                pGVar130 = (context->scene->geometries).items[uVar126].ptr;
                _local_3e0 = auVar298;
                if ((pGVar130->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  local_5e0 = vandps_avx(auVar32,auVar209);
                  auVar187._0_4_ = (float)(int)local_220;
                  auVar187._4_8_ = SUB128(ZEXT812(0),4);
                  auVar187._12_4_ = 0;
                  auVar164 = vshufps_avx(auVar187,auVar187,0);
                  local_1a0[0] = (auVar164._0_4_ + local_3c0._0_4_ + 0.0) * (float)local_100._0_4_;
                  local_1a0[1] = (auVar164._4_4_ + local_3c0._4_4_ + 1.0) * (float)local_100._4_4_;
                  local_1a0[2] = (auVar164._8_4_ + local_3c0._8_4_ + 2.0) * fStack_f8;
                  local_1a0[3] = (auVar164._12_4_ + local_3c0._12_4_ + 3.0) * fStack_f4;
                  fStack_190 = (auVar164._0_4_ + local_3c0._16_4_ + 4.0) * fStack_f0;
                  fStack_18c = (auVar164._4_4_ + local_3c0._20_4_ + 5.0) * fStack_ec;
                  fStack_188 = (auVar164._8_4_ + local_3c0._24_4_ + 6.0) * fStack_e8;
                  fStack_184 = auVar164._12_4_ + local_3c0._28_4_ + 7.0;
                  uStack_3d0 = auVar121._16_8_;
                  uStack_3c8 = auVar298._24_8_;
                  local_180 = local_3e0;
                  uStack_178 = uStack_3d8;
                  uStack_170 = uStack_3d0;
                  uStack_168 = uStack_3c8;
                  local_160 = local_560;
                  auVar173._8_4_ = 0x7f800000;
                  auVar173._0_8_ = 0x7f8000007f800000;
                  auVar173._12_4_ = 0x7f800000;
                  auVar173._16_4_ = 0x7f800000;
                  auVar173._20_4_ = 0x7f800000;
                  auVar173._24_4_ = 0x7f800000;
                  auVar173._28_4_ = 0x7f800000;
                  auVar209 = vblendvps_avx(auVar173,local_560,local_5e0);
                  auVar32 = vshufps_avx(auVar209,auVar209,0xb1);
                  auVar32 = vminps_avx(auVar209,auVar32);
                  auVar298 = vshufpd_avx(auVar32,auVar32,5);
                  auVar32 = vminps_avx(auVar32,auVar298);
                  auVar298 = vperm2f128_avx(auVar32,auVar32,1);
                  auVar32 = vminps_avx(auVar32,auVar298);
                  auVar32 = vcmpps_avx(auVar209,auVar32,0);
                  auVar298 = local_5e0 & auVar32;
                  auVar209 = local_5e0;
                  if ((((((((auVar298 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar298 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar298 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar298 >> 0x7f,0) != '\0') ||
                        (auVar298 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar298 >> 0xbf,0) != '\0') ||
                      (auVar298 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar298[0x1f] < '\0') {
                    auVar209 = vandps_avx(auVar32,local_5e0);
                  }
                  uVar124 = vmovmskps_avx(auVar209);
                  uVar20 = 0;
                  if (uVar124 != 0) {
                    for (; (uVar124 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                    }
                  }
                  uVar125 = (ulong)uVar20;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar130->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar310 = local_1a0[uVar125];
                    auVar151 = ZEXT464((uint)fVar310);
                    fVar200 = 1.0 - fVar310;
                    fVar314 = fVar310 * 3.0;
                    auVar245 = ZEXT464(0x3f000000);
                    auVar164 = ZEXT416((uint)((fVar200 * -2.0 * fVar310 + fVar310 * fVar310) * 0.5))
                    ;
                    auVar164 = vshufps_avx(auVar164,auVar164,0);
                    auVar188 = ZEXT416((uint)(((fVar200 + fVar200) * (fVar314 + 2.0) +
                                              fVar200 * fVar200 * -3.0) * 0.5));
                    auVar188 = vshufps_avx(auVar188,auVar188,0);
                    auVar189 = ZEXT416((uint)(((fVar310 + fVar310) * (fVar314 + -5.0) +
                                              fVar310 * fVar314) * 0.5));
                    auVar189 = vshufps_avx(auVar189,auVar189,0);
                    uVar12 = *(undefined4 *)((long)&local_180 + uVar125 * 4);
                    auVar204 = ZEXT416((uint)((fVar310 * (fVar200 + fVar200) - fVar200 * fVar200) *
                                             0.5));
                    auVar204 = vshufps_avx(auVar204,auVar204,0);
                    auVar165._0_4_ =
                         auVar204._0_4_ * fVar222 +
                         auVar189._0_4_ * (float)local_7c0._0_4_ +
                         auVar164._0_4_ * (float)local_7e0._0_4_ +
                         auVar188._0_4_ * (float)local_7d0._0_4_;
                    auVar165._4_4_ =
                         auVar204._4_4_ * fVar233 +
                         auVar189._4_4_ * (float)local_7c0._4_4_ +
                         auVar164._4_4_ * (float)local_7e0._4_4_ +
                         auVar188._4_4_ * (float)local_7d0._4_4_;
                    auVar165._8_4_ =
                         auVar204._8_4_ * auVar226._8_4_ +
                         auVar189._8_4_ * (float)uStack_7b8 +
                         auVar164._8_4_ * (float)uStack_7d8 + auVar188._8_4_ * (float)uStack_7c8;
                    auVar165._12_4_ =
                         auVar204._12_4_ * auVar226._12_4_ +
                         auVar189._12_4_ * uStack_7b8._4_4_ +
                         auVar164._12_4_ * uStack_7d8._4_4_ + auVar188._12_4_ * uStack_7c8._4_4_;
                    auVar210 = ZEXT464(*(uint *)(local_160 + uVar125 * 4));
                    *(uint *)(ray + k * 4 + 0x80) = *(uint *)(local_160 + uVar125 * 4);
                    *(float *)(ray + k * 4 + 0xc0) = auVar165._0_4_;
                    uVar16 = vextractps_avx(auVar165,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar16;
                    uVar16 = vextractps_avx(auVar165,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar16;
                    *(float *)(ray + k * 4 + 0xf0) = fVar310;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar12;
                    *(uint *)(ray + k * 4 + 0x110) = uVar14;
                    *(uint *)(ray + k * 4 + 0x120) = uVar126;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_720._0_16_ = *local_728;
                    auStack_890 = auVar274._16_16_;
                    local_8a0 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                    auVar281 = ZEXT3264(local_560);
                    stack0xfffffffffffff7e8 = auVar345._8_24_;
                    local_820._0_8_ = pGVar130;
                    _local_700 = auVar150;
                    _local_660 = *pauVar11;
                    while( true ) {
                      local_440 = local_1a0[uVar125];
                      local_430 = *(undefined4 *)((long)&local_180 + uVar125 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar125 * 4)
                      ;
                      fVar314 = 1.0 - local_440;
                      fVar212 = local_440 * 3.0;
                      fVar310 = (local_440 + local_440) * (fVar212 + -5.0) + local_440 * fVar212;
                      auVar245 = ZEXT464((uint)fVar310);
                      auVar164 = ZEXT416((uint)((fVar314 * -2.0 * local_440 + local_440 * local_440)
                                               * 0.5));
                      auVar164 = vshufps_avx(auVar164,auVar164,0);
                      auVar188 = ZEXT416((uint)(((fVar314 + fVar314) * (fVar212 + 2.0) +
                                                fVar314 * fVar314 * -3.0) * 0.5));
                      auVar188 = vshufps_avx(auVar188,auVar188,0);
                      auVar189 = vshufps_avx(ZEXT416((uint)(fVar310 * 0.5)),
                                             ZEXT416((uint)(fVar310 * 0.5)),0);
                      local_7b0.context = context->user;
                      auVar204 = ZEXT416((uint)((local_440 * (fVar314 + fVar314) - fVar314 * fVar314
                                                ) * 0.5));
                      auVar204 = vshufps_avx(auVar204,auVar204,0);
                      auVar190._0_4_ =
                           auVar204._0_4_ * fVar222 +
                           auVar189._0_4_ * (float)local_7c0._0_4_ +
                           auVar164._0_4_ * (float)local_7e0._0_4_ +
                           auVar188._0_4_ * (float)local_7d0._0_4_;
                      auVar190._4_4_ =
                           auVar204._4_4_ * fVar233 +
                           auVar189._4_4_ * (float)local_7c0._4_4_ +
                           auVar164._4_4_ * (float)local_7e0._4_4_ +
                           auVar188._4_4_ * (float)local_7d0._4_4_;
                      auVar190._8_4_ =
                           auVar204._8_4_ * auVar226._8_4_ +
                           auVar189._8_4_ * (float)uStack_7b8 +
                           auVar164._8_4_ * (float)uStack_7d8 + auVar188._8_4_ * (float)uStack_7c8;
                      auVar190._12_4_ =
                           auVar204._12_4_ * auVar226._12_4_ +
                           auVar189._12_4_ * uStack_7b8._4_4_ +
                           auVar164._12_4_ * uStack_7d8._4_4_ + auVar188._12_4_ * uStack_7c8._4_4_;
                      auVar164 = vshufps_avx(auVar190,auVar190,0);
                      local_470[0] = (RTCHitN)auVar164[0];
                      local_470[1] = (RTCHitN)auVar164[1];
                      local_470[2] = (RTCHitN)auVar164[2];
                      local_470[3] = (RTCHitN)auVar164[3];
                      local_470[4] = (RTCHitN)auVar164[4];
                      local_470[5] = (RTCHitN)auVar164[5];
                      local_470[6] = (RTCHitN)auVar164[6];
                      local_470[7] = (RTCHitN)auVar164[7];
                      local_470[8] = (RTCHitN)auVar164[8];
                      local_470[9] = (RTCHitN)auVar164[9];
                      local_470[10] = (RTCHitN)auVar164[10];
                      local_470[0xb] = (RTCHitN)auVar164[0xb];
                      local_470[0xc] = (RTCHitN)auVar164[0xc];
                      local_470[0xd] = (RTCHitN)auVar164[0xd];
                      local_470[0xe] = (RTCHitN)auVar164[0xe];
                      local_470[0xf] = (RTCHitN)auVar164[0xf];
                      local_460 = vshufps_avx(auVar190,auVar190,0x55);
                      auVar210 = ZEXT1664(local_460);
                      local_450 = vshufps_avx(auVar190,auVar190,0xaa);
                      fStack_43c = local_440;
                      fStack_438 = local_440;
                      fStack_434 = local_440;
                      uStack_42c = local_430;
                      uStack_428 = local_430;
                      uStack_424 = local_430;
                      local_420 = local_2b0._0_8_;
                      uStack_418 = local_2b0._8_8_;
                      local_410 = local_2a0._0_8_;
                      uStack_408 = local_2a0._8_8_;
                      vcmpps_avx(auVar347._0_32_,auVar347._0_32_,0xf);
                      uStack_3fc = (local_7b0.context)->instID[0];
                      local_400 = uStack_3fc;
                      uStack_3f8 = uStack_3fc;
                      uStack_3f4 = uStack_3fc;
                      uStack_3f0 = (local_7b0.context)->instPrimID[0];
                      uStack_3ec = uStack_3f0;
                      uStack_3e8 = uStack_3f0;
                      uStack_3e4 = uStack_3f0;
                      local_860 = local_720._0_16_;
                      local_7b0.valid = (int *)local_860;
                      local_7b0.geometryUserPtr = pGVar130->userPtr;
                      local_7b0.hit = local_470;
                      local_7b0.N = 4;
                      local_840 = (uint)uVar125;
                      uStack_83c = 0;
                      local_7b0.ray = (RTCRayN *)ray;
                      if (pGVar130->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar210 = ZEXT1664(local_460);
                        auVar245 = ZEXT464((uint)fVar310);
                        (*pGVar130->intersectionFilterN)(&local_7b0);
                        uVar125 = CONCAT44(uStack_83c,local_840);
                        auVar281 = ZEXT3264(local_560);
                        auVar347 = ZEXT1664(ZEXT816(0) << 0x40);
                        pGVar130 = (Geometry *)local_820._0_8_;
                      }
                      auVar164 = auVar210._0_16_;
                      if (local_860 == (undefined1  [16])0x0) {
                        auVar164 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                        auVar164 = auVar164 ^ _DAT_01f7ae20;
                      }
                      else {
                        p_Var19 = context->args->filter;
                        if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar130->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar245 = ZEXT1664(auVar245._0_16_);
                          (*p_Var19)(&local_7b0);
                          uVar125 = CONCAT44(uStack_83c,local_840);
                          auVar281 = ZEXT3264(local_560);
                          auVar347 = ZEXT1664(ZEXT816(0) << 0x40);
                          pGVar130 = (Geometry *)local_820._0_8_;
                        }
                        auVar188 = vpcmpeqd_avx(local_860,_DAT_01f7aa10);
                        auVar189 = vpcmpeqd_avx(auVar164,auVar164);
                        auVar210 = ZEXT1664(auVar189);
                        auVar164 = auVar188 ^ auVar189;
                        if (local_860 != (undefined1  [16])0x0) {
                          auVar188 = auVar188 ^ auVar189;
                          auVar189 = vmaskmovps_avx(auVar188,*(undefined1 (*) [16])local_7b0.hit);
                          *(undefined1 (*) [16])(local_7b0.ray + 0xc0) = auVar189;
                          auVar189 = vmaskmovps_avx(auVar188,*(undefined1 (*) [16])
                                                              (local_7b0.hit + 0x10));
                          *(undefined1 (*) [16])(local_7b0.ray + 0xd0) = auVar189;
                          auVar189 = vmaskmovps_avx(auVar188,*(undefined1 (*) [16])
                                                              (local_7b0.hit + 0x20));
                          *(undefined1 (*) [16])(local_7b0.ray + 0xe0) = auVar189;
                          auVar189 = vmaskmovps_avx(auVar188,*(undefined1 (*) [16])
                                                              (local_7b0.hit + 0x30));
                          *(undefined1 (*) [16])(local_7b0.ray + 0xf0) = auVar189;
                          auVar189 = vmaskmovps_avx(auVar188,*(undefined1 (*) [16])
                                                              (local_7b0.hit + 0x40));
                          *(undefined1 (*) [16])(local_7b0.ray + 0x100) = auVar189;
                          auVar189 = vmaskmovps_avx(auVar188,*(undefined1 (*) [16])
                                                              (local_7b0.hit + 0x50));
                          *(undefined1 (*) [16])(local_7b0.ray + 0x110) = auVar189;
                          auVar189 = vmaskmovps_avx(auVar188,*(undefined1 (*) [16])
                                                              (local_7b0.hit + 0x60));
                          *(undefined1 (*) [16])(local_7b0.ray + 0x120) = auVar189;
                          auVar189 = vmaskmovps_avx(auVar188,*(undefined1 (*) [16])
                                                              (local_7b0.hit + 0x70));
                          *(undefined1 (*) [16])(local_7b0.ray + 0x130) = auVar189;
                          auVar188 = vmaskmovps_avx(auVar188,*(undefined1 (*) [16])
                                                              (local_7b0.hit + 0x80));
                          *(undefined1 (*) [16])(local_7b0.ray + 0x140) = auVar188;
                        }
                      }
                      auVar166._8_8_ = 0x100000001;
                      auVar166._0_8_ = 0x100000001;
                      if ((auVar166 & auVar164) == (undefined1  [16])0x0) {
                        *(int *)(ray + k * 4 + 0x80) = local_8a0._0_4_;
                        auVar164 = local_8a0;
                      }
                      else {
                        auVar164 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                      }
                      *(undefined4 *)(local_5e0 + uVar125 * 4) = 0;
                      local_8a0 = auVar164;
                      auVar164 = vshufps_avx(auVar164,auVar164,0);
                      auVar148._16_16_ = auVar164;
                      auVar148._0_16_ = auVar164;
                      auVar209 = vcmpps_avx(auVar281._0_32_,auVar148,2);
                      auVar150 = vandps_avx(auVar209,local_5e0);
                      auVar151 = ZEXT3264(auVar150);
                      local_5e0 = local_5e0 & auVar209;
                      if ((((((((local_5e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (local_5e0 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (local_5e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(local_5e0 >> 0x7f,0) == '\0') &&
                            (local_5e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(local_5e0 >> 0xbf,0) == '\0') &&
                          (local_5e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < local_5e0[0x1f]) break;
                      auVar174._8_4_ = 0x7f800000;
                      auVar174._0_8_ = 0x7f8000007f800000;
                      auVar174._12_4_ = 0x7f800000;
                      auVar174._16_4_ = 0x7f800000;
                      auVar174._20_4_ = 0x7f800000;
                      auVar174._24_4_ = 0x7f800000;
                      auVar174._28_4_ = 0x7f800000;
                      auVar209 = vblendvps_avx(auVar174,auVar281._0_32_,auVar150);
                      auVar32 = vshufps_avx(auVar209,auVar209,0xb1);
                      auVar32 = vminps_avx(auVar209,auVar32);
                      auVar298 = vshufpd_avx(auVar32,auVar32,5);
                      auVar32 = vminps_avx(auVar32,auVar298);
                      auVar298 = vperm2f128_avx(auVar32,auVar32,1);
                      auVar32 = vminps_avx(auVar32,auVar298);
                      auVar32 = vcmpps_avx(auVar209,auVar32,0);
                      auVar298 = auVar150 & auVar32;
                      auVar209 = auVar150;
                      if ((((((((auVar298 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar298 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar298 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar298 >> 0x7f,0) != '\0') ||
                            (auVar298 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar298 >> 0xbf,0) != '\0') ||
                          (auVar298 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar298[0x1f] < '\0') {
                        auVar209 = vandps_avx(auVar32,auVar150);
                      }
                      uVar124 = vmovmskps_avx(auVar209);
                      uVar20 = 0;
                      if (uVar124 != 0) {
                        for (; (uVar124 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                        }
                      }
                      uVar125 = (ulong)uVar20;
                      local_5e0 = auVar150;
                    }
                    auVar291 = ZEXT3264(local_760);
                    fVar182 = (float)local_780._0_4_;
                    fVar193 = (float)local_780._4_4_;
                    fVar195 = fStack_778;
                    fVar197 = fStack_774;
                    fVar212 = fStack_770;
                    fVar217 = fStack_76c;
                    fVar211 = fStack_768;
                    fVar215 = fStack_764;
                  }
                }
              }
            }
            fVar310 = (float)local_600._0_4_;
            fVar314 = (float)local_600._4_4_;
            fVar200 = fStack_5f8;
            fVar213 = fStack_5f4;
            fVar221 = fStack_5f0;
            fVar235 = fStack_5ec;
            fVar239 = fStack_5e8;
          }
          lVar128 = lVar128 + 8;
          fVar223 = (float)local_6c0._0_4_;
          fVar234 = (float)local_6c0._4_4_;
          fVar236 = fStack_6b8;
          fVar238 = fStack_6b4;
          fVar232 = fStack_6b0;
          fVar237 = fStack_6ac;
          fVar246 = fStack_6a8;
        } while ((int)lVar128 < (int)uVar15);
      }
      uVar12 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar136._4_4_ = uVar12;
      auVar136._0_4_ = uVar12;
      auVar136._8_4_ = uVar12;
      auVar136._12_4_ = uVar12;
      auVar164 = vcmpps_avx(local_290,auVar136,2);
      uVar126 = vmovmskps_avx(auVar164);
      uVar123 = uVar123 & uVar123 + 0xf & uVar126;
    } while (uVar123 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }